

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx::CurveNvIntersector1<4>::
     occluded_t<embree::avx::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [28];
  undefined1 (*pauVar3) [16];
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  Primitive PVar10;
  RTCFilterFunctionN p_Var11;
  code *pcVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  long lVar99;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [28];
  undefined1 auVar103 [12];
  undefined1 auVar104 [28];
  undefined1 auVar105 [28];
  undefined1 auVar106 [24];
  undefined1 auVar107 [28];
  undefined1 auVar108 [28];
  int iVar109;
  long lVar110;
  Geometry *pGVar111;
  RTCIntersectArguments *pRVar112;
  uint uVar113;
  Geometry *pGVar114;
  ulong uVar115;
  long lVar116;
  bool bVar117;
  ulong uVar118;
  float fVar119;
  float fVar132;
  float fVar134;
  vint4 bi_2;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar135;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar133;
  float fVar136;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar137;
  float fVar147;
  float fVar149;
  vint4 bi_1;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar142 [32];
  float fVar138;
  float fVar148;
  float fVar150;
  float fVar151;
  float fVar155;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar156;
  float fVar168;
  float fVar170;
  vint4 ai;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar157;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar169;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar166 [32];
  float fVar174;
  undefined1 auVar167 [32];
  float fVar175;
  float fVar188;
  float fVar189;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar190;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar183 [32];
  float fVar191;
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  float fVar195;
  float fVar207;
  float fVar208;
  vint4 bi;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar199 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar209;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  float fVar210;
  float fVar219;
  float fVar220;
  vint4 ai_2;
  undefined1 auVar214 [16];
  undefined1 auVar211 [16];
  float fVar221;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar222;
  float fVar223;
  float fVar227;
  float fVar229;
  undefined1 auVar224 [16];
  float fVar228;
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar225 [32];
  float fVar233;
  undefined1 auVar226 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar242;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar243;
  float fVar250;
  float fVar251;
  float fVar252;
  vint4 ai_1;
  undefined1 auVar244 [16];
  float fVar255;
  float fVar256;
  float fVar257;
  undefined1 auVar245 [32];
  float fVar254;
  float fVar259;
  undefined1 auVar246 [32];
  float fVar260;
  undefined1 auVar247 [32];
  float fVar253;
  float fVar258;
  undefined1 auVar248 [32];
  float fVar261;
  float fVar262;
  float fVar271;
  float fVar273;
  undefined1 auVar263 [16];
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  float fVar272;
  float fVar274;
  float fVar275;
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  float fVar280;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  float fVar289;
  undefined1 auVar287 [32];
  undefined1 auVar288 [64];
  undefined1 auVar290 [16];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar300;
  float fVar301;
  undefined1 auVar297 [16];
  float fVar302;
  float fVar303;
  float fVar304;
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  float fVar305;
  float fVar307;
  float fVar308;
  float fVar309;
  undefined1 auVar306 [32];
  float fVar310;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_7cc;
  Primitive *local_7c8;
  Precalculations *local_7c0;
  undefined4 local_7b4;
  undefined1 local_7b0 [8];
  undefined8 uStack_7a8;
  uint local_7a0;
  undefined4 uStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [16];
  undefined1 auStack_730 [16];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  undefined1 auStack_6d8 [8];
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  ulong local_688;
  undefined1 local_680 [48];
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [4];
  undefined1 auStack_61c [8];
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined8 local_5d0;
  undefined4 local_5c8;
  float local_5c4;
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined4 local_5b8;
  uint local_5b4;
  uint local_5b0;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_570 [8];
  undefined8 uStack_568;
  undefined1 local_560 [8];
  undefined8 uStack_558;
  undefined1 local_550 [8];
  undefined8 uStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [8];
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined4 uStack_324;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  uint local_280;
  uint local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined1 local_220 [32];
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar249 [64];
  undefined1 auVar270 [64];
  
  local_7c0 = pre;
  PVar10 = prim[1];
  uVar118 = (ulong)(byte)PVar10;
  lVar99 = uVar118 * 0x19;
  fVar210 = *(float *)(prim + lVar99 + 0x12);
  auVar214 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar99 + 6));
  auVar234._0_4_ = fVar210 * (ray->dir).field_0.m128[0];
  auVar234._4_4_ = fVar210 * (ray->dir).field_0.m128[1];
  auVar234._8_4_ = fVar210 * (ray->dir).field_0.m128[2];
  auVar234._12_4_ = fVar210 * (ray->dir).field_0.m128[3];
  auVar158._0_4_ = fVar210 * auVar214._0_4_;
  auVar158._4_4_ = fVar210 * auVar214._4_4_;
  auVar158._8_4_ = fVar210 * auVar214._8_4_;
  auVar158._12_4_ = fVar210 * auVar214._12_4_;
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 4 + 6)));
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar164 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 5 + 6)));
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar181 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 6 + 6)));
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0xb + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar10 * 0xc) + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar10 * 0xc + uVar118 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar115 = (ulong)(uint)((int)(uVar118 * 9) * 2);
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar115 + 6)));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar122 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar115 + uVar118 + 6)));
  auVar122 = vcvtdq2ps_avx(auVar122);
  uVar115 = (ulong)(uint)((int)(uVar118 * 5) << 2);
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar115 + 6)));
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar120 = vshufps_avx(auVar234,auVar234,0);
  auVar139 = vshufps_avx(auVar234,auVar234,0x55);
  auVar159 = vshufps_avx(auVar234,auVar234,0xaa);
  fVar210 = auVar159._0_4_;
  fVar175 = auVar159._4_4_;
  fVar219 = auVar159._8_4_;
  fVar188 = auVar159._12_4_;
  fVar222 = auVar139._0_4_;
  fVar227 = auVar139._4_4_;
  fVar229 = auVar139._8_4_;
  fVar231 = auVar139._12_4_;
  fVar220 = auVar120._0_4_;
  fVar189 = auVar120._4_4_;
  fVar221 = auVar120._8_4_;
  fVar190 = auVar120._12_4_;
  auVar290._0_4_ = fVar220 * auVar214._0_4_ + fVar222 * auVar164._0_4_ + fVar210 * auVar181._0_4_;
  auVar290._4_4_ = fVar189 * auVar214._4_4_ + fVar227 * auVar164._4_4_ + fVar175 * auVar181._4_4_;
  auVar290._8_4_ = fVar221 * auVar214._8_4_ + fVar229 * auVar164._8_4_ + fVar219 * auVar181._8_4_;
  auVar290._12_4_ =
       fVar190 * auVar214._12_4_ + fVar231 * auVar164._12_4_ + fVar188 * auVar181._12_4_;
  auVar297._0_4_ = fVar220 * auVar16._0_4_ + fVar222 * auVar17._0_4_ + auVar18._0_4_ * fVar210;
  auVar297._4_4_ = fVar189 * auVar16._4_4_ + fVar227 * auVar17._4_4_ + auVar18._4_4_ * fVar175;
  auVar297._8_4_ = fVar221 * auVar16._8_4_ + fVar229 * auVar17._8_4_ + auVar18._8_4_ * fVar219;
  auVar297._12_4_ = fVar190 * auVar16._12_4_ + fVar231 * auVar17._12_4_ + auVar18._12_4_ * fVar188;
  auVar235._0_4_ = fVar220 * auVar121._0_4_ + fVar222 * auVar122._0_4_ + auVar140._0_4_ * fVar210;
  auVar235._4_4_ = fVar189 * auVar121._4_4_ + fVar227 * auVar122._4_4_ + auVar140._4_4_ * fVar175;
  auVar235._8_4_ = fVar221 * auVar121._8_4_ + fVar229 * auVar122._8_4_ + auVar140._8_4_ * fVar219;
  auVar235._12_4_ =
       fVar190 * auVar121._12_4_ + fVar231 * auVar122._12_4_ + auVar140._12_4_ * fVar188;
  auVar120 = vshufps_avx(auVar158,auVar158,0);
  auVar139 = vshufps_avx(auVar158,auVar158,0x55);
  auVar159 = vshufps_avx(auVar158,auVar158,0xaa);
  fVar210 = auVar159._0_4_;
  fVar175 = auVar159._4_4_;
  fVar219 = auVar159._8_4_;
  fVar188 = auVar159._12_4_;
  fVar222 = auVar139._0_4_;
  fVar227 = auVar139._4_4_;
  fVar229 = auVar139._8_4_;
  fVar231 = auVar139._12_4_;
  fVar220 = auVar120._0_4_;
  fVar189 = auVar120._4_4_;
  fVar221 = auVar120._8_4_;
  fVar190 = auVar120._12_4_;
  auVar196._0_4_ = fVar220 * auVar214._0_4_ + fVar222 * auVar164._0_4_ + fVar210 * auVar181._0_4_;
  auVar196._4_4_ = fVar189 * auVar214._4_4_ + fVar227 * auVar164._4_4_ + fVar175 * auVar181._4_4_;
  auVar196._8_4_ = fVar221 * auVar214._8_4_ + fVar229 * auVar164._8_4_ + fVar219 * auVar181._8_4_;
  auVar196._12_4_ =
       fVar190 * auVar214._12_4_ + fVar231 * auVar164._12_4_ + fVar188 * auVar181._12_4_;
  auVar139._0_4_ = fVar220 * auVar16._0_4_ + auVar18._0_4_ * fVar210 + fVar222 * auVar17._0_4_;
  auVar139._4_4_ = fVar189 * auVar16._4_4_ + auVar18._4_4_ * fVar175 + fVar227 * auVar17._4_4_;
  auVar139._8_4_ = fVar221 * auVar16._8_4_ + auVar18._8_4_ * fVar219 + fVar229 * auVar17._8_4_;
  auVar139._12_4_ = fVar190 * auVar16._12_4_ + auVar18._12_4_ * fVar188 + fVar231 * auVar17._12_4_;
  auVar120._0_4_ = fVar220 * auVar121._0_4_ + fVar222 * auVar122._0_4_ + auVar140._0_4_ * fVar210;
  auVar120._4_4_ = fVar189 * auVar121._4_4_ + fVar227 * auVar122._4_4_ + auVar140._4_4_ * fVar175;
  auVar120._8_4_ = fVar221 * auVar121._8_4_ + fVar229 * auVar122._8_4_ + auVar140._8_4_ * fVar219;
  auVar120._12_4_ =
       fVar190 * auVar121._12_4_ + fVar231 * auVar122._12_4_ + auVar140._12_4_ * fVar188;
  auVar224._8_4_ = 0x7fffffff;
  auVar224._0_8_ = 0x7fffffff7fffffff;
  auVar224._12_4_ = 0x7fffffff;
  auVar214 = vandps_avx(auVar290,auVar224);
  auVar176._8_4_ = 0x219392ef;
  auVar176._0_8_ = 0x219392ef219392ef;
  auVar176._12_4_ = 0x219392ef;
  auVar214 = vcmpps_avx(auVar214,auVar176,1);
  auVar164 = vblendvps_avx(auVar290,auVar176,auVar214);
  auVar214 = vandps_avx(auVar297,auVar224);
  auVar214 = vcmpps_avx(auVar214,auVar176,1);
  auVar181 = vblendvps_avx(auVar297,auVar176,auVar214);
  auVar214 = vandps_avx(auVar235,auVar224);
  auVar214 = vcmpps_avx(auVar214,auVar176,1);
  auVar214 = vblendvps_avx(auVar235,auVar176,auVar214);
  auVar16 = vrcpps_avx(auVar164);
  fVar222 = auVar16._0_4_;
  auVar159._0_4_ = fVar222 * auVar164._0_4_;
  fVar227 = auVar16._4_4_;
  auVar159._4_4_ = fVar227 * auVar164._4_4_;
  fVar229 = auVar16._8_4_;
  auVar159._8_4_ = fVar229 * auVar164._8_4_;
  fVar231 = auVar16._12_4_;
  auVar159._12_4_ = fVar231 * auVar164._12_4_;
  auVar236._8_4_ = 0x3f800000;
  auVar236._0_8_ = 0x3f8000003f800000;
  auVar236._12_4_ = 0x3f800000;
  auVar164 = vsubps_avx(auVar236,auVar159);
  fVar222 = fVar222 + fVar222 * auVar164._0_4_;
  fVar227 = fVar227 + fVar227 * auVar164._4_4_;
  fVar229 = fVar229 + fVar229 * auVar164._8_4_;
  fVar231 = fVar231 + fVar231 * auVar164._12_4_;
  auVar164 = vrcpps_avx(auVar181);
  fVar210 = auVar164._0_4_;
  auVar211._0_4_ = fVar210 * auVar181._0_4_;
  fVar219 = auVar164._4_4_;
  auVar211._4_4_ = fVar219 * auVar181._4_4_;
  fVar220 = auVar164._8_4_;
  auVar211._8_4_ = fVar220 * auVar181._8_4_;
  fVar221 = auVar164._12_4_;
  auVar211._12_4_ = fVar221 * auVar181._12_4_;
  auVar164 = vsubps_avx(auVar236,auVar211);
  fVar210 = fVar210 + fVar210 * auVar164._0_4_;
  fVar219 = fVar219 + fVar219 * auVar164._4_4_;
  fVar220 = fVar220 + fVar220 * auVar164._8_4_;
  fVar221 = fVar221 + fVar221 * auVar164._12_4_;
  auVar164 = vrcpps_avx(auVar214);
  fVar175 = auVar164._0_4_;
  auVar177._0_4_ = fVar175 * auVar214._0_4_;
  fVar188 = auVar164._4_4_;
  auVar177._4_4_ = fVar188 * auVar214._4_4_;
  fVar189 = auVar164._8_4_;
  auVar177._8_4_ = fVar189 * auVar214._8_4_;
  fVar190 = auVar164._12_4_;
  auVar177._12_4_ = fVar190 * auVar214._12_4_;
  auVar214 = vsubps_avx(auVar236,auVar177);
  fVar175 = fVar175 + fVar175 * auVar214._0_4_;
  fVar188 = fVar188 + fVar188 * auVar214._4_4_;
  fVar189 = fVar189 + fVar189 * auVar214._8_4_;
  fVar190 = fVar190 + fVar190 * auVar214._12_4_;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *(ulong *)(prim + uVar118 * 7 + 6);
  auVar214 = vpmovsxwd_avx(auVar214);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar214 = vsubps_avx(auVar214,auVar196);
  auVar160._0_4_ = fVar222 * auVar214._0_4_;
  auVar160._4_4_ = fVar227 * auVar214._4_4_;
  auVar160._8_4_ = fVar229 * auVar214._8_4_;
  auVar160._12_4_ = fVar231 * auVar214._12_4_;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = *(ulong *)(prim + uVar118 * 9 + 6);
  auVar214 = vpmovsxwd_avx(auVar164);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar214 = vsubps_avx(auVar214,auVar196);
  auVar197._0_4_ = fVar222 * auVar214._0_4_;
  auVar197._4_4_ = fVar227 * auVar214._4_4_;
  auVar197._8_4_ = fVar229 * auVar214._8_4_;
  auVar197._12_4_ = fVar231 * auVar214._12_4_;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar164 = vpmovsxwd_avx(auVar181);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar118 * -2 + 6);
  auVar214 = vpmovsxwd_avx(auVar16);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar214 = vsubps_avx(auVar214,auVar139);
  auVar244._0_4_ = auVar214._0_4_ * fVar210;
  auVar244._4_4_ = auVar214._4_4_ * fVar219;
  auVar244._8_4_ = auVar214._8_4_ * fVar220;
  auVar244._12_4_ = auVar214._12_4_ * fVar221;
  auVar249 = ZEXT1664(auVar244);
  auVar214 = vcvtdq2ps_avx(auVar164);
  auVar214 = vsubps_avx(auVar214,auVar139);
  auVar140._0_4_ = fVar210 * auVar214._0_4_;
  auVar140._4_4_ = fVar219 * auVar214._4_4_;
  auVar140._8_4_ = fVar220 * auVar214._8_4_;
  auVar140._12_4_ = fVar221 * auVar214._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar115 + uVar118 + 6);
  auVar214 = vpmovsxwd_avx(auVar17);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar214 = vsubps_avx(auVar214,auVar120);
  auVar212._0_4_ = auVar214._0_4_ * fVar175;
  auVar212._4_4_ = auVar214._4_4_ * fVar188;
  auVar212._8_4_ = auVar214._8_4_ * fVar189;
  auVar212._12_4_ = auVar214._12_4_ * fVar190;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar118 * 0x17 + 6);
  auVar214 = vpmovsxwd_avx(auVar18);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar214 = vsubps_avx(auVar214,auVar120);
  auVar121._0_4_ = auVar214._0_4_ * fVar175;
  auVar121._4_4_ = auVar214._4_4_ * fVar188;
  auVar121._8_4_ = auVar214._8_4_ * fVar189;
  auVar121._12_4_ = auVar214._12_4_ * fVar190;
  auVar214 = vpminsd_avx(auVar160,auVar197);
  auVar164 = vpminsd_avx(auVar244,auVar140);
  auVar214 = vmaxps_avx(auVar214,auVar164);
  auVar164 = vpminsd_avx(auVar212,auVar121);
  uVar8 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar263._4_4_ = uVar8;
  auVar263._0_4_ = uVar8;
  auVar263._8_4_ = uVar8;
  auVar263._12_4_ = uVar8;
  auVar270 = ZEXT1664(auVar263);
  auVar164 = vmaxps_avx(auVar164,auVar263);
  auVar214 = vmaxps_avx(auVar214,auVar164);
  local_2f0._0_4_ = auVar214._0_4_ * 0.99999964;
  local_2f0._4_4_ = auVar214._4_4_ * 0.99999964;
  local_2f0._8_4_ = auVar214._8_4_ * 0.99999964;
  local_2f0._12_4_ = auVar214._12_4_ * 0.99999964;
  auVar214 = vpmaxsd_avx(auVar160,auVar197);
  auVar164 = vpmaxsd_avx(auVar244,auVar140);
  auVar214 = vminps_avx(auVar214,auVar164);
  auVar164 = vpmaxsd_avx(auVar212,auVar121);
  fVar210 = ray->tfar;
  auVar161._4_4_ = fVar210;
  auVar161._0_4_ = fVar210;
  auVar161._8_4_ = fVar210;
  auVar161._12_4_ = fVar210;
  auVar164 = vminps_avx(auVar164,auVar161);
  auVar214 = vminps_avx(auVar214,auVar164);
  auVar122._0_4_ = auVar214._0_4_ * 1.0000004;
  auVar122._4_4_ = auVar214._4_4_ * 1.0000004;
  auVar122._8_4_ = auVar214._8_4_ * 1.0000004;
  auVar122._12_4_ = auVar214._12_4_ * 1.0000004;
  auVar214 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar164 = vpcmpgtd_avx(auVar214,_DAT_01f7fcf0);
  auVar214 = vcmpps_avx(local_2f0,auVar122,2);
  auVar214 = vandps_avx(auVar214,auVar164);
  uVar113 = vmovmskps_avx(auVar214);
  if (uVar113 != 0) {
    uVar113 = uVar113 & 0xff;
    local_4e0 = mm_lookupmask_ps._16_8_;
    uStack_4d8 = mm_lookupmask_ps._24_8_;
    uStack_4d0 = mm_lookupmask_ps._16_8_;
    uStack_4c8 = mm_lookupmask_ps._24_8_;
    local_7c8 = prim;
    do {
      uVar118 = (ulong)uVar113;
      auVar264 = auVar270._0_32_;
      auVar245 = auVar249._0_32_;
      lVar110 = 0;
      if (uVar118 != 0) {
        for (; (uVar113 >> lVar110 & 1) == 0; lVar110 = lVar110 + 1) {
        }
      }
      uVar118 = uVar118 - 1 & uVar118;
      local_7b4 = *(undefined4 *)(local_7c8 + lVar110 * 4 + 6);
      lVar110 = lVar110 * 0x40;
      lVar116 = 0;
      if (uVar118 != 0) {
        for (; (uVar118 >> lVar116 & 1) == 0; lVar116 = lVar116 + 1) {
        }
      }
      local_688 = (ulong)*(uint *)(local_7c8 + 2);
      pGVar114 = (context->scene->geometries).items[*(uint *)(local_7c8 + 2)].ptr;
      _local_7b0 = *(undefined1 (*) [16])(prim + lVar110 + lVar99 + 0x16);
      if (((uVar118 != 0) && (uVar115 = uVar118 - 1 & uVar118, uVar115 != 0)) &&
         (lVar116 = 0, uVar115 != 0)) {
        for (; (uVar115 >> lVar116 & 1) == 0; lVar116 = lVar116 + 1) {
        }
      }
      _local_550 = *(undefined1 (*) [16])(prim + lVar110 + lVar99 + 0x26);
      _local_560 = *(undefined1 (*) [16])(prim + lVar110 + lVar99 + 0x36);
      _local_570 = *(undefined1 (*) [16])(prim + lVar110 + lVar99 + 0x46);
      uVar113 = (uint)pGVar114[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar9 = (ray->org).field_0;
      auVar181 = vsubps_avx(_local_7b0,(undefined1  [16])aVar9);
      auVar121 = _local_7b0;
      auVar214 = vshufps_avx(auVar181,auVar181,0);
      auVar164 = vshufps_avx(auVar181,auVar181,0x55);
      auVar181 = vshufps_avx(auVar181,auVar181,0xaa);
      fVar210 = (pre->ray_space).vx.field_0.m128[0];
      fVar175 = (pre->ray_space).vx.field_0.m128[1];
      fVar219 = (pre->ray_space).vx.field_0.m128[2];
      fVar188 = (pre->ray_space).vx.field_0.m128[3];
      fVar220 = (pre->ray_space).vy.field_0.m128[0];
      fVar189 = (pre->ray_space).vy.field_0.m128[1];
      fVar221 = (pre->ray_space).vy.field_0.m128[2];
      fVar190 = (pre->ray_space).vy.field_0.m128[3];
      fVar222 = (pre->ray_space).vz.field_0.m128[0];
      fVar227 = (pre->ray_space).vz.field_0.m128[1];
      fVar229 = (pre->ray_space).vz.field_0.m128[2];
      fVar231 = (pre->ray_space).vz.field_0.m128[3];
      auVar178._0_4_ =
           auVar214._0_4_ * fVar210 + auVar181._0_4_ * fVar222 + auVar164._0_4_ * fVar220;
      auVar178._4_4_ =
           auVar214._4_4_ * fVar175 + auVar181._4_4_ * fVar227 + auVar164._4_4_ * fVar189;
      auVar178._8_4_ =
           auVar214._8_4_ * fVar219 + auVar181._8_4_ * fVar229 + auVar164._8_4_ * fVar221;
      auVar178._12_4_ =
           auVar214._12_4_ * fVar188 + auVar181._12_4_ * fVar231 + auVar164._12_4_ * fVar190;
      auVar214 = vblendps_avx(auVar178,_local_7b0,8);
      auVar16 = vsubps_avx(_local_550,(undefined1  [16])aVar9);
      auVar164 = vshufps_avx(auVar16,auVar16,0);
      auVar181 = vshufps_avx(auVar16,auVar16,0x55);
      auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
      auVar198._0_4_ = auVar164._0_4_ * fVar210 + auVar16._0_4_ * fVar222 + auVar181._0_4_ * fVar220
      ;
      auVar198._4_4_ = auVar164._4_4_ * fVar175 + auVar16._4_4_ * fVar227 + auVar181._4_4_ * fVar189
      ;
      auVar198._8_4_ = auVar164._8_4_ * fVar219 + auVar16._8_4_ * fVar229 + auVar181._8_4_ * fVar221
      ;
      auVar198._12_4_ =
           auVar164._12_4_ * fVar188 + auVar16._12_4_ * fVar231 + auVar181._12_4_ * fVar190;
      auVar164 = vblendps_avx(auVar198,_local_550,8);
      auVar17 = vsubps_avx(_local_560,(undefined1  [16])aVar9);
      auVar181 = vshufps_avx(auVar17,auVar17,0);
      auVar16 = vshufps_avx(auVar17,auVar17,0x55);
      auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
      auVar213._0_4_ = auVar181._0_4_ * fVar210 + auVar16._0_4_ * fVar220 + auVar17._0_4_ * fVar222;
      auVar213._4_4_ = auVar181._4_4_ * fVar175 + auVar16._4_4_ * fVar189 + auVar17._4_4_ * fVar227;
      auVar213._8_4_ = auVar181._8_4_ * fVar219 + auVar16._8_4_ * fVar221 + auVar17._8_4_ * fVar229;
      auVar213._12_4_ =
           auVar181._12_4_ * fVar188 + auVar16._12_4_ * fVar190 + auVar17._12_4_ * fVar231;
      auVar181 = vblendps_avx(auVar213,_local_560,8);
      local_540._0_16_ = (undefined1  [16])aVar9;
      auVar18 = vsubps_avx(_local_570,(undefined1  [16])aVar9);
      auVar16 = vshufps_avx(auVar18,auVar18,0);
      auVar17 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      auVar141._0_4_ = auVar16._0_4_ * fVar210 + auVar18._0_4_ * fVar222 + auVar17._0_4_ * fVar220;
      auVar141._4_4_ = auVar16._4_4_ * fVar175 + auVar18._4_4_ * fVar227 + auVar17._4_4_ * fVar189;
      auVar141._8_4_ = auVar16._8_4_ * fVar219 + auVar18._8_4_ * fVar229 + auVar17._8_4_ * fVar221;
      auVar141._12_4_ =
           auVar16._12_4_ * fVar188 + auVar18._12_4_ * fVar231 + auVar17._12_4_ * fVar190;
      auVar16 = vblendps_avx(auVar141,_local_570,8);
      auVar199._8_4_ = 0x7fffffff;
      auVar199._0_8_ = 0x7fffffff7fffffff;
      auVar199._12_4_ = 0x7fffffff;
      auVar214 = vandps_avx(auVar214,auVar199);
      auVar164 = vandps_avx(auVar164,auVar199);
      auVar17 = vmaxps_avx(auVar214,auVar164);
      auVar214 = vandps_avx(auVar181,auVar199);
      auVar164 = vandps_avx(auVar16,auVar199);
      auVar214 = vmaxps_avx(auVar214,auVar164);
      auVar214 = vmaxps_avx(auVar17,auVar214);
      auVar164 = vmovshdup_avx(auVar214);
      auVar164 = vmaxss_avx(auVar164,auVar214);
      auVar214 = vshufpd_avx(auVar214,auVar214,1);
      auVar214 = vmaxss_avx(auVar214,auVar164);
      lVar110 = (long)(int)uVar113 * 0x44;
      fVar262 = *(float *)(bspline_basis0 + lVar110 + 0x908);
      fVar272 = *(float *)(bspline_basis0 + lVar110 + 0x90c);
      fVar274 = *(float *)(bspline_basis0 + lVar110 + 0x910);
      fVar275 = *(float *)(bspline_basis0 + lVar110 + 0x914);
      fVar276 = *(float *)(bspline_basis0 + lVar110 + 0x918);
      fVar277 = *(float *)(bspline_basis0 + lVar110 + 0x91c);
      fVar278 = *(float *)(bspline_basis0 + lVar110 + 0x920);
      auVar164 = vshufps_avx(auVar213,auVar213,0);
      register0x00001250 = auVar164;
      _local_760 = auVar164;
      auVar181 = vshufps_avx(auVar213,auVar213,0x55);
      register0x00001290 = auVar181;
      _local_780 = auVar181;
      fVar210 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar110 + 0xd8c);
      fVar175 = *(float *)(bspline_basis0 + lVar110 + 0xd90);
      fVar219 = *(float *)(bspline_basis0 + lVar110 + 0xd94);
      fVar188 = *(float *)(bspline_basis0 + lVar110 + 0xd98);
      fVar220 = *(float *)(bspline_basis0 + lVar110 + 0xd9c);
      fVar189 = *(float *)(bspline_basis0 + lVar110 + 0xda0);
      fVar221 = *(float *)(bspline_basis0 + lVar110 + 0xda4);
      auVar102 = *(undefined1 (*) [28])(bspline_basis0 + lVar110 + 0xd8c);
      fVar190 = *(float *)(bspline_basis0 + lVar110 + 0xda8);
      auVar16 = vshufps_avx(auVar141,auVar141,0);
      register0x00001550 = auVar16;
      _local_420 = auVar16;
      fVar279 = auVar16._0_4_;
      fVar300 = auVar16._4_4_;
      fVar301 = auVar16._8_4_;
      fVar303 = auVar16._12_4_;
      fVar137 = auVar164._0_4_;
      fVar147 = auVar164._4_4_;
      fVar149 = auVar164._8_4_;
      fVar260 = auVar164._12_4_;
      auVar164 = vshufps_avx(auVar141,auVar141,0x55);
      register0x00001490 = auVar164;
      _local_6c0 = auVar164;
      fVar280 = auVar164._0_4_;
      fVar284 = auVar164._4_4_;
      fVar285 = auVar164._8_4_;
      fVar286 = auVar164._12_4_;
      fVar156 = auVar181._0_4_;
      fVar168 = auVar181._4_4_;
      fVar170 = auVar181._8_4_;
      fVar172 = auVar181._12_4_;
      auVar122 = _local_560;
      auVar164 = vshufps_avx(_local_560,_local_560,0xff);
      register0x00001310 = auVar164;
      _local_e0 = auVar164;
      auVar18 = _local_570;
      auVar181 = vshufps_avx(_local_570,_local_570,0xff);
      register0x00001410 = auVar181;
      _local_100 = auVar181;
      fVar242 = auVar181._0_4_;
      fVar250 = auVar181._4_4_;
      fVar252 = auVar181._8_4_;
      fVar254 = auVar181._12_4_;
      fVar195 = auVar164._0_4_;
      fVar207 = auVar164._4_4_;
      fVar208 = auVar164._8_4_;
      auVar181 = vshufps_avx(auVar198,auVar198,0);
      register0x000015d0 = auVar181;
      _local_400 = auVar181;
      pauVar3 = (undefined1 (*) [16])(bspline_basis0 + lVar110 + 0x484);
      fVar222 = *(float *)*pauVar3;
      fVar227 = *(float *)(bspline_basis0 + lVar110 + 0x488);
      fVar229 = *(float *)(bspline_basis0 + lVar110 + 0x48c);
      auVar103 = *(undefined1 (*) [12])*pauVar3;
      fVar243 = *(float *)(bspline_basis0 + lVar110 + 0x490);
      fStack_330 = *(float *)(bspline_basis0 + lVar110 + 0x494);
      fStack_32c = *(float *)(bspline_basis0 + lVar110 + 0x498);
      fStack_328 = *(float *)(bspline_basis0 + lVar110 + 0x49c);
      fVar310 = auVar181._0_4_;
      fVar313 = auVar181._4_4_;
      fVar314 = auVar181._8_4_;
      fVar315 = auVar181._12_4_;
      auVar181 = vshufps_avx(auVar198,auVar198,0x55);
      register0x00001210 = auVar181;
      _local_a0 = auVar181;
      fVar153 = auVar181._0_4_;
      fVar155 = auVar181._4_4_;
      fVar134 = auVar181._8_4_;
      fVar135 = auVar181._12_4_;
      auVar140 = _local_550;
      auVar181 = vshufps_avx(_local_550,_local_550,0xff);
      register0x00001590 = auVar181;
      _local_80 = auVar181;
      _local_340 = *pauVar3;
      auVar120 = _local_340;
      uStack_324 = *(undefined4 *)(bspline_basis0 + lVar110 + 0x4a0);
      fVar302 = auVar181._0_4_;
      fVar304 = auVar181._4_4_;
      fVar305 = auVar181._8_4_;
      fVar307 = auVar181._12_4_;
      auVar181 = vshufps_avx(auVar178,auVar178,0);
      register0x00001390 = auVar181;
      _local_140 = auVar181;
      pauVar1 = (undefined1 (*) [32])(bspline_basis0 + lVar110);
      fVar231 = *(float *)*pauVar1;
      fVar193 = *(float *)(bspline_basis0 + lVar110 + 4);
      fVar289 = *(float *)(bspline_basis0 + lVar110 + 8);
      fVar191 = *(float *)(bspline_basis0 + lVar110 + 0xc);
      fVar256 = *(float *)(bspline_basis0 + lVar110 + 0x10);
      fVar251 = *(float *)(bspline_basis0 + lVar110 + 0x14);
      fVar253 = *(float *)(bspline_basis0 + lVar110 + 0x18);
      auVar104 = *(undefined1 (*) [28])*pauVar1;
      fVar223 = auVar181._0_4_;
      fVar228 = auVar181._4_4_;
      fVar230 = auVar181._8_4_;
      fVar232 = auVar181._12_4_;
      auVar287._0_4_ = fVar223 * fVar231 + fVar310 * fVar222 + fVar137 * fVar262 + fVar279 * fVar210
      ;
      auVar287._4_4_ = fVar228 * fVar193 + fVar313 * fVar227 + fVar147 * fVar272 + fVar300 * fVar175
      ;
      auVar287._8_4_ = fVar230 * fVar289 + fVar314 * fVar229 + fVar149 * fVar274 + fVar301 * fVar219
      ;
      auVar287._12_4_ =
           fVar232 * fVar191 + fVar315 * fVar243 + fVar260 * fVar275 + fVar303 * fVar188;
      auVar287._16_4_ =
           fVar223 * fVar256 + fVar310 * fStack_330 + fVar137 * fVar276 + fVar279 * fVar220;
      auVar287._20_4_ =
           fVar228 * fVar251 + fVar313 * fStack_32c + fVar147 * fVar277 + fVar300 * fVar189;
      auVar287._24_4_ =
           fVar230 * fVar253 + fVar314 * fStack_328 + fVar149 * fVar278 + fVar301 * fVar221;
      auVar287._28_4_ = fVar190 + fVar260 + 0.0 + 0.0;
      auVar16 = vshufps_avx(auVar178,auVar178,0x55);
      register0x00001290 = auVar16;
      _local_c0 = auVar16;
      fVar157 = auVar16._0_4_;
      fVar169 = auVar16._4_4_;
      fVar171 = auVar16._8_4_;
      fVar173 = auVar16._12_4_;
      auVar291._0_4_ = fVar157 * fVar231 + fVar153 * fVar222 + fVar156 * fVar262 + fVar280 * fVar210
      ;
      auVar291._4_4_ = fVar169 * fVar193 + fVar155 * fVar227 + fVar168 * fVar272 + fVar284 * fVar175
      ;
      auVar291._8_4_ = fVar171 * fVar289 + fVar134 * fVar229 + fVar170 * fVar274 + fVar285 * fVar219
      ;
      auVar291._12_4_ =
           fVar173 * fVar191 + fVar135 * fVar243 + fVar172 * fVar275 + fVar286 * fVar188;
      auVar291._16_4_ =
           fVar157 * fVar256 + fVar153 * fStack_330 + fVar156 * fVar276 + fVar280 * fVar220;
      auVar291._20_4_ =
           fVar169 * fVar251 + fVar155 * fStack_32c + fVar168 * fVar277 + fVar284 * fVar189;
      auVar291._24_4_ =
           fVar171 * fVar253 + fVar134 * fStack_328 + fVar170 * fVar278 + fVar285 * fVar221;
      auVar291._28_4_ = fVar135 + fVar172 + 0.0 + 0.0;
      auVar16 = vpermilps_avx(_local_7b0,0xff);
      register0x00001450 = auVar16;
      _local_120 = auVar16;
      _local_360 = *pauVar1;
      auVar24 = _local_360;
      fVar261 = auVar16._0_4_;
      fVar271 = auVar16._4_4_;
      fVar273 = auVar16._8_4_;
      fVar119 = fVar261 * fVar231 + fVar302 * fVar222 + fVar195 * fVar262 + fVar242 * fVar210;
      fVar132 = fVar271 * fVar193 + fVar304 * fVar227 + fVar207 * fVar272 + fVar250 * fVar175;
      fStack_798 = fVar273 * fVar289 + fVar305 * fVar229 + fVar208 * fVar274 + fVar252 * fVar219;
      fStack_794 = auVar16._12_4_ * fVar191 +
                   fVar307 * fVar243 + auVar164._12_4_ * fVar275 + fVar254 * fVar188;
      fStack_790 = fVar261 * fVar256 + fVar302 * fStack_330 + fVar195 * fVar276 + fVar242 * fVar220;
      fStack_78c = fVar271 * fVar251 + fVar304 * fStack_32c + fVar207 * fVar277 + fVar250 * fVar189;
      fStack_788 = fVar273 * fVar253 + fVar305 * fStack_328 + fVar208 * fVar278 + fVar252 * fVar221;
      fStack_784 = *(float *)(bspline_basis0 + lVar110 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar191 = *(float *)(bspline_basis1 + lVar110 + 0x908);
      fVar256 = *(float *)(bspline_basis1 + lVar110 + 0x90c);
      fVar251 = *(float *)(bspline_basis1 + lVar110 + 0x910);
      fVar253 = *(float *)(bspline_basis1 + lVar110 + 0x914);
      fVar192 = *(float *)(bspline_basis1 + lVar110 + 0x918);
      fVar257 = *(float *)(bspline_basis1 + lVar110 + 0x91c);
      fVar255 = *(float *)(bspline_basis1 + lVar110 + 0x920);
      fVar210 = *(float *)*(undefined1 (*) [28])(bspline_basis1 + lVar110 + 0xd8c);
      fVar175 = *(float *)(bspline_basis1 + lVar110 + 0xd90);
      fVar219 = *(float *)(bspline_basis1 + lVar110 + 0xd94);
      fVar188 = *(float *)(bspline_basis1 + lVar110 + 0xd98);
      fVar220 = *(float *)(bspline_basis1 + lVar110 + 0xd9c);
      fVar189 = *(float *)(bspline_basis1 + lVar110 + 0xda0);
      fVar221 = *(float *)(bspline_basis1 + lVar110 + 0xda4);
      auVar105 = *(undefined1 (*) [28])(bspline_basis1 + lVar110 + 0xd8c);
      fVar174 = *(float *)(bspline_basis1 + lVar110 + 0x484);
      fVar133 = *(float *)(bspline_basis1 + lVar110 + 0x488);
      fVar209 = *(float *)(bspline_basis1 + lVar110 + 0x48c);
      fVar233 = *(float *)(bspline_basis1 + lVar110 + 0x490);
      fVar258 = *(float *)(bspline_basis1 + lVar110 + 0x494);
      fVar194 = *(float *)(bspline_basis1 + lVar110 + 0x498);
      fVar154 = *(float *)(bspline_basis1 + lVar110 + 0x49c);
      fVar259 = *(float *)(bspline_basis1 + lVar110);
      fVar136 = *(float *)(bspline_basis1 + lVar110 + 4);
      fVar138 = *(float *)(bspline_basis1 + lVar110 + 8);
      fVar148 = *(float *)(bspline_basis1 + lVar110 + 0xc);
      fVar150 = *(float *)(bspline_basis1 + lVar110 + 0x10);
      fVar151 = *(float *)(bspline_basis1 + lVar110 + 0x14);
      fVar152 = *(float *)(bspline_basis1 + lVar110 + 0x18);
      local_500._0_4_ =
           fVar259 * fVar223 + fVar310 * fVar174 + fVar191 * fVar137 + fVar279 * fVar210;
      local_500._4_4_ =
           fVar136 * fVar228 + fVar313 * fVar133 + fVar256 * fVar147 + fVar300 * fVar175;
      fStack_4f8 = fVar138 * fVar230 + fVar314 * fVar209 + fVar251 * fVar149 + fVar301 * fVar219;
      fStack_4f4 = fVar148 * fVar232 + fVar315 * fVar233 + fVar253 * fVar260 + fVar303 * fVar188;
      fStack_4f0 = fVar150 * fVar223 + fVar310 * fVar258 + fVar192 * fVar137 + fVar279 * fVar220;
      fStack_4ec = fVar151 * fVar228 + fVar313 * fVar194 + fVar257 * fVar147 + fVar300 * fVar189;
      fStack_4e8 = fVar152 * fVar230 + fVar314 * fVar154 + fVar255 * fVar149 + fVar301 * fVar221;
      fStack_4e4 = fVar307 + fVar303 + fStack_784 + 0.0;
      local_480._0_4_ =
           fVar259 * fVar157 + fVar153 * fVar174 + fVar191 * fVar156 + fVar280 * fVar210;
      local_480._4_4_ =
           fVar136 * fVar169 + fVar155 * fVar133 + fVar256 * fVar168 + fVar284 * fVar175;
      fStack_478 = fVar138 * fVar171 + fVar134 * fVar209 + fVar251 * fVar170 + fVar285 * fVar219;
      fStack_474 = fVar148 * fVar173 + fVar135 * fVar233 + fVar253 * fVar172 + fVar286 * fVar188;
      fStack_470 = fVar150 * fVar157 + fVar153 * fVar258 + fVar192 * fVar156 + fVar280 * fVar220;
      fStack_46c = fVar151 * fVar169 + fVar155 * fVar194 + fVar257 * fVar168 + fVar284 * fVar189;
      fStack_468 = fVar152 * fVar171 + fVar134 * fVar154 + fVar255 * fVar170 + fVar285 * fVar221;
      fStack_464 = fVar173 + fVar303 + fVar190 + 0.0;
      local_680._0_4_ =
           fVar302 * fVar174 + fVar195 * fVar191 + fVar242 * fVar210 + fVar261 * fVar259;
      local_680._4_4_ =
           fVar304 * fVar133 + fVar207 * fVar256 + fVar250 * fVar175 + fVar271 * fVar136;
      local_680._8_4_ =
           fVar305 * fVar209 + fVar208 * fVar251 + fVar252 * fVar219 + fVar273 * fVar138;
      local_680._12_4_ =
           fVar307 * fVar233 + auVar164._12_4_ * fVar253 + fVar254 * fVar188 +
           auVar16._12_4_ * fVar148;
      local_680._16_4_ =
           fVar302 * fVar258 + fVar195 * fVar192 + fVar242 * fVar220 + fVar261 * fVar150;
      local_680._20_4_ =
           fVar304 * fVar194 + fVar207 * fVar257 + fVar250 * fVar189 + fVar271 * fVar151;
      local_680._24_4_ =
           fVar305 * fVar154 + fVar208 * fVar255 + fVar252 * fVar221 + fVar273 * fVar152;
      local_680._28_4_ = fVar303 + fVar254 + fVar190 + fVar173;
      local_380 = vsubps_avx(_local_500,auVar287);
      auVar19 = vsubps_avx(_local_480,auVar291);
      fVar210 = local_380._0_4_;
      fVar219 = local_380._4_4_;
      auVar14._4_4_ = auVar291._4_4_ * fVar219;
      auVar14._0_4_ = auVar291._0_4_ * fVar210;
      fVar220 = local_380._8_4_;
      auVar14._8_4_ = auVar291._8_4_ * fVar220;
      fVar221 = local_380._12_4_;
      auVar14._12_4_ = auVar291._12_4_ * fVar221;
      fVar222 = local_380._16_4_;
      auVar14._16_4_ = auVar291._16_4_ * fVar222;
      fVar229 = local_380._20_4_;
      auVar14._20_4_ = auVar291._20_4_ * fVar229;
      fVar193 = local_380._24_4_;
      auVar14._24_4_ = auVar291._24_4_ * fVar193;
      auVar14._28_4_ = fVar173;
      fVar175 = auVar19._0_4_;
      fVar188 = auVar19._4_4_;
      auVar20._4_4_ = auVar287._4_4_ * fVar188;
      auVar20._0_4_ = auVar287._0_4_ * fVar175;
      fVar189 = auVar19._8_4_;
      auVar20._8_4_ = auVar287._8_4_ * fVar189;
      fVar190 = auVar19._12_4_;
      auVar20._12_4_ = auVar287._12_4_ * fVar190;
      fVar227 = auVar19._16_4_;
      auVar20._16_4_ = auVar287._16_4_ * fVar227;
      fVar231 = auVar19._20_4_;
      auVar20._20_4_ = auVar287._20_4_ * fVar231;
      fVar289 = auVar19._24_4_;
      auVar20._24_4_ = auVar287._24_4_ * fVar289;
      auVar20._28_4_ = fStack_464;
      auVar20 = vsubps_avx(auVar14,auVar20);
      auVar15._4_4_ = fVar132;
      auVar15._0_4_ = fVar119;
      auVar15._8_4_ = fStack_798;
      auVar15._12_4_ = fStack_794;
      auVar15._16_4_ = fStack_790;
      auVar15._20_4_ = fStack_78c;
      auVar15._24_4_ = fStack_788;
      auVar15._28_4_ = fStack_784;
      auVar14 = vmaxps_avx(auVar15,local_680._0_32_);
      auVar27._4_4_ = auVar14._4_4_ * auVar14._4_4_ * (fVar219 * fVar219 + fVar188 * fVar188);
      auVar27._0_4_ = auVar14._0_4_ * auVar14._0_4_ * (fVar210 * fVar210 + fVar175 * fVar175);
      auVar27._8_4_ = auVar14._8_4_ * auVar14._8_4_ * (fVar220 * fVar220 + fVar189 * fVar189);
      auVar27._12_4_ = auVar14._12_4_ * auVar14._12_4_ * (fVar221 * fVar221 + fVar190 * fVar190);
      auVar27._16_4_ = auVar14._16_4_ * auVar14._16_4_ * (fVar222 * fVar222 + fVar227 * fVar227);
      auVar27._20_4_ = auVar14._20_4_ * auVar14._20_4_ * (fVar229 * fVar229 + fVar231 * fVar231);
      auVar27._24_4_ = auVar14._24_4_ * auVar14._24_4_ * (fVar193 * fVar193 + fVar289 * fVar289);
      auVar27._28_4_ = auVar19._28_4_ + fStack_464;
      auVar13._4_4_ = auVar20._4_4_ * auVar20._4_4_;
      auVar13._0_4_ = auVar20._0_4_ * auVar20._0_4_;
      auVar13._8_4_ = auVar20._8_4_ * auVar20._8_4_;
      auVar13._12_4_ = auVar20._12_4_ * auVar20._12_4_;
      auVar13._16_4_ = auVar20._16_4_ * auVar20._16_4_;
      auVar13._20_4_ = auVar20._20_4_ * auVar20._20_4_;
      auVar13._24_4_ = auVar20._24_4_ * auVar20._24_4_;
      auVar13._28_4_ = auVar20._28_4_;
      auVar14 = vcmpps_avx(auVar13,auVar27,2);
      auVar179._0_4_ = (float)(int)uVar113;
      auVar179._4_12_ = auVar181._4_12_;
      _local_440 = auVar179;
      auVar164 = vshufps_avx(auVar179,auVar179,0);
      auVar183._16_16_ = auVar164;
      auVar183._0_16_ = auVar164;
      auVar20 = vcmpps_avx(_DAT_01faff40,auVar183,1);
      auVar187 = ZEXT3264(auVar20);
      auVar164 = vpermilps_avx(auVar178,0xaa);
      register0x00001450 = auVar164;
      _local_160 = auVar164;
      auVar181 = vpermilps_avx(auVar198,0xaa);
      register0x00001550 = auVar181;
      _local_3e0 = auVar181;
      auVar16 = vpermilps_avx(auVar213,0xaa);
      register0x00001590 = auVar16;
      _local_320 = auVar16;
      auVar17 = vpermilps_avx(auVar141,0xaa);
      auVar206 = ZEXT1664(auVar17);
      register0x00001510 = auVar17;
      _local_600 = auVar17;
      auVar27 = auVar20 & auVar14;
      auVar214 = ZEXT416((uint)(auVar214._0_4_ * 4.7683716e-07));
      _local_6e0 = auVar214;
      fVar210 = fVar280;
      fVar175 = fVar284;
      fVar219 = fVar285;
      fVar188 = fVar286;
      fVar220 = fVar156;
      fVar189 = fVar168;
      fVar221 = fVar170;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar27 >> 0x7f,0) == '\0') &&
            (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar27 >> 0xbf,0) == '\0') &&
          (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar27[0x1f])
      {
        auVar249 = ZEXT3264(auVar245);
        auVar270 = ZEXT3264(auVar264);
LAB_00e28236:
        auVar288 = ZEXT3264(_local_760);
        bVar117 = false;
        _local_570 = auVar18;
        _local_560 = auVar122;
        _local_550 = auVar140;
      }
      else {
        auVar14 = vandps_avx(auVar14,auVar20);
        fVar195 = auVar164._0_4_;
        fVar207 = auVar164._4_4_;
        fVar208 = auVar164._8_4_;
        fVar242 = auVar164._12_4_;
        fVar271 = auVar181._0_4_;
        fVar273 = auVar181._4_4_;
        fVar302 = auVar181._8_4_;
        fVar304 = auVar181._12_4_;
        fVar305 = auVar16._0_4_;
        fVar307 = auVar16._4_4_;
        fVar308 = auVar16._8_4_;
        fVar309 = auVar16._12_4_;
        local_4c0._0_4_ = auVar105._0_4_;
        local_4c0._4_4_ = auVar105._4_4_;
        fStack_4b8 = auVar105._8_4_;
        fStack_4b4 = auVar105._12_4_;
        fStack_4b0 = auVar105._16_4_;
        fStack_4ac = auVar105._20_4_;
        fStack_4a8 = auVar105._24_4_;
        fVar250 = auVar17._0_4_;
        fVar252 = auVar17._4_4_;
        fVar254 = auVar17._8_4_;
        fVar261 = auVar17._12_4_;
        fVar190 = auVar20._28_4_ +
                  *(float *)(bspline_basis1 + lVar110 + 0x924) +
                  *(float *)(bspline_basis1 + lVar110 + 0xda8);
        local_4c0._0_4_ =
             fVar195 * fVar259 +
             fVar271 * fVar174 + fVar305 * fVar191 + fVar250 * (float)local_4c0._0_4_;
        local_4c0._4_4_ =
             fVar207 * fVar136 +
             fVar273 * fVar133 + fVar307 * fVar256 + fVar252 * (float)local_4c0._4_4_;
        fStack_4b8 = fVar208 * fVar138 +
                     fVar302 * fVar209 + fVar308 * fVar251 + fVar254 * fStack_4b8;
        fStack_4b4 = fVar242 * fVar148 +
                     fVar304 * fVar233 + fVar309 * fVar253 + fVar261 * fStack_4b4;
        fStack_4b0 = fVar195 * fVar150 +
                     fVar271 * fVar258 + fVar305 * fVar192 + fVar250 * fStack_4b0;
        fStack_4ac = fVar207 * fVar151 +
                     fVar273 * fVar194 + fVar307 * fVar257 + fVar252 * fStack_4ac;
        fStack_4a8 = fVar208 * fVar152 +
                     fVar302 * fVar154 + fVar308 * fVar255 + fVar254 * fStack_4a8;
        fStack_4a4 = auVar14._28_4_ + fVar190;
        local_360._0_4_ = auVar104._0_4_;
        local_360._4_4_ = auVar104._4_4_;
        fStack_358 = auVar104._8_4_;
        fStack_354 = auVar104._12_4_;
        fStack_350 = auVar104._16_4_;
        fStack_34c = auVar104._20_4_;
        fStack_348 = auVar104._24_4_;
        local_340._0_4_ = auVar103._0_4_;
        local_340._4_4_ = auVar103._4_4_;
        fStack_338 = auVar103._8_4_;
        local_5a0._0_4_ = auVar102._0_4_;
        local_5a0._4_4_ = auVar102._4_4_;
        fStack_598 = auVar102._8_4_;
        fStack_594 = auVar102._12_4_;
        fStack_590 = auVar102._16_4_;
        fStack_58c = auVar102._20_4_;
        fStack_588 = auVar102._24_4_;
        local_4a0 = fVar195 * (float)local_360._0_4_ +
                    fVar271 * (float)local_340._0_4_ +
                    fVar305 * fVar262 + fVar250 * (float)local_5a0._0_4_;
        fStack_49c = fVar207 * (float)local_360._4_4_ +
                     fVar273 * (float)local_340._4_4_ +
                     fVar307 * fVar272 + fVar252 * (float)local_5a0._4_4_;
        fStack_498 = fVar208 * fStack_358 +
                     fVar302 * fStack_338 + fVar308 * fVar274 + fVar254 * fStack_598;
        fStack_494 = fVar242 * fStack_354 +
                     fVar304 * fVar243 + fVar309 * fVar275 + fVar261 * fStack_594;
        fStack_490 = fVar195 * fStack_350 +
                     fVar271 * fStack_330 + fVar305 * fVar276 + fVar250 * fStack_590;
        fStack_48c = fVar207 * fStack_34c +
                     fVar273 * fStack_32c + fVar307 * fVar277 + fVar252 * fStack_58c;
        fStack_488 = fVar208 * fStack_348 +
                     fVar302 * fStack_328 + fVar308 * fVar278 + fVar254 * fStack_588;
        fStack_484 = fStack_4a4 + fVar190 + auVar14._28_4_ + auVar20._28_4_;
        fVar190 = *(float *)(bspline_basis0 + lVar110 + 0x1210);
        fVar222 = *(float *)(bspline_basis0 + lVar110 + 0x1214);
        fVar227 = *(float *)(bspline_basis0 + lVar110 + 0x1218);
        fVar229 = *(float *)(bspline_basis0 + lVar110 + 0x121c);
        fVar231 = *(float *)(bspline_basis0 + lVar110 + 0x1220);
        fVar193 = *(float *)(bspline_basis0 + lVar110 + 0x1224);
        fVar289 = *(float *)(bspline_basis0 + lVar110 + 0x1228);
        fVar262 = *(float *)(bspline_basis0 + lVar110 + 0x1694);
        fVar272 = *(float *)(bspline_basis0 + lVar110 + 0x1698);
        fVar274 = *(float *)(bspline_basis0 + lVar110 + 0x169c);
        fVar275 = *(float *)(bspline_basis0 + lVar110 + 0x16a0);
        fVar276 = *(float *)(bspline_basis0 + lVar110 + 0x16a4);
        fVar277 = *(float *)(bspline_basis0 + lVar110 + 0x16a8);
        fVar278 = *(float *)(bspline_basis0 + lVar110 + 0x16ac);
        fVar243 = *(float *)(bspline_basis0 + lVar110 + 0x1b18);
        fVar191 = *(float *)(bspline_basis0 + lVar110 + 0x1b1c);
        fVar256 = *(float *)(bspline_basis0 + lVar110 + 0x1b20);
        fVar251 = *(float *)(bspline_basis0 + lVar110 + 0x1b24);
        fVar253 = *(float *)(bspline_basis0 + lVar110 + 0x1b28);
        fVar192 = *(float *)(bspline_basis0 + lVar110 + 0x1b2c);
        fVar257 = *(float *)(bspline_basis0 + lVar110 + 0x1b30);
        fVar255 = *(float *)(bspline_basis0 + lVar110 + 0x1f9c);
        fVar174 = *(float *)(bspline_basis0 + lVar110 + 0x1fa0);
        fVar133 = *(float *)(bspline_basis0 + lVar110 + 0x1fa4);
        fVar209 = *(float *)(bspline_basis0 + lVar110 + 0x1fa8);
        fVar233 = *(float *)(bspline_basis0 + lVar110 + 0x1fac);
        fVar258 = *(float *)(bspline_basis0 + lVar110 + 0x1fb0);
        fVar194 = *(float *)(bspline_basis0 + lVar110 + 0x1fb4);
        fVar154 = *(float *)(bspline_basis0 + lVar110 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar110 + 0x1fb8);
        fVar259 = *(float *)(bspline_basis0 + lVar110 + 0x16b0) + fVar154;
        local_5a0._4_4_ =
             fVar228 * fVar222 + fVar313 * fVar272 + fVar147 * fVar191 + fVar300 * fVar174;
        local_5a0._0_4_ =
             fVar223 * fVar190 + fVar310 * fVar262 + fVar137 * fVar243 + fVar279 * fVar255;
        fStack_598 = fVar230 * fVar227 + fVar314 * fVar274 + fVar149 * fVar256 + fVar301 * fVar133;
        fStack_594 = fVar232 * fVar229 + fVar315 * fVar275 + fVar260 * fVar251 + fVar303 * fVar209;
        fStack_590 = fVar223 * fVar231 + fVar310 * fVar276 + fVar137 * fVar253 + fVar279 * fVar233;
        fStack_58c = fVar228 * fVar193 + fVar313 * fVar277 + fVar147 * fVar192 + fVar300 * fVar258;
        fStack_588 = fVar230 * fVar289 + fVar314 * fVar278 + fVar149 * fVar257 + fVar301 * fVar194;
        fStack_584 = *(float *)(bspline_basis0 + lVar110 + 0x16b0) +
                     *(float *)(bspline_basis0 + lVar110 + 0x1fb8) +
                     fVar242 + *(float *)(bspline_basis1 + lVar110 + 0x4a0);
        auVar142._0_4_ =
             fVar157 * fVar190 + fVar243 * fVar156 + fVar280 * fVar255 + fVar153 * fVar262;
        auVar142._4_4_ =
             fVar169 * fVar222 + fVar191 * fVar168 + fVar284 * fVar174 + fVar155 * fVar272;
        auVar142._8_4_ =
             fVar171 * fVar227 + fVar256 * fVar170 + fVar285 * fVar133 + fVar134 * fVar274;
        auVar142._12_4_ =
             fVar173 * fVar229 + fVar251 * fVar172 + fVar286 * fVar209 + fVar135 * fVar275;
        auVar142._16_4_ =
             fVar157 * fVar231 + fVar253 * fVar156 + fVar280 * fVar233 + fVar153 * fVar276;
        auVar142._20_4_ =
             fVar169 * fVar193 + fVar192 * fVar168 + fVar284 * fVar258 + fVar155 * fVar277;
        auVar142._24_4_ =
             fVar171 * fVar289 + fVar257 * fVar170 + fVar285 * fVar194 + fVar134 * fVar278;
        auVar142._28_4_ =
             fVar154 + fVar242 + *(float *)(bspline_basis1 + lVar110 + 0x1c) +
                       fVar242 + *(float *)(bspline_basis1 + lVar110 + 0x4a0);
        auVar237._0_4_ =
             fVar271 * fVar262 + fVar305 * fVar243 + fVar250 * fVar255 + fVar195 * fVar190;
        auVar237._4_4_ =
             fVar273 * fVar272 + fVar307 * fVar191 + fVar252 * fVar174 + fVar207 * fVar222;
        auVar237._8_4_ =
             fVar302 * fVar274 + fVar308 * fVar256 + fVar254 * fVar133 + fVar208 * fVar227;
        auVar237._12_4_ =
             fVar304 * fVar275 + fVar309 * fVar251 + fVar261 * fVar209 + fVar242 * fVar229;
        auVar237._16_4_ =
             fVar271 * fVar276 + fVar305 * fVar253 + fVar250 * fVar233 + fVar195 * fVar231;
        auVar237._20_4_ =
             fVar273 * fVar277 + fVar307 * fVar192 + fVar252 * fVar258 + fVar207 * fVar193;
        auVar237._24_4_ =
             fVar302 * fVar278 + fVar308 * fVar257 + fVar254 * fVar194 + fVar208 * fVar289;
        auVar237._28_4_ = fVar259 + *(float *)(bspline_basis0 + lVar110 + 0x122c);
        fVar190 = *(float *)(bspline_basis1 + lVar110 + 0x1b18);
        fVar222 = *(float *)(bspline_basis1 + lVar110 + 0x1b1c);
        fVar227 = *(float *)(bspline_basis1 + lVar110 + 0x1b20);
        fVar229 = *(float *)(bspline_basis1 + lVar110 + 0x1b24);
        fVar231 = *(float *)(bspline_basis1 + lVar110 + 0x1b28);
        fVar193 = *(float *)(bspline_basis1 + lVar110 + 0x1b2c);
        fVar289 = *(float *)(bspline_basis1 + lVar110 + 0x1b30);
        fVar262 = *(float *)(bspline_basis1 + lVar110 + 0x1f9c);
        fVar272 = *(float *)(bspline_basis1 + lVar110 + 0x1fa0);
        fVar274 = *(float *)(bspline_basis1 + lVar110 + 0x1fa4);
        fVar275 = *(float *)(bspline_basis1 + lVar110 + 0x1fa8);
        fVar276 = *(float *)(bspline_basis1 + lVar110 + 0x1fac);
        fVar277 = *(float *)(bspline_basis1 + lVar110 + 0x1fb0);
        fVar278 = *(float *)(bspline_basis1 + lVar110 + 0x1fb4);
        fVar243 = *(float *)(bspline_basis1 + lVar110 + 0x1694);
        fVar191 = *(float *)(bspline_basis1 + lVar110 + 0x1698);
        fVar256 = *(float *)(bspline_basis1 + lVar110 + 0x169c);
        fVar251 = *(float *)(bspline_basis1 + lVar110 + 0x16a0);
        fVar253 = *(float *)(bspline_basis1 + lVar110 + 0x16a4);
        fVar192 = *(float *)(bspline_basis1 + lVar110 + 0x16a8);
        fVar257 = *(float *)(bspline_basis1 + lVar110 + 0x16ac);
        fVar255 = *(float *)(bspline_basis1 + lVar110 + 0x1210);
        fVar174 = *(float *)(bspline_basis1 + lVar110 + 0x1214);
        fVar133 = *(float *)(bspline_basis1 + lVar110 + 0x1218);
        fVar209 = *(float *)(bspline_basis1 + lVar110 + 0x121c);
        fVar233 = *(float *)(bspline_basis1 + lVar110 + 0x1220);
        fVar258 = *(float *)(bspline_basis1 + lVar110 + 0x1224);
        fVar194 = *(float *)(bspline_basis1 + lVar110 + 0x1228);
        auVar246._0_4_ =
             fVar223 * fVar255 + fVar310 * fVar243 + fVar137 * fVar190 + fVar279 * fVar262;
        auVar246._4_4_ =
             fVar228 * fVar174 + fVar313 * fVar191 + fVar147 * fVar222 + fVar300 * fVar272;
        auVar246._8_4_ =
             fVar230 * fVar133 + fVar314 * fVar256 + fVar149 * fVar227 + fVar301 * fVar274;
        auVar246._12_4_ =
             fVar232 * fVar209 + fVar315 * fVar251 + fVar260 * fVar229 + fVar303 * fVar275;
        auVar246._16_4_ =
             fVar223 * fVar233 + fVar310 * fVar253 + fVar137 * fVar231 + fVar279 * fVar276;
        auVar246._20_4_ =
             fVar228 * fVar258 + fVar313 * fVar192 + fVar147 * fVar193 + fVar300 * fVar277;
        auVar246._24_4_ =
             fVar230 * fVar194 + fVar314 * fVar257 + fVar149 * fVar289 + fVar301 * fVar278;
        auVar246._28_4_ = fVar260 + fVar260 + fVar242 + fVar259;
        auVar265._0_4_ =
             fVar157 * fVar255 + fVar153 * fVar243 + fVar190 * fVar156 + fVar280 * fVar262;
        auVar265._4_4_ =
             fVar169 * fVar174 + fVar155 * fVar191 + fVar222 * fVar168 + fVar284 * fVar272;
        auVar265._8_4_ =
             fVar171 * fVar133 + fVar134 * fVar256 + fVar227 * fVar170 + fVar285 * fVar274;
        auVar265._12_4_ =
             fVar173 * fVar209 + fVar135 * fVar251 + fVar229 * fVar172 + fVar286 * fVar275;
        auVar265._16_4_ =
             fVar157 * fVar233 + fVar153 * fVar253 + fVar231 * fVar156 + fVar280 * fVar276;
        auVar265._20_4_ =
             fVar169 * fVar258 + fVar155 * fVar192 + fVar193 * fVar168 + fVar284 * fVar277;
        auVar265._24_4_ =
             fVar171 * fVar194 + fVar134 * fVar257 + fVar289 * fVar170 + fVar285 * fVar278;
        auVar265._28_4_ = fVar260 + fVar260 + fVar260 + fVar242;
        auVar166._0_4_ =
             fVar195 * fVar255 + fVar271 * fVar243 + fVar305 * fVar190 + fVar262 * fVar250;
        auVar166._4_4_ =
             fVar207 * fVar174 + fVar273 * fVar191 + fVar307 * fVar222 + fVar272 * fVar252;
        auVar166._8_4_ =
             fVar208 * fVar133 + fVar302 * fVar256 + fVar308 * fVar227 + fVar274 * fVar254;
        auVar166._12_4_ =
             fVar242 * fVar209 + fVar304 * fVar251 + fVar309 * fVar229 + fVar275 * fVar261;
        auVar166._16_4_ =
             fVar195 * fVar233 + fVar271 * fVar253 + fVar305 * fVar231 + fVar276 * fVar250;
        auVar166._20_4_ =
             fVar207 * fVar258 + fVar273 * fVar192 + fVar307 * fVar193 + fVar277 * fVar252;
        auVar166._24_4_ =
             fVar208 * fVar194 + fVar302 * fVar257 + fVar308 * fVar289 + fVar278 * fVar254;
        auVar166._28_4_ =
             *(float *)(bspline_basis1 + lVar110 + 0x122c) +
             *(float *)(bspline_basis1 + lVar110 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar110 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar110 + 0x1fb8);
        auVar202._8_4_ = 0x7fffffff;
        auVar202._0_8_ = 0x7fffffff7fffffff;
        auVar202._12_4_ = 0x7fffffff;
        auVar202._16_4_ = 0x7fffffff;
        auVar202._20_4_ = 0x7fffffff;
        auVar202._24_4_ = 0x7fffffff;
        auVar202._28_4_ = 0x7fffffff;
        auVar20 = vandps_avx(_local_5a0,auVar202);
        auVar27 = vandps_avx(auVar142,auVar202);
        auVar27 = vmaxps_avx(auVar20,auVar27);
        auVar20 = vandps_avx(auVar237,auVar202);
        auVar20 = vmaxps_avx(auVar27,auVar20);
        auVar214 = vpermilps_avx(auVar214,0);
        auVar238._16_16_ = auVar214;
        auVar238._0_16_ = auVar214;
        auVar20 = vcmpps_avx(auVar20,auVar238,1);
        auVar13 = vblendvps_avx(_local_5a0,local_380,auVar20);
        auVar15 = vblendvps_avx(auVar142,auVar19,auVar20);
        auVar20 = vandps_avx(auVar246,auVar202);
        auVar27 = vandps_avx(auVar265,auVar202);
        auVar183 = vmaxps_avx(auVar20,auVar27);
        auVar20 = vandps_avx(auVar166,auVar202);
        auVar20 = vmaxps_avx(auVar183,auVar20);
        auVar183 = vcmpps_avx(auVar20,auVar238,1);
        auVar20 = vblendvps_avx(auVar246,local_380,auVar183);
        auVar19 = vblendvps_avx(auVar265,auVar19,auVar183);
        fVar259 = auVar13._0_4_;
        fVar136 = auVar13._4_4_;
        fVar138 = auVar13._8_4_;
        fVar148 = auVar13._12_4_;
        fVar150 = auVar13._16_4_;
        fVar151 = auVar13._20_4_;
        fVar152 = auVar13._24_4_;
        fVar153 = auVar20._0_4_;
        fVar155 = auVar20._4_4_;
        fVar134 = auVar20._8_4_;
        fVar135 = auVar20._12_4_;
        fVar137 = auVar20._16_4_;
        fVar147 = auVar20._20_4_;
        fVar149 = auVar20._24_4_;
        fVar260 = -auVar20._28_4_;
        fVar190 = auVar15._0_4_;
        fVar231 = auVar15._4_4_;
        fVar272 = auVar15._8_4_;
        fVar277 = auVar15._12_4_;
        fVar256 = auVar15._16_4_;
        fVar257 = auVar15._20_4_;
        fVar209 = auVar15._24_4_;
        auVar125._0_4_ = fVar190 * fVar190 + fVar259 * fVar259;
        auVar125._4_4_ = fVar231 * fVar231 + fVar136 * fVar136;
        auVar125._8_4_ = fVar272 * fVar272 + fVar138 * fVar138;
        auVar125._12_4_ = fVar277 * fVar277 + fVar148 * fVar148;
        auVar125._16_4_ = fVar256 * fVar256 + fVar150 * fVar150;
        auVar125._20_4_ = fVar257 * fVar257 + fVar151 * fVar151;
        auVar125._24_4_ = fVar209 * fVar209 + fVar152 * fVar152;
        auVar125._28_4_ = auVar265._28_4_ + auVar13._28_4_;
        auVar13 = vrsqrtps_avx(auVar125);
        fVar222 = auVar13._0_4_;
        fVar227 = auVar13._4_4_;
        auVar22._4_4_ = fVar227 * 1.5;
        auVar22._0_4_ = fVar222 * 1.5;
        fVar229 = auVar13._8_4_;
        auVar22._8_4_ = fVar229 * 1.5;
        fVar193 = auVar13._12_4_;
        auVar22._12_4_ = fVar193 * 1.5;
        fVar289 = auVar13._16_4_;
        auVar22._16_4_ = fVar289 * 1.5;
        fVar262 = auVar13._20_4_;
        auVar22._20_4_ = fVar262 * 1.5;
        fVar274 = auVar13._24_4_;
        fVar154 = auVar27._28_4_;
        auVar22._24_4_ = fVar274 * 1.5;
        auVar22._28_4_ = fVar154;
        auVar23._4_4_ = fVar227 * fVar227 * fVar227 * auVar125._4_4_ * 0.5;
        auVar23._0_4_ = fVar222 * fVar222 * fVar222 * auVar125._0_4_ * 0.5;
        auVar23._8_4_ = fVar229 * fVar229 * fVar229 * auVar125._8_4_ * 0.5;
        auVar23._12_4_ = fVar193 * fVar193 * fVar193 * auVar125._12_4_ * 0.5;
        auVar23._16_4_ = fVar289 * fVar289 * fVar289 * auVar125._16_4_ * 0.5;
        auVar23._20_4_ = fVar262 * fVar262 * fVar262 * auVar125._20_4_ * 0.5;
        auVar23._24_4_ = fVar274 * fVar274 * fVar274 * auVar125._24_4_ * 0.5;
        auVar23._28_4_ = auVar125._28_4_;
        auVar27 = vsubps_avx(auVar22,auVar23);
        fVar222 = auVar27._0_4_;
        fVar193 = auVar27._4_4_;
        fVar274 = auVar27._8_4_;
        fVar278 = auVar27._12_4_;
        fVar251 = auVar27._16_4_;
        fVar255 = auVar27._20_4_;
        fVar233 = auVar27._24_4_;
        fVar227 = auVar19._0_4_;
        fVar289 = auVar19._4_4_;
        fVar275 = auVar19._8_4_;
        fVar243 = auVar19._12_4_;
        fVar253 = auVar19._16_4_;
        fVar174 = auVar19._20_4_;
        fVar258 = auVar19._24_4_;
        auVar126._0_4_ = fVar227 * fVar227 + fVar153 * fVar153;
        auVar126._4_4_ = fVar289 * fVar289 + fVar155 * fVar155;
        auVar126._8_4_ = fVar275 * fVar275 + fVar134 * fVar134;
        auVar126._12_4_ = fVar243 * fVar243 + fVar135 * fVar135;
        auVar126._16_4_ = fVar253 * fVar253 + fVar137 * fVar137;
        auVar126._20_4_ = fVar174 * fVar174 + fVar147 * fVar147;
        auVar126._24_4_ = fVar258 * fVar258 + fVar149 * fVar149;
        auVar126._28_4_ = auVar20._28_4_ + auVar27._28_4_;
        auVar20 = vrsqrtps_avx(auVar126);
        fVar229 = auVar20._0_4_;
        fVar262 = auVar20._4_4_;
        auVar25._4_4_ = fVar262 * 1.5;
        auVar25._0_4_ = fVar229 * 1.5;
        fVar276 = auVar20._8_4_;
        auVar25._8_4_ = fVar276 * 1.5;
        fVar191 = auVar20._12_4_;
        auVar25._12_4_ = fVar191 * 1.5;
        fVar192 = auVar20._16_4_;
        auVar25._16_4_ = fVar192 * 1.5;
        fVar133 = auVar20._20_4_;
        auVar25._20_4_ = fVar133 * 1.5;
        fVar194 = auVar20._24_4_;
        auVar25._24_4_ = fVar194 * 1.5;
        auVar25._28_4_ = fVar154;
        auVar26._4_4_ = fVar262 * fVar262 * fVar262 * auVar126._4_4_ * 0.5;
        auVar26._0_4_ = fVar229 * fVar229 * fVar229 * auVar126._0_4_ * 0.5;
        auVar26._8_4_ = fVar276 * fVar276 * fVar276 * auVar126._8_4_ * 0.5;
        auVar26._12_4_ = fVar191 * fVar191 * fVar191 * auVar126._12_4_ * 0.5;
        auVar26._16_4_ = fVar192 * fVar192 * fVar192 * auVar126._16_4_ * 0.5;
        auVar26._20_4_ = fVar133 * fVar133 * fVar133 * auVar126._20_4_ * 0.5;
        auVar26._24_4_ = fVar194 * fVar194 * fVar194 * auVar126._24_4_ * 0.5;
        auVar26._28_4_ = auVar126._28_4_;
        auVar20 = vsubps_avx(auVar25,auVar26);
        fVar229 = auVar20._0_4_;
        fVar262 = auVar20._4_4_;
        fVar276 = auVar20._8_4_;
        fVar191 = auVar20._12_4_;
        fVar192 = auVar20._16_4_;
        fVar133 = auVar20._20_4_;
        fVar194 = auVar20._24_4_;
        fVar190 = fVar119 * fVar190 * fVar222;
        fVar231 = fVar132 * fVar231 * fVar193;
        auVar21._4_4_ = fVar231;
        auVar21._0_4_ = fVar190;
        fVar272 = fStack_798 * fVar272 * fVar274;
        auVar21._8_4_ = fVar272;
        fVar277 = fStack_794 * fVar277 * fVar278;
        auVar21._12_4_ = fVar277;
        fVar256 = fStack_790 * fVar256 * fVar251;
        auVar21._16_4_ = fVar256;
        fVar257 = fStack_78c * fVar257 * fVar255;
        auVar21._20_4_ = fVar257;
        fVar209 = fStack_788 * fVar209 * fVar233;
        auVar21._24_4_ = fVar209;
        auVar21._28_4_ = fVar260;
        local_5a0._4_4_ = fVar231 + auVar287._4_4_;
        local_5a0._0_4_ = fVar190 + auVar287._0_4_;
        fStack_598 = fVar272 + auVar287._8_4_;
        fStack_594 = fVar277 + auVar287._12_4_;
        fStack_590 = fVar256 + auVar287._16_4_;
        fStack_58c = fVar257 + auVar287._20_4_;
        fStack_588 = fVar209 + auVar287._24_4_;
        fStack_584 = fVar260 + auVar287._28_4_;
        fVar190 = fVar119 * fVar222 * -fVar259;
        fVar231 = fVar132 * fVar193 * -fVar136;
        auVar28._4_4_ = fVar231;
        auVar28._0_4_ = fVar190;
        fVar272 = fStack_798 * fVar274 * -fVar138;
        auVar28._8_4_ = fVar272;
        fVar277 = fStack_794 * fVar278 * -fVar148;
        auVar28._12_4_ = fVar277;
        fVar256 = fStack_790 * fVar251 * -fVar150;
        auVar28._16_4_ = fVar256;
        fVar257 = fStack_78c * fVar255 * -fVar151;
        auVar28._20_4_ = fVar257;
        fVar209 = fStack_788 * fVar233 * -fVar152;
        auVar28._24_4_ = fVar209;
        auVar28._28_4_ = fVar154;
        local_520._4_4_ = fVar231 + auVar291._4_4_;
        local_520._0_4_ = fVar190 + auVar291._0_4_;
        fStack_518 = fVar272 + auVar291._8_4_;
        fStack_514 = fVar277 + auVar291._12_4_;
        fStack_510 = fVar256 + auVar291._16_4_;
        fStack_50c = fVar257 + auVar291._20_4_;
        fStack_508 = fVar209 + auVar291._24_4_;
        fStack_504 = fVar154 + auVar291._28_4_;
        fVar190 = fVar222 * 0.0 * fVar119;
        fVar222 = fVar193 * 0.0 * fVar132;
        auVar29._4_4_ = fVar222;
        auVar29._0_4_ = fVar190;
        fVar231 = fVar274 * 0.0 * fStack_798;
        auVar29._8_4_ = fVar231;
        fVar193 = fVar278 * 0.0 * fStack_794;
        auVar29._12_4_ = fVar193;
        fVar272 = fVar251 * 0.0 * fStack_790;
        auVar29._16_4_ = fVar272;
        fVar274 = fVar255 * 0.0 * fStack_78c;
        auVar29._20_4_ = fVar274;
        fVar277 = fVar233 * 0.0 * fStack_788;
        auVar29._24_4_ = fVar277;
        auVar29._28_4_ = fVar242;
        auVar101._4_4_ = fStack_49c;
        auVar101._0_4_ = local_4a0;
        auVar101._8_4_ = fStack_498;
        auVar101._12_4_ = fStack_494;
        auVar101._16_4_ = fStack_490;
        auVar101._20_4_ = fStack_48c;
        auVar101._24_4_ = fStack_488;
        auVar101._28_4_ = fStack_484;
        auVar239._0_4_ = fVar190 + local_4a0;
        auVar239._4_4_ = fVar222 + fStack_49c;
        auVar239._8_4_ = fVar231 + fStack_498;
        auVar239._12_4_ = fVar193 + fStack_494;
        auVar239._16_4_ = fVar272 + fStack_490;
        auVar239._20_4_ = fVar274 + fStack_48c;
        auVar239._24_4_ = fVar277 + fStack_488;
        auVar239._28_4_ = fVar242 + fStack_484;
        fVar190 = local_680._0_4_ * fVar227 * fVar229;
        fVar222 = local_680._4_4_ * fVar289 * fVar262;
        auVar30._4_4_ = fVar222;
        auVar30._0_4_ = fVar190;
        fVar227 = local_680._8_4_ * fVar275 * fVar276;
        auVar30._8_4_ = fVar227;
        fVar231 = local_680._12_4_ * fVar243 * fVar191;
        auVar30._12_4_ = fVar231;
        fVar193 = local_680._16_4_ * fVar253 * fVar192;
        auVar30._16_4_ = fVar193;
        fVar289 = local_680._20_4_ * fVar174 * fVar133;
        auVar30._20_4_ = fVar289;
        fVar272 = local_680._24_4_ * fVar258 * fVar194;
        auVar30._24_4_ = fVar272;
        auVar30._28_4_ = auVar19._28_4_;
        auVar183 = vsubps_avx(auVar287,auVar21);
        auVar266._0_4_ = (float)local_500._0_4_ + fVar190;
        auVar266._4_4_ = (float)local_500._4_4_ + fVar222;
        auVar266._8_4_ = fStack_4f8 + fVar227;
        auVar266._12_4_ = fStack_4f4 + fVar231;
        auVar266._16_4_ = fStack_4f0 + fVar193;
        auVar266._20_4_ = fStack_4ec + fVar289;
        auVar266._24_4_ = fStack_4e8 + fVar272;
        auVar266._28_4_ = fStack_4e4 + auVar19._28_4_;
        fVar190 = local_680._0_4_ * -fVar153 * fVar229;
        fVar222 = local_680._4_4_ * -fVar155 * fVar262;
        auVar19._4_4_ = fVar222;
        auVar19._0_4_ = fVar190;
        fVar227 = local_680._8_4_ * -fVar134 * fVar276;
        auVar19._8_4_ = fVar227;
        fVar231 = local_680._12_4_ * -fVar135 * fVar191;
        auVar19._12_4_ = fVar231;
        fVar193 = local_680._16_4_ * -fVar137 * fVar192;
        auVar19._16_4_ = fVar193;
        fVar289 = local_680._20_4_ * -fVar147 * fVar133;
        auVar19._20_4_ = fVar289;
        fVar272 = local_680._24_4_ * -fVar149 * fVar194;
        auVar19._24_4_ = fVar272;
        auVar19._28_4_ = fVar304;
        auVar287 = vsubps_avx(auVar291,auVar28);
        auVar281._0_4_ = fVar190 + (float)local_480._0_4_;
        auVar281._4_4_ = fVar222 + (float)local_480._4_4_;
        auVar281._8_4_ = fVar227 + fStack_478;
        auVar281._12_4_ = fVar231 + fStack_474;
        auVar281._16_4_ = fVar193 + fStack_470;
        auVar281._20_4_ = fVar289 + fStack_46c;
        auVar281._24_4_ = fVar272 + fStack_468;
        auVar281._28_4_ = fVar304 + fStack_464;
        fVar190 = fVar229 * 0.0 * local_680._0_4_;
        fVar222 = fVar262 * 0.0 * local_680._4_4_;
        auVar31._4_4_ = fVar222;
        auVar31._0_4_ = fVar190;
        fVar227 = fVar276 * 0.0 * local_680._8_4_;
        auVar31._8_4_ = fVar227;
        fVar229 = fVar191 * 0.0 * local_680._12_4_;
        auVar31._12_4_ = fVar229;
        fVar231 = fVar192 * 0.0 * local_680._16_4_;
        auVar31._16_4_ = fVar231;
        fVar193 = fVar133 * 0.0 * local_680._20_4_;
        auVar31._20_4_ = fVar193;
        fVar289 = fVar194 * 0.0 * local_680._24_4_;
        auVar31._24_4_ = fVar289;
        auVar31._28_4_ = fVar309;
        auVar22 = vsubps_avx(auVar101,auVar29);
        auVar311._0_4_ = fVar190 + (float)local_4c0._0_4_;
        auVar311._4_4_ = fVar222 + (float)local_4c0._4_4_;
        auVar311._8_4_ = fVar227 + fStack_4b8;
        auVar311._12_4_ = fVar229 + fStack_4b4;
        auVar311._16_4_ = fVar231 + fStack_4b0;
        auVar311._20_4_ = fVar193 + fStack_4ac;
        auVar311._24_4_ = fVar289 + fStack_4a8;
        auVar311._28_4_ = fVar309 + fStack_4a4;
        auVar20 = vsubps_avx(_local_500,auVar30);
        auVar19 = vsubps_avx(_local_480,auVar19);
        auVar27 = vsubps_avx(_local_4c0,auVar31);
        auVar13 = vsubps_avx(auVar281,auVar287);
        auVar15 = vsubps_avx(auVar311,auVar22);
        auVar32._4_4_ = auVar22._4_4_ * auVar13._4_4_;
        auVar32._0_4_ = auVar22._0_4_ * auVar13._0_4_;
        auVar32._8_4_ = auVar22._8_4_ * auVar13._8_4_;
        auVar32._12_4_ = auVar22._12_4_ * auVar13._12_4_;
        auVar32._16_4_ = auVar22._16_4_ * auVar13._16_4_;
        auVar32._20_4_ = auVar22._20_4_ * auVar13._20_4_;
        auVar32._24_4_ = auVar22._24_4_ * auVar13._24_4_;
        auVar32._28_4_ = fVar309;
        auVar33._4_4_ = auVar287._4_4_ * auVar15._4_4_;
        auVar33._0_4_ = auVar287._0_4_ * auVar15._0_4_;
        auVar33._8_4_ = auVar287._8_4_ * auVar15._8_4_;
        auVar33._12_4_ = auVar287._12_4_ * auVar15._12_4_;
        auVar33._16_4_ = auVar287._16_4_ * auVar15._16_4_;
        auVar33._20_4_ = auVar287._20_4_ * auVar15._20_4_;
        auVar33._24_4_ = auVar287._24_4_ * auVar15._24_4_;
        auVar33._28_4_ = fStack_464;
        auVar291 = vsubps_avx(auVar33,auVar32);
        auVar34._4_4_ = auVar183._4_4_ * auVar15._4_4_;
        auVar34._0_4_ = auVar183._0_4_ * auVar15._0_4_;
        auVar34._8_4_ = auVar183._8_4_ * auVar15._8_4_;
        auVar34._12_4_ = auVar183._12_4_ * auVar15._12_4_;
        auVar34._16_4_ = auVar183._16_4_ * auVar15._16_4_;
        auVar34._20_4_ = auVar183._20_4_ * auVar15._20_4_;
        auVar34._24_4_ = auVar183._24_4_ * auVar15._24_4_;
        auVar34._28_4_ = auVar15._28_4_;
        auVar23 = vsubps_avx(auVar266,auVar183);
        auVar35._4_4_ = auVar22._4_4_ * auVar23._4_4_;
        auVar35._0_4_ = auVar22._0_4_ * auVar23._0_4_;
        auVar35._8_4_ = auVar22._8_4_ * auVar23._8_4_;
        auVar35._12_4_ = auVar22._12_4_ * auVar23._12_4_;
        auVar35._16_4_ = auVar22._16_4_ * auVar23._16_4_;
        auVar35._20_4_ = auVar22._20_4_ * auVar23._20_4_;
        auVar35._24_4_ = auVar22._24_4_ * auVar23._24_4_;
        auVar35._28_4_ = fStack_4e4;
        auVar25 = vsubps_avx(auVar35,auVar34);
        auVar36._4_4_ = auVar23._4_4_ * auVar287._4_4_;
        auVar36._0_4_ = auVar23._0_4_ * auVar287._0_4_;
        auVar36._8_4_ = auVar23._8_4_ * auVar287._8_4_;
        auVar36._12_4_ = auVar23._12_4_ * auVar287._12_4_;
        auVar36._16_4_ = auVar23._16_4_ * auVar287._16_4_;
        auVar36._20_4_ = auVar23._20_4_ * auVar287._20_4_;
        auVar36._24_4_ = auVar23._24_4_ * auVar287._24_4_;
        auVar36._28_4_ = auVar15._28_4_;
        auVar37._4_4_ = auVar183._4_4_ * auVar13._4_4_;
        auVar37._0_4_ = auVar183._0_4_ * auVar13._0_4_;
        auVar37._8_4_ = auVar183._8_4_ * auVar13._8_4_;
        auVar37._12_4_ = auVar183._12_4_ * auVar13._12_4_;
        auVar37._16_4_ = auVar183._16_4_ * auVar13._16_4_;
        auVar37._20_4_ = auVar183._20_4_ * auVar13._20_4_;
        auVar37._24_4_ = auVar183._24_4_ * auVar13._24_4_;
        auVar37._28_4_ = auVar13._28_4_;
        auVar13 = vsubps_avx(auVar37,auVar36);
        auVar127._0_4_ = auVar291._0_4_ * 0.0 + auVar13._0_4_ + auVar25._0_4_ * 0.0;
        auVar127._4_4_ = auVar291._4_4_ * 0.0 + auVar13._4_4_ + auVar25._4_4_ * 0.0;
        auVar127._8_4_ = auVar291._8_4_ * 0.0 + auVar13._8_4_ + auVar25._8_4_ * 0.0;
        auVar127._12_4_ = auVar291._12_4_ * 0.0 + auVar13._12_4_ + auVar25._12_4_ * 0.0;
        auVar127._16_4_ = auVar291._16_4_ * 0.0 + auVar13._16_4_ + auVar25._16_4_ * 0.0;
        auVar127._20_4_ = auVar291._20_4_ * 0.0 + auVar13._20_4_ + auVar25._20_4_ * 0.0;
        auVar127._24_4_ = auVar291._24_4_ * 0.0 + auVar13._24_4_ + auVar25._24_4_ * 0.0;
        auVar127._28_4_ = auVar13._28_4_ + auVar13._28_4_ + auVar25._28_4_;
        auVar291 = vcmpps_avx(auVar127,ZEXT432(0) << 0x20,2);
        auVar20 = vblendvps_avx(auVar20,_local_5a0,auVar291);
        local_460 = vblendvps_avx(auVar19,_local_520,auVar291);
        auVar19 = vblendvps_avx(auVar27,auVar239,auVar291);
        auVar27 = vblendvps_avx(auVar183,auVar266,auVar291);
        auVar13 = vblendvps_avx(auVar287,auVar281,auVar291);
        auVar15 = vblendvps_avx(auVar22,auVar311,auVar291);
        auVar183 = vblendvps_avx(auVar266,auVar183,auVar291);
        auVar287 = vblendvps_avx(auVar281,auVar287,auVar291);
        local_740 = vpackssdw_avx(auVar14._0_16_,auVar14._16_16_);
        auStack_730 = auVar14._16_16_;
        auVar14 = vblendvps_avx(auVar311,auVar22,auVar291);
        auVar183 = vsubps_avx(auVar183,auVar20);
        auVar23 = vsubps_avx(auVar287,local_460);
        auVar25 = vsubps_avx(auVar14,auVar19);
        auVar14 = vsubps_avx(local_460,auVar13);
        fVar190 = auVar23._0_4_;
        fVar152 = auVar19._0_4_;
        fVar193 = auVar23._4_4_;
        fVar153 = auVar19._4_4_;
        auVar38._4_4_ = fVar153 * fVar193;
        auVar38._0_4_ = fVar152 * fVar190;
        fVar275 = auVar23._8_4_;
        fVar155 = auVar19._8_4_;
        auVar38._8_4_ = fVar155 * fVar275;
        fVar191 = auVar23._12_4_;
        fVar134 = auVar19._12_4_;
        auVar38._12_4_ = fVar134 * fVar191;
        fVar257 = auVar23._16_4_;
        fVar135 = auVar19._16_4_;
        auVar38._16_4_ = fVar135 * fVar257;
        fVar233 = auVar23._20_4_;
        fVar137 = auVar19._20_4_;
        auVar38._20_4_ = fVar137 * fVar233;
        fVar136 = auVar23._24_4_;
        fVar147 = auVar19._24_4_;
        auVar38._24_4_ = fVar147 * fVar136;
        auVar38._28_4_ = auVar287._28_4_;
        fVar222 = local_460._0_4_;
        fVar207 = auVar25._0_4_;
        fVar289 = local_460._4_4_;
        fVar208 = auVar25._4_4_;
        auVar39._4_4_ = fVar208 * fVar289;
        auVar39._0_4_ = fVar207 * fVar222;
        fVar276 = local_460._8_4_;
        fVar223 = auVar25._8_4_;
        auVar39._8_4_ = fVar223 * fVar276;
        fVar256 = local_460._12_4_;
        fVar228 = auVar25._12_4_;
        auVar39._12_4_ = fVar228 * fVar256;
        fVar255 = local_460._16_4_;
        fVar230 = auVar25._16_4_;
        auVar39._16_4_ = fVar230 * fVar255;
        fVar258 = local_460._20_4_;
        fVar232 = auVar25._20_4_;
        auVar39._20_4_ = fVar232 * fVar258;
        fVar138 = local_460._24_4_;
        fVar242 = auVar25._24_4_;
        uVar8 = auVar22._28_4_;
        auVar39._24_4_ = fVar242 * fVar138;
        auVar39._28_4_ = uVar8;
        auVar287 = vsubps_avx(auVar39,auVar38);
        fVar227 = auVar20._0_4_;
        fVar262 = auVar20._4_4_;
        auVar40._4_4_ = fVar208 * fVar262;
        auVar40._0_4_ = fVar207 * fVar227;
        fVar277 = auVar20._8_4_;
        auVar40._8_4_ = fVar223 * fVar277;
        fVar251 = auVar20._12_4_;
        auVar40._12_4_ = fVar228 * fVar251;
        fVar174 = auVar20._16_4_;
        auVar40._16_4_ = fVar230 * fVar174;
        fVar194 = auVar20._20_4_;
        auVar40._20_4_ = fVar232 * fVar194;
        fVar148 = auVar20._24_4_;
        auVar40._24_4_ = fVar242 * fVar148;
        auVar40._28_4_ = uVar8;
        fVar229 = auVar183._0_4_;
        auVar306._0_4_ = fVar152 * fVar229;
        fVar272 = auVar183._4_4_;
        auVar306._4_4_ = fVar153 * fVar272;
        fVar278 = auVar183._8_4_;
        auVar306._8_4_ = fVar155 * fVar278;
        fVar253 = auVar183._12_4_;
        auVar306._12_4_ = fVar134 * fVar253;
        fVar133 = auVar183._16_4_;
        auVar306._16_4_ = fVar135 * fVar133;
        fVar154 = auVar183._20_4_;
        auVar306._20_4_ = fVar137 * fVar154;
        fVar150 = auVar183._24_4_;
        auVar306._24_4_ = fVar147 * fVar150;
        auVar306._28_4_ = 0;
        auVar22 = vsubps_avx(auVar306,auVar40);
        auVar41._4_4_ = fVar289 * fVar272;
        auVar41._0_4_ = fVar222 * fVar229;
        auVar41._8_4_ = fVar276 * fVar278;
        auVar41._12_4_ = fVar256 * fVar253;
        auVar41._16_4_ = fVar255 * fVar133;
        auVar41._20_4_ = fVar258 * fVar154;
        auVar41._24_4_ = fVar138 * fVar150;
        auVar41._28_4_ = uVar8;
        auVar42._4_4_ = fVar262 * fVar193;
        auVar42._0_4_ = fVar227 * fVar190;
        auVar42._8_4_ = fVar277 * fVar275;
        auVar42._12_4_ = fVar251 * fVar191;
        auVar42._16_4_ = fVar174 * fVar257;
        auVar42._20_4_ = fVar194 * fVar233;
        auVar42._24_4_ = fVar148 * fVar136;
        auVar42._28_4_ = auVar311._28_4_;
        auVar26 = vsubps_avx(auVar42,auVar41);
        auVar21 = vsubps_avx(auVar19,auVar15);
        fVar231 = auVar26._28_4_ + auVar22._28_4_;
        auVar240._0_4_ = auVar26._0_4_ + auVar22._0_4_ * 0.0 + auVar287._0_4_ * 0.0;
        auVar240._4_4_ = auVar26._4_4_ + auVar22._4_4_ * 0.0 + auVar287._4_4_ * 0.0;
        auVar240._8_4_ = auVar26._8_4_ + auVar22._8_4_ * 0.0 + auVar287._8_4_ * 0.0;
        auVar240._12_4_ = auVar26._12_4_ + auVar22._12_4_ * 0.0 + auVar287._12_4_ * 0.0;
        auVar240._16_4_ = auVar26._16_4_ + auVar22._16_4_ * 0.0 + auVar287._16_4_ * 0.0;
        auVar240._20_4_ = auVar26._20_4_ + auVar22._20_4_ * 0.0 + auVar287._20_4_ * 0.0;
        auVar240._24_4_ = auVar26._24_4_ + auVar22._24_4_ * 0.0 + auVar287._24_4_ * 0.0;
        auVar240._28_4_ = fVar231 + auVar287._28_4_;
        fVar149 = auVar14._0_4_;
        fVar260 = auVar14._4_4_;
        auVar43._4_4_ = fVar260 * auVar15._4_4_;
        auVar43._0_4_ = fVar149 * auVar15._0_4_;
        fVar157 = auVar14._8_4_;
        auVar43._8_4_ = fVar157 * auVar15._8_4_;
        fVar169 = auVar14._12_4_;
        auVar43._12_4_ = fVar169 * auVar15._12_4_;
        fVar171 = auVar14._16_4_;
        auVar43._16_4_ = fVar171 * auVar15._16_4_;
        fVar173 = auVar14._20_4_;
        auVar43._20_4_ = fVar173 * auVar15._20_4_;
        fVar195 = auVar14._24_4_;
        auVar43._24_4_ = fVar195 * auVar15._24_4_;
        auVar43._28_4_ = fVar231;
        fVar231 = auVar21._0_4_;
        fVar274 = auVar21._4_4_;
        auVar44._4_4_ = auVar13._4_4_ * fVar274;
        auVar44._0_4_ = auVar13._0_4_ * fVar231;
        fVar243 = auVar21._8_4_;
        auVar44._8_4_ = auVar13._8_4_ * fVar243;
        fVar192 = auVar21._12_4_;
        auVar44._12_4_ = auVar13._12_4_ * fVar192;
        fVar209 = auVar21._16_4_;
        auVar44._16_4_ = auVar13._16_4_ * fVar209;
        fVar259 = auVar21._20_4_;
        auVar44._20_4_ = auVar13._20_4_ * fVar259;
        fVar151 = auVar21._24_4_;
        auVar44._24_4_ = auVar13._24_4_ * fVar151;
        auVar44._28_4_ = auVar26._28_4_;
        auVar14 = vsubps_avx(auVar44,auVar43);
        auVar22 = vsubps_avx(auVar20,auVar27);
        fVar250 = auVar22._0_4_;
        fVar252 = auVar22._4_4_;
        auVar45._4_4_ = fVar252 * auVar15._4_4_;
        auVar45._0_4_ = fVar250 * auVar15._0_4_;
        fVar254 = auVar22._8_4_;
        auVar45._8_4_ = fVar254 * auVar15._8_4_;
        fVar261 = auVar22._12_4_;
        auVar45._12_4_ = fVar261 * auVar15._12_4_;
        fVar271 = auVar22._16_4_;
        auVar45._16_4_ = fVar271 * auVar15._16_4_;
        fVar273 = auVar22._20_4_;
        auVar45._20_4_ = fVar273 * auVar15._20_4_;
        fVar279 = auVar22._24_4_;
        auVar45._24_4_ = fVar279 * auVar15._24_4_;
        auVar45._28_4_ = auVar15._28_4_;
        auVar46._4_4_ = auVar27._4_4_ * fVar274;
        auVar46._0_4_ = auVar27._0_4_ * fVar231;
        auVar46._8_4_ = auVar27._8_4_ * fVar243;
        auVar46._12_4_ = auVar27._12_4_ * fVar192;
        auVar46._16_4_ = auVar27._16_4_ * fVar209;
        auVar46._20_4_ = auVar27._20_4_ * fVar259;
        auVar46._24_4_ = auVar27._24_4_ * fVar151;
        auVar46._28_4_ = auVar287._28_4_;
        auVar287 = vsubps_avx(auVar45,auVar46);
        auVar47._4_4_ = auVar13._4_4_ * fVar252;
        auVar47._0_4_ = auVar13._0_4_ * fVar250;
        auVar47._8_4_ = auVar13._8_4_ * fVar254;
        auVar47._12_4_ = auVar13._12_4_ * fVar261;
        auVar47._16_4_ = auVar13._16_4_ * fVar271;
        auVar47._20_4_ = auVar13._20_4_ * fVar273;
        auVar47._24_4_ = auVar13._24_4_ * fVar279;
        auVar47._28_4_ = auVar15._28_4_;
        auVar48._4_4_ = auVar27._4_4_ * fVar260;
        auVar48._0_4_ = auVar27._0_4_ * fVar149;
        auVar48._8_4_ = auVar27._8_4_ * fVar157;
        auVar48._12_4_ = auVar27._12_4_ * fVar169;
        auVar48._16_4_ = auVar27._16_4_ * fVar171;
        auVar48._20_4_ = auVar27._20_4_ * fVar173;
        auVar48._24_4_ = auVar27._24_4_ * fVar195;
        auVar48._28_4_ = auVar27._28_4_;
        auVar27 = vsubps_avx(auVar48,auVar47);
        auVar203._0_4_ = auVar14._0_4_ * 0.0 + auVar27._0_4_ + auVar287._0_4_ * 0.0;
        auVar203._4_4_ = auVar14._4_4_ * 0.0 + auVar27._4_4_ + auVar287._4_4_ * 0.0;
        auVar203._8_4_ = auVar14._8_4_ * 0.0 + auVar27._8_4_ + auVar287._8_4_ * 0.0;
        auVar203._12_4_ = auVar14._12_4_ * 0.0 + auVar27._12_4_ + auVar287._12_4_ * 0.0;
        auVar203._16_4_ = auVar14._16_4_ * 0.0 + auVar27._16_4_ + auVar287._16_4_ * 0.0;
        auVar203._20_4_ = auVar14._20_4_ * 0.0 + auVar27._20_4_ + auVar287._20_4_ * 0.0;
        auVar203._24_4_ = auVar14._24_4_ * 0.0 + auVar27._24_4_ + auVar287._24_4_ * 0.0;
        auVar203._28_4_ = auVar27._28_4_ + auVar27._28_4_ + auVar287._28_4_;
        auVar206 = ZEXT3264(auVar203);
        auVar14 = vmaxps_avx(auVar240,auVar203);
        auVar14 = vcmpps_avx(auVar14,ZEXT832(0) << 0x20,2);
        auVar214 = vpackssdw_avx(auVar14._0_16_,auVar14._16_16_);
        auVar214 = vpand_avx(auVar214,local_740);
        auVar164 = vpmovsxwd_avx(auVar214);
        auVar181 = vpunpckhwd_avx(auVar214,auVar214);
        auVar184._16_16_ = auVar181;
        auVar184._0_16_ = auVar164;
        if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar184 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar184 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar184 >> 0x7f,0) == '\0') &&
              (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar181 >> 0x3f,0) == '\0') &&
            (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar181[0xf]) {
LAB_00e29b85:
          auVar187 = ZEXT3264(auVar184);
          auVar217._8_8_ = uStack_4d8;
          auVar217._0_8_ = local_4e0;
          auVar217._16_8_ = uStack_4d0;
          auVar217._24_8_ = uStack_4c8;
          auVar249 = ZEXT3264(auVar245);
          auVar270 = ZEXT3264(auVar264);
          auVar245._4_4_ = fVar132;
          auVar245._0_4_ = fVar119;
          auVar245._8_4_ = fStack_798;
          auVar245._12_4_ = fStack_794;
          auVar245._16_4_ = fStack_790;
          auVar245._20_4_ = fStack_78c;
          auVar245._24_4_ = fStack_788;
          auVar245._28_4_ = fStack_784;
        }
        else {
          auVar49._4_4_ = fVar274 * fVar193;
          auVar49._0_4_ = fVar231 * fVar190;
          auVar49._8_4_ = fVar243 * fVar275;
          auVar49._12_4_ = fVar192 * fVar191;
          auVar49._16_4_ = fVar209 * fVar257;
          auVar49._20_4_ = fVar259 * fVar233;
          auVar49._24_4_ = fVar151 * fVar136;
          auVar49._28_4_ = auVar181._12_4_;
          auVar292._0_4_ = fVar149 * fVar207;
          auVar292._4_4_ = fVar260 * fVar208;
          auVar292._8_4_ = fVar157 * fVar223;
          auVar292._12_4_ = fVar169 * fVar228;
          auVar292._16_4_ = fVar171 * fVar230;
          auVar292._20_4_ = fVar173 * fVar232;
          auVar292._24_4_ = fVar195 * fVar242;
          auVar292._28_4_ = 0;
          auVar14 = vsubps_avx(auVar292,auVar49);
          auVar50._4_4_ = fVar252 * fVar208;
          auVar50._0_4_ = fVar250 * fVar207;
          auVar50._8_4_ = fVar254 * fVar223;
          auVar50._12_4_ = fVar261 * fVar228;
          auVar50._16_4_ = fVar271 * fVar230;
          auVar50._20_4_ = fVar273 * fVar232;
          auVar50._24_4_ = fVar279 * fVar242;
          auVar50._28_4_ = auVar25._28_4_;
          auVar51._4_4_ = fVar274 * fVar272;
          auVar51._0_4_ = fVar231 * fVar229;
          auVar51._8_4_ = fVar243 * fVar278;
          auVar51._12_4_ = fVar192 * fVar253;
          auVar51._16_4_ = fVar209 * fVar133;
          auVar51._20_4_ = fVar259 * fVar154;
          auVar51._24_4_ = fVar151 * fVar150;
          auVar51._28_4_ = auVar21._28_4_;
          auVar13 = vsubps_avx(auVar51,auVar50);
          auVar52._4_4_ = fVar260 * fVar272;
          auVar52._0_4_ = fVar149 * fVar229;
          auVar52._8_4_ = fVar157 * fVar278;
          auVar52._12_4_ = fVar169 * fVar253;
          auVar52._16_4_ = fVar171 * fVar133;
          auVar52._20_4_ = fVar173 * fVar154;
          auVar52._24_4_ = fVar195 * fVar150;
          auVar52._28_4_ = auVar183._28_4_;
          auVar53._4_4_ = fVar252 * fVar193;
          auVar53._0_4_ = fVar250 * fVar190;
          auVar53._8_4_ = fVar254 * fVar275;
          auVar53._12_4_ = fVar261 * fVar191;
          auVar53._16_4_ = fVar271 * fVar257;
          auVar53._20_4_ = fVar273 * fVar233;
          auVar53._24_4_ = fVar279 * fVar136;
          auVar53._28_4_ = auVar240._28_4_;
          auVar15 = vsubps_avx(auVar53,auVar52);
          auVar241._0_4_ = auVar14._0_4_ * 0.0 + auVar15._0_4_ + auVar13._0_4_ * 0.0;
          auVar241._4_4_ = auVar14._4_4_ * 0.0 + auVar15._4_4_ + auVar13._4_4_ * 0.0;
          auVar241._8_4_ = auVar14._8_4_ * 0.0 + auVar15._8_4_ + auVar13._8_4_ * 0.0;
          auVar241._12_4_ = auVar14._12_4_ * 0.0 + auVar15._12_4_ + auVar13._12_4_ * 0.0;
          auVar241._16_4_ = auVar14._16_4_ * 0.0 + auVar15._16_4_ + auVar13._16_4_ * 0.0;
          auVar241._20_4_ = auVar14._20_4_ * 0.0 + auVar15._20_4_ + auVar13._20_4_ * 0.0;
          auVar241._24_4_ = auVar14._24_4_ * 0.0 + auVar15._24_4_ + auVar13._24_4_ * 0.0;
          auVar241._28_4_ = auVar240._28_4_ + auVar15._28_4_ + auVar183._28_4_;
          auVar27 = vrcpps_avx(auVar241);
          fVar229 = auVar27._0_4_;
          fVar231 = auVar27._4_4_;
          auVar54._4_4_ = auVar241._4_4_ * fVar231;
          auVar54._0_4_ = auVar241._0_4_ * fVar229;
          fVar193 = auVar27._8_4_;
          auVar54._8_4_ = auVar241._8_4_ * fVar193;
          fVar272 = auVar27._12_4_;
          auVar54._12_4_ = auVar241._12_4_ * fVar272;
          fVar274 = auVar27._16_4_;
          auVar54._16_4_ = auVar241._16_4_ * fVar274;
          fVar275 = auVar27._20_4_;
          auVar54._20_4_ = auVar241._20_4_ * fVar275;
          fVar278 = auVar27._24_4_;
          auVar54._24_4_ = auVar241._24_4_ * fVar278;
          auVar54._28_4_ = auVar21._28_4_;
          auVar293._8_4_ = 0x3f800000;
          auVar293._0_8_ = 0x3f8000003f800000;
          auVar293._12_4_ = 0x3f800000;
          auVar293._16_4_ = 0x3f800000;
          auVar293._20_4_ = 0x3f800000;
          auVar293._24_4_ = 0x3f800000;
          auVar293._28_4_ = 0x3f800000;
          auVar183 = vsubps_avx(auVar293,auVar54);
          fVar229 = auVar183._0_4_ * fVar229 + fVar229;
          fVar231 = auVar183._4_4_ * fVar231 + fVar231;
          fVar193 = auVar183._8_4_ * fVar193 + fVar193;
          fVar272 = auVar183._12_4_ * fVar272 + fVar272;
          fVar274 = auVar183._16_4_ * fVar274 + fVar274;
          fVar275 = auVar183._20_4_ * fVar275 + fVar275;
          fVar278 = auVar183._24_4_ * fVar278 + fVar278;
          auVar55._4_4_ =
               (auVar14._4_4_ * fVar262 + auVar13._4_4_ * fVar289 + auVar15._4_4_ * fVar153) *
               fVar231;
          auVar55._0_4_ =
               (auVar14._0_4_ * fVar227 + auVar13._0_4_ * fVar222 + auVar15._0_4_ * fVar152) *
               fVar229;
          auVar55._8_4_ =
               (auVar14._8_4_ * fVar277 + auVar13._8_4_ * fVar276 + auVar15._8_4_ * fVar155) *
               fVar193;
          auVar55._12_4_ =
               (auVar14._12_4_ * fVar251 + auVar13._12_4_ * fVar256 + auVar15._12_4_ * fVar134) *
               fVar272;
          auVar55._16_4_ =
               (auVar14._16_4_ * fVar174 + auVar13._16_4_ * fVar255 + auVar15._16_4_ * fVar135) *
               fVar274;
          auVar55._20_4_ =
               (auVar14._20_4_ * fVar194 + auVar13._20_4_ * fVar258 + auVar15._20_4_ * fVar137) *
               fVar275;
          auVar55._24_4_ =
               (auVar14._24_4_ * fVar148 + auVar13._24_4_ * fVar138 + auVar15._24_4_ * fVar147) *
               fVar278;
          auVar55._28_4_ = auVar20._28_4_ + auVar23._28_4_ + auVar19._28_4_;
          auVar164 = vpermilps_avx((undefined1  [16])aVar9,0xff);
          auVar185._16_16_ = auVar164;
          auVar185._0_16_ = auVar164;
          auVar14 = vcmpps_avx(auVar185,auVar55,2);
          fVar190 = ray->tfar;
          auVar215._4_4_ = fVar190;
          auVar215._0_4_ = fVar190;
          auVar215._8_4_ = fVar190;
          auVar215._12_4_ = fVar190;
          auVar215._16_4_ = fVar190;
          auVar215._20_4_ = fVar190;
          auVar215._24_4_ = fVar190;
          auVar215._28_4_ = fVar190;
          auVar19 = vcmpps_avx(auVar55,auVar215,2);
          auVar14 = vandps_avx(auVar19,auVar14);
          auVar164 = vpackssdw_avx(auVar14._0_16_,auVar14._16_16_);
          auVar214 = vpand_avx(auVar214,auVar164);
          auVar164 = vpmovsxwd_avx(auVar214);
          auVar181 = vpshufd_avx(auVar214,0xee);
          auVar181 = vpmovsxwd_avx(auVar181);
          auVar184._16_16_ = auVar181;
          auVar184._0_16_ = auVar164;
          if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar184 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar184 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar184 >> 0x7f,0) == '\0') &&
                (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar181 >> 0x3f,0) == '\0') &&
              (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar181[0xf]) goto LAB_00e29b85;
          auVar14 = vcmpps_avx(ZEXT832(0) << 0x20,auVar241,4);
          auVar164 = vpackssdw_avx(auVar14._0_16_,auVar14._16_16_);
          auVar214 = vpand_avx(auVar214,auVar164);
          auVar164 = vpmovsxwd_avx(auVar214);
          auVar214 = vpunpckhwd_avx(auVar214,auVar214);
          auVar187 = ZEXT1664(auVar214);
          auVar225._16_16_ = auVar214;
          auVar225._0_16_ = auVar164;
          auVar217._8_8_ = uStack_4d8;
          auVar217._0_8_ = local_4e0;
          auVar217._16_8_ = uStack_4d0;
          auVar217._24_8_ = uStack_4c8;
          auVar249 = ZEXT3264(auVar245);
          auVar270 = ZEXT3264(auVar264);
          auVar245._4_4_ = fVar132;
          auVar245._0_4_ = fVar119;
          auVar245._8_4_ = fStack_798;
          auVar245._12_4_ = fStack_794;
          auVar245._16_4_ = fStack_790;
          auVar245._20_4_ = fStack_78c;
          auVar245._24_4_ = fStack_788;
          auVar245._28_4_ = fStack_784;
          if ((((((((auVar225 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar225 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar225 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar225 >> 0x7f,0) != '\0') ||
                (auVar225 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar214 >> 0x3f,0) != '\0') ||
              (auVar225 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar214[0xf] < '\0') {
            auVar186._0_4_ = auVar240._0_4_ * fVar229;
            auVar186._4_4_ = auVar240._4_4_ * fVar231;
            auVar186._8_4_ = auVar240._8_4_ * fVar193;
            auVar186._12_4_ = auVar240._12_4_ * fVar272;
            auVar186._16_4_ = auVar240._16_4_ * fVar274;
            auVar186._20_4_ = auVar240._20_4_ * fVar275;
            auVar186._24_4_ = auVar240._24_4_ * fVar278;
            auVar186._28_4_ = 0;
            auVar56._4_4_ = auVar203._4_4_ * fVar231;
            auVar56._0_4_ = auVar203._0_4_ * fVar229;
            auVar56._8_4_ = auVar203._8_4_ * fVar193;
            auVar56._12_4_ = auVar203._12_4_ * fVar272;
            auVar56._16_4_ = auVar203._16_4_ * fVar274;
            auVar56._20_4_ = auVar203._20_4_ * fVar275;
            auVar56._24_4_ = auVar203._24_4_ * fVar278;
            auVar56._28_4_ = auVar183._28_4_ + auVar27._28_4_;
            auVar216._8_4_ = 0x3f800000;
            auVar216._0_8_ = 0x3f8000003f800000;
            auVar216._12_4_ = 0x3f800000;
            auVar216._16_4_ = 0x3f800000;
            auVar216._20_4_ = 0x3f800000;
            auVar216._24_4_ = 0x3f800000;
            auVar216._28_4_ = 0x3f800000;
            auVar264 = vsubps_avx(auVar216,auVar186);
            auVar206 = ZEXT3264(auVar264);
            auVar264 = vblendvps_avx(auVar264,auVar186,auVar291);
            auVar249 = ZEXT3264(auVar264);
            auVar264 = vsubps_avx(auVar216,auVar56);
            auVar187 = ZEXT3264(auVar264);
            _local_3a0 = vblendvps_avx(auVar264,auVar56,auVar291);
            auVar270 = ZEXT3264(auVar55);
            auVar217 = auVar225;
          }
        }
        auVar288 = ZEXT3264(_local_760);
        if ((((((((auVar217 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar217 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar217 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar217 >> 0x7f,0) != '\0') ||
              (auVar217 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar217 >> 0xbf,0) != '\0') ||
            (auVar217 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar217[0x1f] < '\0') {
          auVar264 = vsubps_avx(local_680._0_32_,auVar245);
          fVar222 = auVar245._0_4_ + auVar249._0_4_ * auVar264._0_4_;
          fVar227 = auVar245._4_4_ + auVar249._4_4_ * auVar264._4_4_;
          fVar229 = auVar245._8_4_ + auVar249._8_4_ * auVar264._8_4_;
          fVar231 = auVar245._12_4_ + auVar249._12_4_ * auVar264._12_4_;
          fVar193 = auVar245._16_4_ + auVar249._16_4_ * auVar264._16_4_;
          fVar289 = auVar245._20_4_ + auVar249._20_4_ * auVar264._20_4_;
          fVar262 = auVar245._24_4_ + auVar249._24_4_ * auVar264._24_4_;
          fVar272 = auVar245._28_4_ + auVar264._28_4_;
          fVar190 = pre->depth_scale;
          auVar264._4_4_ = (fVar227 + fVar227) * fVar190;
          auVar264._0_4_ = (fVar222 + fVar222) * fVar190;
          auVar264._8_4_ = (fVar229 + fVar229) * fVar190;
          auVar264._12_4_ = (fVar231 + fVar231) * fVar190;
          auVar264._16_4_ = (fVar193 + fVar193) * fVar190;
          auVar264._20_4_ = (fVar289 + fVar289) * fVar190;
          auVar264._24_4_ = (fVar262 + fVar262) * fVar190;
          auVar264._28_4_ = fVar272 + fVar272;
          local_2a0 = auVar270._0_32_;
          auVar245 = vcmpps_avx(local_2a0,auVar264,6);
          auVar264 = auVar217 & auVar245;
          if ((((((((auVar264 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar264 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar264 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar264 >> 0x7f,0) != '\0') ||
                (auVar264 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar264 >> 0xbf,0) != '\0') ||
              (auVar264 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar264[0x1f] < '\0') {
            local_220 = vandps_avx(auVar245,auVar217);
            local_3a0._0_4_ = (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0;
            local_3a0._4_4_ = (float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0;
            uStack_398._0_4_ = (float)uStack_398 + (float)uStack_398 + -1.0;
            uStack_398._4_4_ = uStack_398._4_4_ + uStack_398._4_4_ + -1.0;
            uStack_390._0_4_ = (float)uStack_390 + (float)uStack_390 + -1.0;
            uStack_390._4_4_ = uStack_390._4_4_ + uStack_390._4_4_ + -1.0;
            uStack_388._0_4_ = (float)uStack_388 + (float)uStack_388 + -1.0;
            uStack_388._4_4_ = uStack_388._4_4_ + uStack_388._4_4_ + -1.0;
            local_2e0 = auVar249._0_32_;
            auVar106 = _local_3a0;
            auVar245 = _local_3a0;
            local_2c0 = (float)local_3a0._0_4_;
            fStack_2bc = (float)local_3a0._4_4_;
            fStack_2b8 = (float)uStack_398;
            fStack_2b4 = uStack_398._4_4_;
            fStack_2b0 = (float)uStack_390;
            fStack_2ac = uStack_390._4_4_;
            fStack_2a8 = (float)uStack_388;
            fStack_2a4 = uStack_388._4_4_;
            local_280 = 0;
            local_27c = uVar113;
            local_270 = local_7b0;
            uStack_268 = local_7b0._8_8_;
            local_260 = local_550;
            uStack_258 = uStack_548;
            local_250 = local_560;
            uStack_248 = uStack_558;
            local_240 = local_570;
            uStack_238 = uStack_568;
            if ((pGVar114->mask & ray->mask) != 0) {
              local_7a0 = (uint)pGVar114;
              uStack_79c = (undefined4)((ulong)pGVar114 >> 0x20);
              pGVar111 = (Geometry *)context->args;
              _local_3a0 = auVar245;
              if ((((Geometry *)context->args)->device != (Device *)0x0) ||
                 (bVar117 = true, pGVar111 = pGVar114, _local_570 = auVar18, _local_560 = auVar122,
                 _local_550 = auVar140, pGVar114->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar162._0_4_ = 1.0 / auVar179._0_4_;
                auVar162._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar214 = vshufps_avx(auVar162,auVar162,0);
                local_200[0] = auVar214._0_4_ * (auVar249._0_4_ + 0.0);
                local_200[1] = auVar214._4_4_ * (auVar249._4_4_ + 1.0);
                local_200[2] = auVar214._8_4_ * (auVar249._8_4_ + 2.0);
                local_200[3] = auVar214._12_4_ * (auVar249._12_4_ + 3.0);
                fStack_1f0 = auVar214._0_4_ * (auVar249._16_4_ + 4.0);
                fStack_1ec = auVar214._4_4_ * (auVar249._20_4_ + 5.0);
                fStack_1e8 = auVar214._8_4_ * (auVar249._24_4_ + 6.0);
                fStack_1e4 = auVar249._28_4_ + 7.0;
                uStack_390 = auVar106._16_8_;
                uStack_388 = auVar245._24_8_;
                local_1e0 = local_3a0;
                uStack_1d8 = uStack_398;
                uStack_1d0 = uStack_390;
                uStack_1c8 = uStack_388;
                local_1c0 = local_2a0;
                iVar109 = vmovmskps_avx(local_220);
                uVar115 = CONCAT44((int)((ulong)pGVar111 >> 0x20),iVar109);
                lVar116 = 0;
                if (uVar115 != 0) {
                  for (; (uVar115 >> lVar116 & 1) == 0; lVar116 = lVar116 + 1) {
                  }
                }
                if (iVar109 == 0) {
                  bVar117 = false;
                  _local_570 = auVar18;
                  _local_560 = auVar122;
                  _local_550 = auVar140;
                }
                else {
                  local_740._0_8_ = uVar115;
                  _auStack_61c = auVar20._4_28_;
                  local_620 = (undefined1  [4])ray->tfar;
                  local_700 = auVar249._0_32_;
                  local_720 = local_2a0;
                  fVar190 = (float)local_7b0._0_4_;
                  fVar222 = (float)local_7b0._4_4_;
                  fVar227 = (float)uStack_7a8;
                  fVar229 = uStack_7a8._4_4_;
                  _local_7b0 = auVar121;
                  _local_570 = auVar18;
                  _local_560 = auVar122;
                  _local_550 = auVar140;
                  _local_360 = auVar24;
                  _local_340 = auVar120;
                  do {
                    local_5c4 = local_200[lVar116];
                    local_5c0 = *(undefined4 *)((long)&local_1e0 + lVar116 * 4);
                    local_680._0_8_ = lVar116;
                    ray->tfar = *(float *)(local_1c0 + lVar116 * 4);
                    local_650.context = context->user;
                    fVar175 = 1.0 - local_5c4;
                    fVar210 = local_5c4 * fVar175 * 4.0;
                    auVar214 = ZEXT416((uint)(local_5c4 * local_5c4 * 0.5));
                    auVar214 = vshufps_avx(auVar214,auVar214,0);
                    auVar164 = ZEXT416((uint)((fVar175 * fVar175 + fVar210) * 0.5));
                    auVar164 = vshufps_avx(auVar164,auVar164,0);
                    auVar181 = ZEXT416((uint)((-local_5c4 * local_5c4 - fVar210) * 0.5));
                    auVar181 = vshufps_avx(auVar181,auVar181,0);
                    auVar200._0_4_ = auVar181._0_4_ * (float)local_550._0_4_;
                    auVar200._4_4_ = auVar181._4_4_ * (float)local_550._4_4_;
                    auVar200._8_4_ = auVar181._8_4_ * (float)uStack_548;
                    auVar200._12_4_ = auVar181._12_4_ * uStack_548._4_4_;
                    auVar206 = ZEXT1664(auVar200);
                    auVar181 = ZEXT416((uint)(fVar175 * -fVar175 * 0.5));
                    auVar181 = vshufps_avx(auVar181,auVar181,0);
                    auVar180._0_4_ = fVar190 * auVar181._0_4_;
                    auVar180._4_4_ = fVar222 * auVar181._4_4_;
                    auVar180._8_4_ = fVar227 * auVar181._8_4_;
                    auVar180._12_4_ = fVar229 * auVar181._12_4_;
                    auVar187 = ZEXT1664(auVar180);
                    auVar163._0_4_ =
                         auVar180._0_4_ +
                         auVar200._0_4_ +
                         auVar214._0_4_ * (float)local_570._0_4_ +
                         auVar164._0_4_ * (float)local_560._0_4_;
                    auVar163._4_4_ =
                         auVar180._4_4_ +
                         auVar200._4_4_ +
                         auVar214._4_4_ * (float)local_570._4_4_ +
                         auVar164._4_4_ * (float)local_560._4_4_;
                    auVar163._8_4_ =
                         auVar180._8_4_ +
                         auVar200._8_4_ +
                         auVar214._8_4_ * (float)uStack_568 + auVar164._8_4_ * (float)uStack_558;
                    auVar163._12_4_ =
                         auVar180._12_4_ +
                         auVar200._12_4_ +
                         auVar214._12_4_ * uStack_568._4_4_ + auVar164._12_4_ * uStack_558._4_4_;
                    local_5d0 = vmovlps_avx(auVar163);
                    local_5c8 = vextractps_avx(auVar163,2);
                    local_5bc = local_7b4;
                    local_5b8 = (int)local_688;
                    local_5b4 = (local_650.context)->instID[0];
                    local_5b0 = (local_650.context)->instPrimID[0];
                    local_7cc = -1;
                    local_650.valid = &local_7cc;
                    local_650.geometryUserPtr = *(void **)(CONCAT44(uStack_79c,local_7a0) + 0x18);
                    local_650.ray = (RTCRayN *)ray;
                    local_650.hit = (RTCHitN *)&local_5d0;
                    local_650.N = 1;
                    pcVar12 = *(code **)(CONCAT44(uStack_79c,local_7a0) + 0x48);
                    if (pcVar12 == (code *)0x0) {
LAB_00e28c4f:
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(CONCAT44(uStack_79c,local_7a0) + 0x3e) & 0x40) != 0)))) {
                        auVar187 = ZEXT1664(auVar187._0_16_);
                        auVar206 = ZEXT1664(auVar206._0_16_);
                        (*p_Var11)(&local_650);
                        if (*local_650.valid == 0) goto LAB_00e28c98;
                      }
                      bVar117 = true;
                      auVar249 = ZEXT3264(local_700);
                      auVar270 = ZEXT3264(local_720);
                      auVar288 = ZEXT3264(_local_760);
                      pre = local_7c0;
                      fVar156 = (float)local_780._0_4_;
                      fVar168 = (float)local_780._4_4_;
                      fVar170 = fStack_778;
                      fVar172 = fStack_774;
                      fVar220 = fStack_770;
                      fVar189 = fStack_76c;
                      fVar221 = fStack_768;
                      goto LAB_00e288c8;
                    }
                    auVar187 = ZEXT1664(auVar180);
                    auVar206 = ZEXT1664(auVar200);
                    (*pcVar12)(&local_650);
                    if (*local_650.valid != 0) goto LAB_00e28c4f;
LAB_00e28c98:
                    ray->tfar = (float)local_620;
                    uVar115 = local_740._0_8_ ^ 1L << (local_680._0_8_ & 0x3f);
                    lVar116 = 0;
                    if (uVar115 != 0) {
                      for (; (uVar115 >> lVar116 & 1) == 0; lVar116 = lVar116 + 1) {
                      }
                    }
                    bVar117 = false;
                    local_740._0_8_ = uVar115;
                    auVar249 = ZEXT3264(local_700);
                    auVar270 = ZEXT3264(local_720);
                    auVar288 = ZEXT3264(_local_760);
                    pre = local_7c0;
                    fVar280 = (float)local_6c0._0_4_;
                    fVar284 = (float)local_6c0._4_4_;
                    fVar285 = fStack_6b8;
                    fVar286 = fStack_6b4;
                    fVar210 = fStack_6b0;
                    fVar175 = fStack_6ac;
                    fVar219 = fStack_6a8;
                    fVar188 = fStack_6a4;
                    fVar190 = (float)local_7b0._0_4_;
                    fVar222 = (float)local_7b0._4_4_;
                    fVar227 = (float)uStack_7a8;
                    fVar229 = uStack_7a8._4_4_;
                    fVar156 = (float)local_780._0_4_;
                    fVar168 = (float)local_780._4_4_;
                    fVar170 = fStack_778;
                    fVar172 = fStack_774;
                    fVar220 = fStack_770;
                    fVar189 = fStack_76c;
                    fVar221 = fStack_768;
                    auVar121 = _local_7b0;
                  } while (uVar115 != 0);
                }
              }
              goto LAB_00e288da;
            }
          }
          goto LAB_00e28236;
        }
        bVar117 = false;
        _local_7b0 = auVar121;
LAB_00e288c8:
        fVar280 = (float)local_6c0._0_4_;
        fVar284 = (float)local_6c0._4_4_;
        fVar285 = fStack_6b8;
        fVar286 = fStack_6b4;
        fVar210 = fStack_6b0;
        fVar175 = fStack_6ac;
        fVar219 = fStack_6a8;
        fVar188 = fStack_6a4;
        auVar121 = _local_7b0;
      }
LAB_00e288da:
      _local_7b0 = auVar121;
      if (8 < (int)uVar113) {
        _local_340 = vpshufd_avx(ZEXT416(uVar113),0);
        auVar214 = vshufps_avx(_local_6e0,_local_6e0,0);
        register0x00001210 = auVar214;
        _local_4c0 = auVar214;
        auVar214 = vpermilps_avx(local_540._0_16_,0xff);
        local_380._16_16_ = auVar214;
        local_380._0_16_ = auVar214;
        auVar124._0_4_ = 1.0 / (float)local_440._0_4_;
        auVar124._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar214 = vshufps_avx(auVar124,auVar124,0);
        _fStack_430 = auVar214;
        _local_440 = auVar214;
        auVar131 = ZEXT3264(_local_440);
        lVar116 = 8;
        local_700 = auVar249._0_32_;
        local_720 = auVar270._0_32_;
        do {
          pauVar2 = (undefined1 (*) [28])(bspline_basis0 + lVar116 * 4 + lVar110);
          fVar190 = *(float *)*pauVar2;
          fVar222 = *(float *)(*pauVar2 + 4);
          fVar227 = *(float *)(*pauVar2 + 8);
          fVar229 = *(float *)(*pauVar2 + 0xc);
          fVar231 = *(float *)(*pauVar2 + 0x10);
          fVar193 = *(float *)(*pauVar2 + 0x14);
          fVar289 = *(float *)(*pauVar2 + 0x18);
          auVar105 = *pauVar2;
          fVar262 = *(float *)pauVar2[1];
          pauVar2 = (undefined1 (*) [28])(lVar110 + 0x21aefac + lVar116 * 4);
          fVar272 = *(float *)*pauVar2;
          fVar274 = *(float *)(*pauVar2 + 4);
          fVar275 = *(float *)(*pauVar2 + 8);
          fVar276 = *(float *)(*pauVar2 + 0xc);
          fVar277 = *(float *)(*pauVar2 + 0x10);
          fVar278 = *(float *)(*pauVar2 + 0x14);
          fVar243 = *(float *)(*pauVar2 + 0x18);
          auVar104 = *pauVar2;
          pauVar2 = (undefined1 (*) [28])(lVar110 + 0x21af430 + lVar116 * 4);
          fVar191 = *(float *)*pauVar2;
          fVar256 = *(float *)(*pauVar2 + 4);
          fVar251 = *(float *)(*pauVar2 + 8);
          fVar253 = *(float *)(*pauVar2 + 0xc);
          fVar192 = *(float *)(*pauVar2 + 0x10);
          fVar257 = *(float *)(*pauVar2 + 0x14);
          fVar255 = *(float *)(*pauVar2 + 0x18);
          auVar102 = *pauVar2;
          pfVar4 = (float *)(lVar110 + 0x21af8b4 + lVar116 * 4);
          local_4a0 = *pfVar4;
          fStack_49c = pfVar4[1];
          fStack_498 = pfVar4[2];
          fStack_494 = pfVar4[3];
          fStack_490 = pfVar4[4];
          fStack_48c = pfVar4[5];
          fStack_488 = pfVar4[6];
          fStack_484 = pfVar4[7];
          fVar133 = auVar187._28_4_;
          fVar174 = fVar133 + pfVar4[7];
          fStack_784 = fVar133 + fVar133 + auVar131._28_4_;
          fVar209 = fVar133 + fVar174;
          auVar247._0_4_ =
               (float)local_140._0_4_ * fVar190 +
               (float)local_400._0_4_ * fVar272 +
               auVar288._0_4_ * fVar191 + (float)local_420._0_4_ * local_4a0;
          auVar247._4_4_ =
               (float)local_140._4_4_ * fVar222 +
               (float)local_400._4_4_ * fVar274 +
               auVar288._4_4_ * fVar256 + (float)local_420._4_4_ * fStack_49c;
          auVar247._8_4_ =
               fStack_138 * fVar227 +
               fStack_3f8 * fVar275 + auVar288._8_4_ * fVar251 + fStack_418 * fStack_498;
          auVar247._12_4_ =
               fStack_134 * fVar229 +
               fStack_3f4 * fVar276 + auVar288._12_4_ * fVar253 + fStack_414 * fStack_494;
          auVar247._16_4_ =
               fStack_130 * fVar231 +
               fStack_3f0 * fVar277 + auVar288._16_4_ * fVar192 + fStack_410 * fStack_490;
          auVar247._20_4_ =
               fStack_12c * fVar193 +
               fStack_3ec * fVar278 + auVar288._20_4_ * fVar257 + fStack_40c * fStack_48c;
          auVar247._24_4_ =
               fStack_128 * fVar289 +
               fStack_3e8 * fVar243 + auVar288._24_4_ * fVar255 + fStack_408 * fStack_488;
          auVar247._28_4_ = fVar174 + fStack_784;
          auVar167._0_4_ =
               (float)local_c0._0_4_ * fVar190 +
               (float)local_a0._0_4_ * fVar272 + fVar156 * fVar191 + fVar280 * local_4a0;
          auVar167._4_4_ =
               (float)local_c0._4_4_ * fVar222 +
               (float)local_a0._4_4_ * fVar274 + fVar168 * fVar256 + fVar284 * fStack_49c;
          auVar167._8_4_ =
               fStack_b8 * fVar227 + fStack_98 * fVar275 + fVar170 * fVar251 + fVar285 * fStack_498;
          auVar167._12_4_ =
               fStack_b4 * fVar229 + fStack_94 * fVar276 + fVar172 * fVar253 + fVar286 * fStack_494;
          auVar167._16_4_ =
               fStack_b0 * fVar231 + fStack_90 * fVar277 + fVar220 * fVar192 + fVar210 * fStack_490;
          auVar167._20_4_ =
               fStack_ac * fVar193 + fStack_8c * fVar278 + fVar189 * fVar257 + fVar175 * fStack_48c;
          auVar167._24_4_ =
               fStack_a8 * fVar289 + fStack_88 * fVar243 + fVar221 * fVar255 + fVar219 * fStack_488;
          auVar167._28_4_ = fStack_784 + fVar133 + fVar133 + auVar206._28_4_;
          fVar174 = fVar190 * (float)local_120._0_4_ +
                    (float)local_80._0_4_ * fVar272 +
                    fVar191 * (float)local_e0._0_4_ + local_4a0 * (float)local_100._0_4_;
          fVar133 = fVar222 * (float)local_120._4_4_ +
                    (float)local_80._4_4_ * fVar274 +
                    fVar256 * (float)local_e0._4_4_ + fStack_49c * (float)local_100._4_4_;
          fStack_798 = fVar227 * fStack_118 +
                       fStack_78 * fVar275 + fVar251 * fStack_d8 + fStack_498 * fStack_f8;
          fStack_794 = fVar229 * fStack_114 +
                       fStack_74 * fVar276 + fVar253 * fStack_d4 + fStack_494 * fStack_f4;
          fStack_790 = fVar231 * fStack_110 +
                       fStack_70 * fVar277 + fVar192 * fStack_d0 + fStack_490 * fStack_f0;
          fStack_78c = fVar193 * fStack_10c +
                       fStack_6c * fVar278 + fVar257 * fStack_cc + fStack_48c * fStack_ec;
          fStack_788 = fVar289 * fStack_108 +
                       fStack_68 * fVar243 + fVar255 * fStack_c8 + fStack_488 * fStack_e8;
          fStack_784 = fStack_784 + fVar209;
          pauVar1 = (undefined1 (*) [32])(bspline_basis1 + lVar116 * 4 + lVar110);
          auVar106 = *(undefined1 (*) [24])*pauVar1;
          pauVar2 = (undefined1 (*) [28])(lVar110 + 0x21b13cc + lVar116 * 4);
          fVar272 = *(float *)*pauVar2;
          fVar274 = *(float *)(*pauVar2 + 4);
          fVar275 = *(float *)(*pauVar2 + 8);
          fVar276 = *(float *)(*pauVar2 + 0xc);
          fVar277 = *(float *)(*pauVar2 + 0x10);
          fVar278 = *(float *)(*pauVar2 + 0x14);
          fVar243 = *(float *)(*pauVar2 + 0x18);
          auVar108 = *pauVar2;
          auVar245 = *(undefined1 (*) [32])(lVar110 + 0x21b1850 + lVar116 * 4);
          auVar131 = ZEXT3264(auVar245);
          pauVar2 = (undefined1 (*) [28])(lVar110 + 0x21b1cd4 + lVar116 * 4);
          fVar191 = *(float *)*pauVar2;
          fVar256 = *(float *)(*pauVar2 + 4);
          fVar251 = *(float *)(*pauVar2 + 8);
          fVar253 = *(float *)(*pauVar2 + 0xc);
          fVar192 = *(float *)(*pauVar2 + 0x10);
          fVar257 = *(float *)(*pauVar2 + 0x14);
          fVar255 = *(float *)(*pauVar2 + 0x18);
          auVar107 = *pauVar2;
          fVar190 = auVar245._0_4_;
          fVar222 = auVar245._4_4_;
          fVar227 = auVar245._8_4_;
          fVar229 = auVar245._12_4_;
          fVar231 = auVar245._16_4_;
          fVar193 = auVar245._20_4_;
          fVar289 = auVar245._24_4_;
          fVar233 = fVar262 + *(float *)pauVar2[1];
          fVar209 = fVar262 + fVar262 + fVar209;
          local_6e0._0_4_ = auVar106._0_4_;
          local_6e0._4_4_ = auVar106._4_4_;
          auStack_6d8._0_4_ = auVar106._8_4_;
          auStack_6d8._4_4_ = auVar106._12_4_;
          fStack_6d0 = auVar106._16_4_;
          fStack_6cc = auVar106._20_4_;
          fStack_6c8 = (float)*(undefined8 *)(*pauVar1 + 0x18);
          local_460._0_4_ =
               (float)local_140._0_4_ * (float)local_6e0._0_4_ +
               (float)local_400._0_4_ * fVar272 +
               auVar288._0_4_ * fVar190 + (float)local_420._0_4_ * fVar191;
          local_460._4_4_ =
               (float)local_140._4_4_ * (float)local_6e0._4_4_ +
               (float)local_400._4_4_ * fVar274 +
               auVar288._4_4_ * fVar222 + (float)local_420._4_4_ * fVar256;
          local_460._8_4_ =
               fStack_138 * (float)auStack_6d8._0_4_ +
               fStack_3f8 * fVar275 + auVar288._8_4_ * fVar227 + fStack_418 * fVar251;
          local_460._12_4_ =
               fStack_134 * (float)auStack_6d8._4_4_ +
               fStack_3f4 * fVar276 + auVar288._12_4_ * fVar229 + fStack_414 * fVar253;
          local_460._16_4_ =
               fStack_130 * fStack_6d0 +
               fStack_3f0 * fVar277 + auVar288._16_4_ * fVar231 + fStack_410 * fVar192;
          local_460._20_4_ =
               fStack_12c * fStack_6cc +
               fStack_3ec * fVar278 + auVar288._20_4_ * fVar193 + fStack_40c * fVar257;
          local_460._24_4_ =
               fStack_128 * fStack_6c8 +
               fStack_3e8 * fVar243 + auVar288._24_4_ * fVar289 + fStack_408 * fVar255;
          local_460._28_4_ = fVar233 + fVar209;
          local_540._0_4_ =
               (float)local_c0._0_4_ * (float)local_6e0._0_4_ +
               (float)local_a0._0_4_ * fVar272 + fVar156 * fVar190 + fVar280 * fVar191;
          local_540._4_4_ =
               (float)local_c0._4_4_ * (float)local_6e0._4_4_ +
               (float)local_a0._4_4_ * fVar274 + fVar168 * fVar222 + fVar284 * fVar256;
          local_540._8_4_ =
               fStack_b8 * (float)auStack_6d8._0_4_ +
               fStack_98 * fVar275 + fVar170 * fVar227 + fVar285 * fVar251;
          local_540._12_4_ =
               fStack_b4 * (float)auStack_6d8._4_4_ +
               fStack_94 * fVar276 + fVar172 * fVar229 + fVar286 * fVar253;
          local_540._16_4_ =
               fStack_b0 * fStack_6d0 + fStack_90 * fVar277 + fVar220 * fVar231 + fVar210 * fVar192;
          local_540._20_4_ =
               fStack_ac * fStack_6cc + fStack_8c * fVar278 + fVar189 * fVar193 + fVar175 * fVar257;
          local_540._24_4_ =
               fStack_a8 * fStack_6c8 + fStack_88 * fVar243 + fVar221 * fVar289 + fVar219 * fVar255;
          local_540._28_4_ = fVar209 + fVar262 + fVar262 + fVar188;
          auVar267._0_4_ =
               (float)local_80._0_4_ * fVar272 +
               fVar190 * (float)local_e0._0_4_ + fVar191 * (float)local_100._0_4_ +
               (float)local_6e0._0_4_ * (float)local_120._0_4_;
          auVar267._4_4_ =
               (float)local_80._4_4_ * fVar274 +
               fVar222 * (float)local_e0._4_4_ + fVar256 * (float)local_100._4_4_ +
               (float)local_6e0._4_4_ * (float)local_120._4_4_;
          auVar267._8_4_ =
               fStack_78 * fVar275 + fVar227 * fStack_d8 + fVar251 * fStack_f8 +
               (float)auStack_6d8._0_4_ * fStack_118;
          auVar267._12_4_ =
               fStack_74 * fVar276 + fVar229 * fStack_d4 + fVar253 * fStack_f4 +
               (float)auStack_6d8._4_4_ * fStack_114;
          auVar267._16_4_ =
               fStack_70 * fVar277 + fVar231 * fStack_d0 + fVar192 * fStack_f0 +
               fStack_6d0 * fStack_110;
          auVar267._20_4_ =
               fStack_6c * fVar278 + fVar193 * fStack_cc + fVar257 * fStack_ec +
               fStack_6cc * fStack_10c;
          auVar267._24_4_ =
               fStack_68 * fVar243 + fVar289 * fStack_c8 + fVar255 * fStack_e8 +
               fStack_6c8 * fStack_108;
          auVar267._28_4_ = fVar262 + fVar233 + fVar209;
          auVar187 = ZEXT3264(auVar288._0_32_);
          auVar14 = vsubps_avx(local_460,auVar247);
          auVar20 = vsubps_avx(local_540,auVar167);
          fVar262 = auVar14._0_4_;
          fVar272 = auVar14._4_4_;
          auVar24._4_4_ = fVar272 * auVar167._4_4_;
          auVar24._0_4_ = fVar262 * auVar167._0_4_;
          fVar274 = auVar14._8_4_;
          auVar24._8_4_ = fVar274 * auVar167._8_4_;
          fVar275 = auVar14._12_4_;
          auVar24._12_4_ = fVar275 * auVar167._12_4_;
          fVar276 = auVar14._16_4_;
          auVar24._16_4_ = fVar276 * auVar167._16_4_;
          fVar277 = auVar14._20_4_;
          auVar24._20_4_ = fVar277 * auVar167._20_4_;
          fVar278 = auVar14._24_4_;
          auVar24._24_4_ = fVar278 * auVar167._24_4_;
          auVar24._28_4_ = fVar209;
          fVar210 = auVar20._0_4_;
          fVar175 = auVar20._4_4_;
          auVar57._4_4_ = auVar247._4_4_ * fVar175;
          auVar57._0_4_ = auVar247._0_4_ * fVar210;
          fVar219 = auVar20._8_4_;
          auVar57._8_4_ = auVar247._8_4_ * fVar219;
          fVar188 = auVar20._12_4_;
          auVar57._12_4_ = auVar247._12_4_ * fVar188;
          fVar220 = auVar20._16_4_;
          auVar57._16_4_ = auVar247._16_4_ * fVar220;
          fVar189 = auVar20._20_4_;
          auVar57._20_4_ = auVar247._20_4_ * fVar189;
          fVar221 = auVar20._24_4_;
          auVar57._24_4_ = auVar247._24_4_ * fVar221;
          auVar57._28_4_ = local_540._28_4_;
          auVar19 = vsubps_avx(auVar24,auVar57);
          auVar100._4_4_ = fVar133;
          auVar100._0_4_ = fVar174;
          auVar100._8_4_ = fStack_798;
          auVar100._12_4_ = fStack_794;
          auVar100._16_4_ = fStack_790;
          auVar100._20_4_ = fStack_78c;
          auVar100._24_4_ = fStack_788;
          auVar100._28_4_ = fStack_784;
          auVar264 = vmaxps_avx(auVar100,auVar267);
          auVar58._4_4_ = auVar264._4_4_ * auVar264._4_4_ * (fVar272 * fVar272 + fVar175 * fVar175);
          auVar58._0_4_ = auVar264._0_4_ * auVar264._0_4_ * (fVar262 * fVar262 + fVar210 * fVar210);
          auVar58._8_4_ = auVar264._8_4_ * auVar264._8_4_ * (fVar274 * fVar274 + fVar219 * fVar219);
          auVar58._12_4_ =
               auVar264._12_4_ * auVar264._12_4_ * (fVar275 * fVar275 + fVar188 * fVar188);
          auVar58._16_4_ =
               auVar264._16_4_ * auVar264._16_4_ * (fVar276 * fVar276 + fVar220 * fVar220);
          auVar58._20_4_ =
               auVar264._20_4_ * auVar264._20_4_ * (fVar277 * fVar277 + fVar189 * fVar189);
          auVar58._24_4_ =
               auVar264._24_4_ * auVar264._24_4_ * (fVar278 * fVar278 + fVar221 * fVar221);
          auVar58._28_4_ = fVar233 + local_540._28_4_;
          auVar59._4_4_ = auVar19._4_4_ * auVar19._4_4_;
          auVar59._0_4_ = auVar19._0_4_ * auVar19._0_4_;
          auVar59._8_4_ = auVar19._8_4_ * auVar19._8_4_;
          auVar59._12_4_ = auVar19._12_4_ * auVar19._12_4_;
          auVar59._16_4_ = auVar19._16_4_ * auVar19._16_4_;
          auVar59._20_4_ = auVar19._20_4_ * auVar19._20_4_;
          auVar59._24_4_ = auVar19._24_4_ * auVar19._24_4_;
          auVar59._28_4_ = auVar19._28_4_;
          auVar206 = ZEXT3264(auVar59);
          auVar264 = vcmpps_avx(auVar59,auVar58,2);
          local_280 = (uint)lVar116;
          auVar164 = vpshufd_avx(ZEXT416(local_280),0);
          auVar214 = vpor_avx(auVar164,_DAT_01f7fcf0);
          auVar164 = vpor_avx(auVar164,_DAT_01fafea0);
          auVar214 = vpcmpgtd_avx(_local_340,auVar214);
          auVar164 = vpcmpgtd_avx(_local_340,auVar164);
          register0x00001250 = auVar164;
          _local_360 = auVar214;
          auVar19 = _local_360 & auVar264;
          fVar280 = (float)local_6c0._0_4_;
          fVar284 = (float)local_6c0._4_4_;
          fVar285 = fStack_6b8;
          fVar286 = fStack_6b4;
          fVar210 = fStack_6b0;
          fVar175 = fStack_6ac;
          fVar219 = fStack_6a8;
          fVar188 = fStack_6a4;
          fVar156 = (float)local_780._0_4_;
          fVar168 = (float)local_780._4_4_;
          fVar170 = fStack_778;
          fVar172 = fStack_774;
          fVar220 = fStack_770;
          fVar189 = fStack_76c;
          fVar221 = fStack_768;
          if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar19 >> 0x7f,0) == '\0') &&
                (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar19 >> 0xbf,0) == '\0') &&
              (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar19[0x1f]) {
            auVar288 = ZEXT3264(auVar288._0_32_);
            _local_6e0 = *pauVar1;
LAB_00e29649:
            auVar270 = ZEXT3264(local_720);
            auVar249 = ZEXT3264(local_700);
          }
          else {
            local_5a0._0_4_ = auVar108._0_4_;
            local_5a0._4_4_ = auVar108._4_4_;
            fStack_598 = auVar108._8_4_;
            fStack_594 = auVar108._12_4_;
            fStack_590 = auVar108._16_4_;
            fStack_58c = auVar108._20_4_;
            fStack_588 = auVar108._24_4_;
            fVar262 = (float)local_3e0._0_4_ * (float)local_5a0._0_4_;
            fVar272 = (float)local_3e0._4_4_ * (float)local_5a0._4_4_;
            fVar274 = fStack_3d8 * fStack_598;
            fVar275 = fStack_3d4 * fStack_594;
            fVar276 = fStack_3d0 * fStack_590;
            fVar277 = fStack_3cc * fStack_58c;
            fVar278 = fStack_3c8 * fStack_588;
            _local_5a0 = auVar264;
            local_520._0_4_ = auVar107._0_4_;
            local_520._4_4_ = auVar107._4_4_;
            fStack_518 = auVar107._8_4_;
            fStack_514 = auVar107._12_4_;
            fStack_510 = auVar107._16_4_;
            fStack_50c = auVar107._20_4_;
            fStack_508 = auVar107._24_4_;
            local_520._0_4_ =
                 (float)local_6e0._0_4_ * (float)local_160._0_4_ +
                 fVar262 + (float)local_320._0_4_ * fVar190 +
                           (float)local_600._0_4_ * (float)local_520._0_4_;
            local_520._4_4_ =
                 (float)local_6e0._4_4_ * (float)local_160._4_4_ +
                 fVar272 + (float)local_320._4_4_ * fVar222 +
                           (float)local_600._4_4_ * (float)local_520._4_4_;
            fStack_518 = (float)auStack_6d8._0_4_ * fStack_158 +
                         fVar274 + fStack_318 * fVar227 + fStack_5f8 * fStack_518;
            fStack_514 = (float)auStack_6d8._4_4_ * fStack_154 +
                         fVar275 + fStack_314 * fVar229 + fStack_5f4 * fStack_514;
            fStack_510 = fStack_6d0 * fStack_150 +
                         fVar276 + fStack_310 * fVar231 + fStack_5f0 * fStack_510;
            fStack_50c = fStack_6cc * fStack_14c +
                         fVar277 + fStack_30c * fVar193 + fStack_5ec * fStack_50c;
            fStack_508 = fStack_6c8 * fStack_148 +
                         fVar278 + fStack_308 * fVar289 + fStack_5e8 * fStack_508;
            fStack_504 = auVar267._28_4_ + auVar245._28_4_ + auVar164._12_4_ + 0.0;
            local_500._0_4_ = auVar104._0_4_;
            local_500._4_4_ = auVar104._4_4_;
            fStack_4f8 = auVar104._8_4_;
            fStack_4f4 = auVar104._12_4_;
            fStack_4f0 = auVar104._16_4_;
            fStack_4ec = auVar104._20_4_;
            fStack_4e8 = auVar104._24_4_;
            local_480._0_4_ = auVar102._0_4_;
            local_480._4_4_ = auVar102._4_4_;
            fStack_478 = auVar102._8_4_;
            fStack_474 = auVar102._12_4_;
            fStack_470 = auVar102._16_4_;
            fStack_46c = auVar102._20_4_;
            fStack_468 = auVar102._24_4_;
            fVar138 = (float)local_320._0_4_ * (float)local_480._0_4_;
            fVar148 = (float)local_320._4_4_ * (float)local_480._4_4_;
            fVar150 = fStack_318 * fStack_478;
            fVar151 = fStack_314 * fStack_474;
            fVar152 = fStack_310 * fStack_470;
            fVar153 = fStack_30c * fStack_46c;
            fVar119 = fStack_308 * fStack_468;
            pfVar4 = (float *)(lVar110 + 0x21b0640 + lVar116 * 4);
            fVar190 = *pfVar4;
            fVar222 = pfVar4[1];
            fVar227 = pfVar4[2];
            fVar229 = pfVar4[3];
            fVar231 = pfVar4[4];
            fVar193 = pfVar4[5];
            fVar289 = pfVar4[6];
            pfVar5 = (float *)(lVar110 + 0x21b0ac4 + lVar116 * 4);
            fVar262 = *pfVar5;
            fVar272 = pfVar5[1];
            fVar274 = pfVar5[2];
            fVar275 = pfVar5[3];
            fVar276 = pfVar5[4];
            fVar277 = pfVar5[5];
            fVar278 = pfVar5[6];
            pfVar6 = (float *)(lVar110 + 0x21b01bc + lVar116 * 4);
            fVar243 = *pfVar6;
            fVar191 = pfVar6[1];
            fVar256 = pfVar6[2];
            fVar251 = pfVar6[3];
            fVar253 = pfVar6[4];
            fVar192 = pfVar6[5];
            fVar257 = pfVar6[6];
            fVar136 = pfVar4[7] + pfVar5[7];
            fVar155 = pfVar5[7] + fStack_a4 + 0.0;
            fVar132 = fStack_a4 + fStack_124 + fStack_a4 + 0.0;
            pfVar4 = (float *)(lVar110 + 0x21afd38 + lVar116 * 4);
            fVar255 = *pfVar4;
            fVar209 = pfVar4[1];
            fVar233 = pfVar4[2];
            fVar258 = pfVar4[3];
            fVar194 = pfVar4[4];
            fVar154 = pfVar4[5];
            fVar259 = pfVar4[6];
            local_480._4_4_ =
                 (float)local_140._4_4_ * fVar209 +
                 fVar191 * (float)local_400._4_4_ +
                 fVar222 * (float)local_760._4_4_ + (float)local_420._4_4_ * fVar272;
            local_480._0_4_ =
                 (float)local_140._0_4_ * fVar255 +
                 fVar243 * (float)local_400._0_4_ +
                 fVar190 * (float)local_760._0_4_ + (float)local_420._0_4_ * fVar262;
            fStack_478 = fStack_138 * fVar233 +
                         fVar256 * fStack_3f8 + fVar227 * fStack_758 + fStack_418 * fVar274;
            fStack_474 = fStack_134 * fVar258 +
                         fVar251 * fStack_3f4 + fVar229 * fStack_754 + fStack_414 * fVar275;
            fStack_470 = fStack_130 * fVar194 +
                         fVar253 * fStack_3f0 + fVar231 * fStack_750 + fStack_410 * fVar276;
            fStack_46c = fStack_12c * fVar154 +
                         fVar192 * fStack_3ec + fVar193 * fStack_74c + fStack_40c * fVar277;
            fStack_468 = fStack_128 * fVar259 +
                         fVar257 * fStack_3e8 + fVar289 * fStack_748 + fStack_408 * fVar278;
            fStack_464 = fVar136 + fVar155;
            auVar143._0_4_ =
                 (float)local_c0._0_4_ * fVar255 +
                 (float)local_780._0_4_ * fVar190 + (float)local_6c0._0_4_ * fVar262 +
                 (float)local_a0._0_4_ * fVar243;
            auVar143._4_4_ =
                 (float)local_c0._4_4_ * fVar209 +
                 (float)local_780._4_4_ * fVar222 + (float)local_6c0._4_4_ * fVar272 +
                 (float)local_a0._4_4_ * fVar191;
            auVar143._8_4_ =
                 fStack_b8 * fVar233 +
                 fStack_778 * fVar227 + fStack_6b8 * fVar274 + fStack_98 * fVar256;
            auVar143._12_4_ =
                 fStack_b4 * fVar258 +
                 fStack_774 * fVar229 + fStack_6b4 * fVar275 + fStack_94 * fVar251;
            auVar143._16_4_ =
                 fStack_b0 * fVar194 +
                 fStack_770 * fVar231 + fStack_6b0 * fVar276 + fStack_90 * fVar253;
            auVar143._20_4_ =
                 fStack_ac * fVar154 +
                 fStack_76c * fVar193 + fStack_6ac * fVar277 + fStack_8c * fVar192;
            auVar143._24_4_ =
                 fStack_a8 * fVar259 +
                 fStack_768 * fVar289 + fStack_6a8 * fVar278 + fStack_88 * fVar257;
            auVar143._28_4_ = fVar155 + fVar132;
            auVar298._0_4_ =
                 fVar243 * (float)local_3e0._0_4_ +
                 (float)local_320._0_4_ * fVar190 + (float)local_600._0_4_ * fVar262 +
                 fVar255 * (float)local_160._0_4_;
            auVar298._4_4_ =
                 fVar191 * (float)local_3e0._4_4_ +
                 (float)local_320._4_4_ * fVar222 + (float)local_600._4_4_ * fVar272 +
                 fVar209 * (float)local_160._4_4_;
            auVar298._8_4_ =
                 fVar256 * fStack_3d8 + fStack_318 * fVar227 + fStack_5f8 * fVar274 +
                 fVar233 * fStack_158;
            auVar298._12_4_ =
                 fVar251 * fStack_3d4 + fStack_314 * fVar229 + fStack_5f4 * fVar275 +
                 fVar258 * fStack_154;
            auVar298._16_4_ =
                 fVar253 * fStack_3d0 + fStack_310 * fVar231 + fStack_5f0 * fVar276 +
                 fVar194 * fStack_150;
            auVar298._20_4_ =
                 fVar192 * fStack_3cc + fStack_30c * fVar193 + fStack_5ec * fVar277 +
                 fVar154 * fStack_14c;
            auVar298._24_4_ =
                 fVar257 * fStack_3c8 + fStack_308 * fVar289 + fStack_5e8 * fVar278 +
                 fVar259 * fStack_148;
            auVar298._28_4_ = pfVar6[7] + fVar136 + fVar132;
            pfVar4 = (float *)(lVar110 + 0x21b2a60 + lVar116 * 4);
            fVar190 = *pfVar4;
            fVar222 = pfVar4[1];
            fVar227 = pfVar4[2];
            fVar229 = pfVar4[3];
            fVar231 = pfVar4[4];
            fVar193 = pfVar4[5];
            fVar289 = pfVar4[6];
            pfVar5 = (float *)(lVar110 + 0x21b2ee4 + lVar116 * 4);
            fVar262 = *pfVar5;
            fVar272 = pfVar5[1];
            fVar274 = pfVar5[2];
            fVar275 = pfVar5[3];
            fVar276 = pfVar5[4];
            fVar277 = pfVar5[5];
            fVar278 = pfVar5[6];
            pfVar6 = (float *)(lVar110 + 0x21b25dc + lVar116 * 4);
            fVar243 = *pfVar6;
            fVar191 = pfVar6[1];
            fVar256 = pfVar6[2];
            fVar251 = pfVar6[3];
            fVar253 = pfVar6[4];
            fVar192 = pfVar6[5];
            fVar257 = pfVar6[6];
            pfVar7 = (float *)(lVar110 + 0x21b2158 + lVar116 * 4);
            fVar255 = *pfVar7;
            fVar209 = pfVar7[1];
            fVar233 = pfVar7[2];
            fVar258 = pfVar7[3];
            fVar194 = pfVar7[4];
            fVar154 = pfVar7[5];
            fVar259 = pfVar7[6];
            auVar268._0_4_ =
                 fVar255 * (float)local_140._0_4_ +
                 fVar243 * (float)local_400._0_4_ +
                 fVar190 * (float)local_760._0_4_ + fVar262 * (float)local_420._0_4_;
            auVar268._4_4_ =
                 fVar209 * (float)local_140._4_4_ +
                 fVar191 * (float)local_400._4_4_ +
                 fVar222 * (float)local_760._4_4_ + fVar272 * (float)local_420._4_4_;
            auVar268._8_4_ =
                 fVar233 * fStack_138 +
                 fVar256 * fStack_3f8 + fVar227 * fStack_758 + fVar274 * fStack_418;
            auVar268._12_4_ =
                 fVar258 * fStack_134 +
                 fVar251 * fStack_3f4 + fVar229 * fStack_754 + fVar275 * fStack_414;
            auVar268._16_4_ =
                 fVar194 * fStack_130 +
                 fVar253 * fStack_3f0 + fVar231 * fStack_750 + fVar276 * fStack_410;
            auVar268._20_4_ =
                 fVar154 * fStack_12c +
                 fVar192 * fStack_3ec + fVar193 * fStack_74c + fVar277 * fStack_40c;
            auVar268._24_4_ =
                 fVar259 * fStack_128 +
                 fVar257 * fStack_3e8 + fVar289 * fStack_748 + fVar278 * fStack_408;
            auVar268._28_4_ = fStack_5e4 + fStack_5e4 + fStack_124 + fStack_404;
            auVar294._0_4_ =
                 (float)local_c0._0_4_ * fVar255 +
                 fVar243 * (float)local_a0._0_4_ +
                 (float)local_780._0_4_ * fVar190 + fVar262 * (float)local_6c0._0_4_;
            auVar294._4_4_ =
                 (float)local_c0._4_4_ * fVar209 +
                 fVar191 * (float)local_a0._4_4_ +
                 (float)local_780._4_4_ * fVar222 + fVar272 * (float)local_6c0._4_4_;
            auVar294._8_4_ =
                 fStack_b8 * fVar233 +
                 fVar256 * fStack_98 + fStack_778 * fVar227 + fVar274 * fStack_6b8;
            auVar294._12_4_ =
                 fStack_b4 * fVar258 +
                 fVar251 * fStack_94 + fStack_774 * fVar229 + fVar275 * fStack_6b4;
            auVar294._16_4_ =
                 fStack_b0 * fVar194 +
                 fVar253 * fStack_90 + fStack_770 * fVar231 + fVar276 * fStack_6b0;
            auVar294._20_4_ =
                 fStack_ac * fVar154 +
                 fVar192 * fStack_8c + fStack_76c * fVar193 + fVar277 * fStack_6ac;
            auVar294._24_4_ =
                 fStack_a8 * fVar259 +
                 fVar257 * fStack_88 + fStack_768 * fVar289 + fVar278 * fStack_6a8;
            auVar294._28_4_ = fStack_5e4 + fStack_5e4 + fStack_84 + fStack_5e4;
            auVar218._8_4_ = 0x7fffffff;
            auVar218._0_8_ = 0x7fffffff7fffffff;
            auVar218._12_4_ = 0x7fffffff;
            auVar218._16_4_ = 0x7fffffff;
            auVar218._20_4_ = 0x7fffffff;
            auVar218._24_4_ = 0x7fffffff;
            auVar218._28_4_ = 0x7fffffff;
            auVar245 = vandps_avx(_local_480,auVar218);
            auVar19 = vandps_avx(auVar143,auVar218);
            auVar19 = vmaxps_avx(auVar245,auVar19);
            auVar245 = vandps_avx(auVar298,auVar218);
            auVar19 = vmaxps_avx(auVar19,auVar245);
            auVar19 = vcmpps_avx(auVar19,_local_4c0,1);
            auVar27 = vblendvps_avx(_local_480,auVar14,auVar19);
            auVar128._0_4_ =
                 fVar255 * (float)local_160._0_4_ +
                 fVar243 * (float)local_3e0._0_4_ +
                 fVar262 * (float)local_600._0_4_ + (float)local_320._0_4_ * fVar190;
            auVar128._4_4_ =
                 fVar209 * (float)local_160._4_4_ +
                 fVar191 * (float)local_3e0._4_4_ +
                 fVar272 * (float)local_600._4_4_ + (float)local_320._4_4_ * fVar222;
            auVar128._8_4_ =
                 fVar233 * fStack_158 +
                 fVar256 * fStack_3d8 + fVar274 * fStack_5f8 + fStack_318 * fVar227;
            auVar128._12_4_ =
                 fVar258 * fStack_154 +
                 fVar251 * fStack_3d4 + fVar275 * fStack_5f4 + fStack_314 * fVar229;
            auVar128._16_4_ =
                 fVar194 * fStack_150 +
                 fVar253 * fStack_3d0 + fVar276 * fStack_5f0 + fStack_310 * fVar231;
            auVar128._20_4_ =
                 fVar154 * fStack_14c +
                 fVar192 * fStack_3cc + fVar277 * fStack_5ec + fStack_30c * fVar193;
            auVar128._24_4_ =
                 fVar259 * fStack_148 +
                 fVar257 * fStack_3c8 + fVar278 * fStack_5e8 + fStack_308 * fVar289;
            auVar128._28_4_ = auVar245._28_4_ + pfVar6[7] + pfVar5[7] + pfVar4[7];
            auVar13 = vblendvps_avx(auVar143,auVar20,auVar19);
            auVar245 = vandps_avx(auVar268,auVar218);
            auVar19 = vandps_avx(auVar294,auVar218);
            auVar15 = vmaxps_avx(auVar245,auVar19);
            auVar245 = vandps_avx(auVar128,auVar218);
            auVar245 = vmaxps_avx(auVar15,auVar245);
            local_620 = auVar105._0_4_;
            auStack_61c._0_4_ = auVar105._4_4_;
            auStack_61c._4_4_ = auVar105._8_4_;
            fStack_614 = auVar105._12_4_;
            fStack_610 = auVar105._16_4_;
            fStack_60c = auVar105._20_4_;
            fStack_608 = auVar105._24_4_;
            auVar19 = vcmpps_avx(auVar245,_local_4c0,1);
            auVar245 = vblendvps_avx(auVar268,auVar14,auVar19);
            auVar129._0_4_ =
                 (float)local_160._0_4_ * (float)local_620 +
                 (float)local_3e0._0_4_ * (float)local_500._0_4_ +
                 fVar138 + (float)local_600._0_4_ * local_4a0;
            auVar129._4_4_ =
                 (float)local_160._4_4_ * (float)auStack_61c._0_4_ +
                 (float)local_3e0._4_4_ * (float)local_500._4_4_ +
                 fVar148 + (float)local_600._4_4_ * fStack_49c;
            auVar129._8_4_ =
                 fStack_158 * (float)auStack_61c._4_4_ +
                 fStack_3d8 * fStack_4f8 + fVar150 + fStack_5f8 * fStack_498;
            auVar129._12_4_ =
                 fStack_154 * fStack_614 +
                 fStack_3d4 * fStack_4f4 + fVar151 + fStack_5f4 * fStack_494;
            auVar129._16_4_ =
                 fStack_150 * fStack_610 +
                 fStack_3d0 * fStack_4f0 + fVar152 + fStack_5f0 * fStack_490;
            auVar129._20_4_ =
                 fStack_14c * fStack_60c +
                 fStack_3cc * fStack_4ec + fVar153 + fStack_5ec * fStack_48c;
            auVar129._24_4_ =
                 fStack_148 * fStack_608 +
                 fStack_3c8 * fStack_4e8 + fVar119 + fStack_5e8 * fStack_488;
            auVar129._28_4_ = auVar15._28_4_ + fStack_504 + auVar164._12_4_ + 0.0;
            auVar19 = vblendvps_avx(auVar294,auVar20,auVar19);
            fVar119 = auVar27._0_4_;
            fVar155 = auVar27._4_4_;
            fVar132 = auVar27._8_4_;
            fVar134 = auVar27._12_4_;
            fVar135 = auVar27._16_4_;
            fVar137 = auVar27._20_4_;
            fVar147 = auVar27._24_4_;
            fVar149 = auVar27._28_4_;
            fVar243 = auVar245._0_4_;
            fVar256 = auVar245._4_4_;
            fVar253 = auVar245._8_4_;
            fVar257 = auVar245._12_4_;
            fVar209 = auVar245._16_4_;
            fVar258 = auVar245._20_4_;
            fVar154 = auVar245._24_4_;
            fVar190 = auVar13._0_4_;
            fVar227 = auVar13._4_4_;
            fVar231 = auVar13._8_4_;
            fVar289 = auVar13._12_4_;
            fVar272 = auVar13._16_4_;
            fVar275 = auVar13._20_4_;
            fVar277 = auVar13._24_4_;
            auVar282._0_4_ = fVar190 * fVar190 + fVar119 * fVar119;
            auVar282._4_4_ = fVar227 * fVar227 + fVar155 * fVar155;
            auVar282._8_4_ = fVar231 * fVar231 + fVar132 * fVar132;
            auVar282._12_4_ = fVar289 * fVar289 + fVar134 * fVar134;
            auVar282._16_4_ = fVar272 * fVar272 + fVar135 * fVar135;
            auVar282._20_4_ = fVar275 * fVar275 + fVar137 * fVar137;
            auVar282._24_4_ = fVar277 * fVar277 + fVar147 * fVar147;
            auVar282._28_4_ = auVar14._28_4_ + auVar20._28_4_;
            auVar14 = vrsqrtps_avx(auVar282);
            fVar222 = auVar14._0_4_;
            fVar229 = auVar14._4_4_;
            auVar60._4_4_ = fVar229 * 1.5;
            auVar60._0_4_ = fVar222 * 1.5;
            fVar193 = auVar14._8_4_;
            auVar60._8_4_ = fVar193 * 1.5;
            fVar262 = auVar14._12_4_;
            auVar60._12_4_ = fVar262 * 1.5;
            fVar274 = auVar14._16_4_;
            auVar60._16_4_ = fVar274 * 1.5;
            fVar276 = auVar14._20_4_;
            auVar60._20_4_ = fVar276 * 1.5;
            fVar278 = auVar14._24_4_;
            auVar60._24_4_ = fVar278 * 1.5;
            auVar60._28_4_ = auVar294._28_4_;
            auVar61._4_4_ = fVar229 * fVar229 * fVar229 * auVar282._4_4_ * 0.5;
            auVar61._0_4_ = fVar222 * fVar222 * fVar222 * auVar282._0_4_ * 0.5;
            auVar61._8_4_ = fVar193 * fVar193 * fVar193 * auVar282._8_4_ * 0.5;
            auVar61._12_4_ = fVar262 * fVar262 * fVar262 * auVar282._12_4_ * 0.5;
            auVar61._16_4_ = fVar274 * fVar274 * fVar274 * auVar282._16_4_ * 0.5;
            auVar61._20_4_ = fVar276 * fVar276 * fVar276 * auVar282._20_4_ * 0.5;
            auVar61._24_4_ = fVar278 * fVar278 * fVar278 * auVar282._24_4_ * 0.5;
            auVar61._28_4_ = auVar282._28_4_;
            auVar20 = vsubps_avx(auVar60,auVar61);
            fVar136 = auVar20._0_4_;
            fVar138 = auVar20._4_4_;
            fVar148 = auVar20._8_4_;
            fVar150 = auVar20._12_4_;
            fVar151 = auVar20._16_4_;
            fVar152 = auVar20._20_4_;
            fVar153 = auVar20._24_4_;
            fVar222 = auVar19._0_4_;
            fVar229 = auVar19._4_4_;
            fVar193 = auVar19._8_4_;
            fVar262 = auVar19._12_4_;
            fVar274 = auVar19._16_4_;
            fVar276 = auVar19._20_4_;
            fVar278 = auVar19._24_4_;
            auVar248._0_4_ = fVar222 * fVar222 + fVar243 * fVar243;
            auVar248._4_4_ = fVar229 * fVar229 + fVar256 * fVar256;
            auVar248._8_4_ = fVar193 * fVar193 + fVar253 * fVar253;
            auVar248._12_4_ = fVar262 * fVar262 + fVar257 * fVar257;
            auVar248._16_4_ = fVar274 * fVar274 + fVar209 * fVar209;
            auVar248._20_4_ = fVar276 * fVar276 + fVar258 * fVar258;
            auVar248._24_4_ = fVar278 * fVar278 + fVar154 * fVar154;
            auVar248._28_4_ = auVar14._28_4_ + auVar245._28_4_;
            auVar245 = vrsqrtps_avx(auVar248);
            fVar191 = auVar245._0_4_;
            fVar251 = auVar245._4_4_;
            auVar62._4_4_ = fVar251 * 1.5;
            auVar62._0_4_ = fVar191 * 1.5;
            fVar192 = auVar245._8_4_;
            auVar62._8_4_ = fVar192 * 1.5;
            fVar255 = auVar245._12_4_;
            auVar62._12_4_ = fVar255 * 1.5;
            fVar233 = auVar245._16_4_;
            auVar62._16_4_ = fVar233 * 1.5;
            fVar194 = auVar245._20_4_;
            auVar62._20_4_ = fVar194 * 1.5;
            fVar259 = auVar245._24_4_;
            auVar62._24_4_ = fVar259 * 1.5;
            auVar62._28_4_ = auVar294._28_4_;
            auVar63._4_4_ = fVar251 * fVar251 * fVar251 * auVar248._4_4_ * 0.5;
            auVar63._0_4_ = fVar191 * fVar191 * fVar191 * auVar248._0_4_ * 0.5;
            auVar63._8_4_ = fVar192 * fVar192 * fVar192 * auVar248._8_4_ * 0.5;
            auVar63._12_4_ = fVar255 * fVar255 * fVar255 * auVar248._12_4_ * 0.5;
            auVar63._16_4_ = fVar233 * fVar233 * fVar233 * auVar248._16_4_ * 0.5;
            auVar63._20_4_ = fVar194 * fVar194 * fVar194 * auVar248._20_4_ * 0.5;
            auVar63._24_4_ = fVar259 * fVar259 * fVar259 * auVar248._24_4_ * 0.5;
            auVar63._28_4_ = auVar248._28_4_;
            auVar14 = vsubps_avx(auVar62,auVar63);
            fVar191 = auVar14._0_4_;
            fVar251 = auVar14._4_4_;
            fVar192 = auVar14._8_4_;
            fVar255 = auVar14._12_4_;
            fVar233 = auVar14._16_4_;
            fVar194 = auVar14._20_4_;
            fVar259 = auVar14._24_4_;
            fVar190 = fVar174 * fVar136 * fVar190;
            fVar227 = fVar133 * fVar138 * fVar227;
            auVar64._4_4_ = fVar227;
            auVar64._0_4_ = fVar190;
            fVar231 = fStack_798 * fVar148 * fVar231;
            auVar64._8_4_ = fVar231;
            fVar289 = fStack_794 * fVar150 * fVar289;
            auVar64._12_4_ = fVar289;
            fVar272 = fStack_790 * fVar151 * fVar272;
            auVar64._16_4_ = fVar272;
            fVar275 = fStack_78c * fVar152 * fVar275;
            auVar64._20_4_ = fVar275;
            fVar277 = fStack_788 * fVar153 * fVar277;
            auVar64._24_4_ = fVar277;
            auVar64._28_4_ = auVar245._28_4_;
            auStack_61c._0_4_ = fVar227 + auVar247._4_4_;
            local_620 = (undefined1  [4])(fVar190 + auVar247._0_4_);
            auStack_61c._4_4_ = fVar231 + auVar247._8_4_;
            fStack_614 = fVar289 + auVar247._12_4_;
            fStack_610 = fVar272 + auVar247._16_4_;
            fStack_60c = fVar275 + auVar247._20_4_;
            fStack_608 = fVar277 + auVar247._24_4_;
            fStack_604 = auVar245._28_4_ + auVar247._28_4_;
            fVar190 = fVar174 * fVar136 * -fVar119;
            fVar227 = fVar133 * fVar138 * -fVar155;
            auVar65._4_4_ = fVar227;
            auVar65._0_4_ = fVar190;
            fVar231 = fStack_798 * fVar148 * -fVar132;
            auVar65._8_4_ = fVar231;
            fVar289 = fStack_794 * fVar150 * -fVar134;
            auVar65._12_4_ = fVar289;
            fVar272 = fStack_790 * fVar151 * -fVar135;
            auVar65._16_4_ = fVar272;
            fVar275 = fStack_78c * fVar152 * -fVar137;
            auVar65._20_4_ = fVar275;
            fVar277 = fStack_788 * fVar153 * -fVar147;
            auVar65._24_4_ = fVar277;
            auVar65._28_4_ = -fVar149;
            local_500._4_4_ = auVar167._4_4_ + fVar227;
            local_500._0_4_ = auVar167._0_4_ + fVar190;
            fStack_4f8 = auVar167._8_4_ + fVar231;
            fStack_4f4 = auVar167._12_4_ + fVar289;
            fStack_4f0 = auVar167._16_4_ + fVar272;
            fStack_4ec = auVar167._20_4_ + fVar275;
            fStack_4e8 = auVar167._24_4_ + fVar277;
            fStack_4e4 = auVar167._28_4_ + -fVar149;
            fVar190 = fVar136 * 0.0 * fVar174;
            fVar227 = fVar138 * 0.0 * fVar133;
            auVar66._4_4_ = fVar227;
            auVar66._0_4_ = fVar190;
            fVar231 = fVar148 * 0.0 * fStack_798;
            auVar66._8_4_ = fVar231;
            fVar289 = fVar150 * 0.0 * fStack_794;
            auVar66._12_4_ = fVar289;
            fVar272 = fVar151 * 0.0 * fStack_790;
            auVar66._16_4_ = fVar272;
            fVar275 = fVar152 * 0.0 * fStack_78c;
            auVar66._20_4_ = fVar275;
            fVar277 = fVar153 * 0.0 * fStack_788;
            auVar66._24_4_ = fVar277;
            auVar66._28_4_ = fVar149;
            auVar245 = vsubps_avx(auVar247,auVar64);
            auVar312._0_4_ = fVar190 + auVar129._0_4_;
            auVar312._4_4_ = fVar227 + auVar129._4_4_;
            auVar312._8_4_ = fVar231 + auVar129._8_4_;
            auVar312._12_4_ = fVar289 + auVar129._12_4_;
            auVar312._16_4_ = fVar272 + auVar129._16_4_;
            auVar312._20_4_ = fVar275 + auVar129._20_4_;
            auVar312._24_4_ = fVar277 + auVar129._24_4_;
            auVar312._28_4_ = fVar149 + auVar129._28_4_;
            fVar190 = auVar267._0_4_ * fVar191 * fVar222;
            fVar222 = auVar267._4_4_ * fVar251 * fVar229;
            auVar67._4_4_ = fVar222;
            auVar67._0_4_ = fVar190;
            fVar227 = auVar267._8_4_ * fVar192 * fVar193;
            auVar67._8_4_ = fVar227;
            fVar229 = auVar267._12_4_ * fVar255 * fVar262;
            auVar67._12_4_ = fVar229;
            fVar231 = auVar267._16_4_ * fVar233 * fVar274;
            auVar67._16_4_ = fVar231;
            fVar193 = auVar267._20_4_ * fVar194 * fVar276;
            auVar67._20_4_ = fVar193;
            fVar289 = auVar267._24_4_ * fVar259 * fVar278;
            auVar67._24_4_ = fVar289;
            auVar67._28_4_ = fStack_784;
            auVar22 = vsubps_avx(auVar167,auVar65);
            auVar299._0_4_ = local_460._0_4_ + fVar190;
            auVar299._4_4_ = local_460._4_4_ + fVar222;
            auVar299._8_4_ = local_460._8_4_ + fVar227;
            auVar299._12_4_ = local_460._12_4_ + fVar229;
            auVar299._16_4_ = local_460._16_4_ + fVar231;
            auVar299._20_4_ = local_460._20_4_ + fVar193;
            auVar299._24_4_ = local_460._24_4_ + fVar289;
            auVar299._28_4_ = local_460._28_4_ + fStack_784;
            fVar190 = fVar191 * -fVar243 * auVar267._0_4_;
            fVar222 = fVar251 * -fVar256 * auVar267._4_4_;
            auVar68._4_4_ = fVar222;
            auVar68._0_4_ = fVar190;
            fVar227 = fVar192 * -fVar253 * auVar267._8_4_;
            auVar68._8_4_ = fVar227;
            fVar229 = fVar255 * -fVar257 * auVar267._12_4_;
            auVar68._12_4_ = fVar229;
            fVar231 = fVar233 * -fVar209 * auVar267._16_4_;
            auVar68._16_4_ = fVar231;
            fVar193 = fVar194 * -fVar258 * auVar267._20_4_;
            auVar68._20_4_ = fVar193;
            fVar289 = fVar259 * -fVar154 * auVar267._24_4_;
            auVar68._24_4_ = fVar289;
            auVar68._28_4_ = auVar247._28_4_;
            auVar23 = vsubps_avx(auVar129,auVar66);
            auVar204._0_4_ = local_540._0_4_ + fVar190;
            auVar204._4_4_ = local_540._4_4_ + fVar222;
            auVar204._8_4_ = local_540._8_4_ + fVar227;
            auVar204._12_4_ = local_540._12_4_ + fVar229;
            auVar204._16_4_ = local_540._16_4_ + fVar231;
            auVar204._20_4_ = local_540._20_4_ + fVar193;
            auVar204._24_4_ = local_540._24_4_ + fVar289;
            auVar204._28_4_ = local_540._28_4_ + auVar247._28_4_;
            fVar190 = fVar191 * 0.0 * auVar267._0_4_;
            fVar222 = fVar251 * 0.0 * auVar267._4_4_;
            auVar69._4_4_ = fVar222;
            auVar69._0_4_ = fVar190;
            fVar227 = fVar192 * 0.0 * auVar267._8_4_;
            auVar69._8_4_ = fVar227;
            fVar229 = fVar255 * 0.0 * auVar267._12_4_;
            auVar69._12_4_ = fVar229;
            fVar231 = fVar233 * 0.0 * auVar267._16_4_;
            auVar69._16_4_ = fVar231;
            fVar193 = fVar194 * 0.0 * auVar267._20_4_;
            auVar69._20_4_ = fVar193;
            fVar289 = fVar259 * 0.0 * auVar267._24_4_;
            auVar69._24_4_ = fVar289;
            auVar69._28_4_ = auVar129._28_4_;
            auVar20 = vsubps_avx(local_460,auVar67);
            auVar269._0_4_ = (float)local_520._0_4_ + fVar190;
            auVar269._4_4_ = (float)local_520._4_4_ + fVar222;
            auVar269._8_4_ = fStack_518 + fVar227;
            auVar269._12_4_ = fStack_514 + fVar229;
            auVar269._16_4_ = fStack_510 + fVar231;
            auVar269._20_4_ = fStack_50c + fVar193;
            auVar269._24_4_ = fStack_508 + fVar289;
            auVar269._28_4_ = fStack_504 + auVar129._28_4_;
            auVar19 = vsubps_avx(local_540,auVar68);
            auVar27 = vsubps_avx(_local_520,auVar69);
            auVar13 = vsubps_avx(auVar204,auVar22);
            auVar15 = vsubps_avx(auVar269,auVar23);
            auVar70._4_4_ = auVar23._4_4_ * auVar13._4_4_;
            auVar70._0_4_ = auVar23._0_4_ * auVar13._0_4_;
            auVar70._8_4_ = auVar23._8_4_ * auVar13._8_4_;
            auVar70._12_4_ = auVar23._12_4_ * auVar13._12_4_;
            auVar70._16_4_ = auVar23._16_4_ * auVar13._16_4_;
            auVar70._20_4_ = auVar23._20_4_ * auVar13._20_4_;
            auVar70._24_4_ = auVar23._24_4_ * auVar13._24_4_;
            auVar70._28_4_ = auVar294._28_4_;
            auVar71._4_4_ = auVar22._4_4_ * auVar15._4_4_;
            auVar71._0_4_ = auVar22._0_4_ * auVar15._0_4_;
            auVar71._8_4_ = auVar22._8_4_ * auVar15._8_4_;
            auVar71._12_4_ = auVar22._12_4_ * auVar15._12_4_;
            auVar71._16_4_ = auVar22._16_4_ * auVar15._16_4_;
            auVar71._20_4_ = auVar22._20_4_ * auVar15._20_4_;
            auVar71._24_4_ = auVar22._24_4_ * auVar15._24_4_;
            auVar71._28_4_ = local_540._28_4_;
            auVar24 = vsubps_avx(auVar71,auVar70);
            auVar72._4_4_ = auVar245._4_4_ * auVar15._4_4_;
            auVar72._0_4_ = auVar245._0_4_ * auVar15._0_4_;
            auVar72._8_4_ = auVar245._8_4_ * auVar15._8_4_;
            auVar72._12_4_ = auVar245._12_4_ * auVar15._12_4_;
            auVar72._16_4_ = auVar245._16_4_ * auVar15._16_4_;
            auVar72._20_4_ = auVar245._20_4_ * auVar15._20_4_;
            auVar72._24_4_ = auVar245._24_4_ * auVar15._24_4_;
            auVar72._28_4_ = auVar15._28_4_;
            auVar15 = vsubps_avx(auVar299,auVar245);
            auVar73._4_4_ = auVar23._4_4_ * auVar15._4_4_;
            auVar73._0_4_ = auVar23._0_4_ * auVar15._0_4_;
            auVar73._8_4_ = auVar23._8_4_ * auVar15._8_4_;
            auVar73._12_4_ = auVar23._12_4_ * auVar15._12_4_;
            auVar73._16_4_ = auVar23._16_4_ * auVar15._16_4_;
            auVar73._20_4_ = auVar23._20_4_ * auVar15._20_4_;
            auVar73._24_4_ = auVar23._24_4_ * auVar15._24_4_;
            auVar73._28_4_ = auVar14._28_4_;
            auVar183 = vsubps_avx(auVar73,auVar72);
            auVar74._4_4_ = auVar22._4_4_ * auVar15._4_4_;
            auVar74._0_4_ = auVar22._0_4_ * auVar15._0_4_;
            auVar74._8_4_ = auVar22._8_4_ * auVar15._8_4_;
            auVar74._12_4_ = auVar22._12_4_ * auVar15._12_4_;
            auVar74._16_4_ = auVar22._16_4_ * auVar15._16_4_;
            auVar74._20_4_ = auVar22._20_4_ * auVar15._20_4_;
            auVar74._24_4_ = auVar22._24_4_ * auVar15._24_4_;
            auVar74._28_4_ = auVar14._28_4_;
            auVar75._4_4_ = auVar245._4_4_ * auVar13._4_4_;
            auVar75._0_4_ = auVar245._0_4_ * auVar13._0_4_;
            auVar75._8_4_ = auVar245._8_4_ * auVar13._8_4_;
            auVar75._12_4_ = auVar245._12_4_ * auVar13._12_4_;
            auVar75._16_4_ = auVar245._16_4_ * auVar13._16_4_;
            auVar75._20_4_ = auVar245._20_4_ * auVar13._20_4_;
            auVar75._24_4_ = auVar245._24_4_ * auVar13._24_4_;
            auVar75._28_4_ = auVar13._28_4_;
            auVar14 = vsubps_avx(auVar75,auVar74);
            auVar144._0_4_ = auVar24._0_4_ * 0.0 + auVar14._0_4_ + auVar183._0_4_ * 0.0;
            auVar144._4_4_ = auVar24._4_4_ * 0.0 + auVar14._4_4_ + auVar183._4_4_ * 0.0;
            auVar144._8_4_ = auVar24._8_4_ * 0.0 + auVar14._8_4_ + auVar183._8_4_ * 0.0;
            auVar144._12_4_ = auVar24._12_4_ * 0.0 + auVar14._12_4_ + auVar183._12_4_ * 0.0;
            auVar144._16_4_ = auVar24._16_4_ * 0.0 + auVar14._16_4_ + auVar183._16_4_ * 0.0;
            auVar144._20_4_ = auVar24._20_4_ * 0.0 + auVar14._20_4_ + auVar183._20_4_ * 0.0;
            auVar144._24_4_ = auVar24._24_4_ * 0.0 + auVar14._24_4_ + auVar183._24_4_ * 0.0;
            auVar144._28_4_ = auVar24._28_4_ + auVar14._28_4_ + auVar183._28_4_;
            auVar291 = vcmpps_avx(auVar144,ZEXT832(0) << 0x20,2);
            auVar14 = vblendvps_avx(auVar20,_local_620,auVar291);
            auVar187 = ZEXT3264(auVar14);
            auVar20 = vblendvps_avx(auVar19,_local_500,auVar291);
            auVar19 = vblendvps_avx(auVar27,auVar312,auVar291);
            auVar27 = vblendvps_avx(auVar245,auVar299,auVar291);
            auVar13 = vblendvps_avx(auVar22,auVar204,auVar291);
            auVar15 = vblendvps_avx(auVar23,auVar269,auVar291);
            auVar24 = vblendvps_avx(auVar299,auVar245,auVar291);
            auVar183 = vblendvps_avx(auVar204,auVar22,auVar291);
            auVar287 = vblendvps_avx(auVar269,auVar23,auVar291);
            auVar245 = vandps_avx(_local_360,auVar264);
            auVar24 = vsubps_avx(auVar24,auVar14);
            auVar25 = vsubps_avx(auVar183,auVar20);
            auVar287 = vsubps_avx(auVar287,auVar19);
            auVar264 = vsubps_avx(auVar20,auVar13);
            fVar190 = auVar25._0_4_;
            fVar207 = auVar19._0_4_;
            fVar262 = auVar25._4_4_;
            fVar208 = auVar19._4_4_;
            auVar76._4_4_ = fVar208 * fVar262;
            auVar76._0_4_ = fVar207 * fVar190;
            fVar243 = auVar25._8_4_;
            fVar223 = auVar19._8_4_;
            auVar76._8_4_ = fVar223 * fVar243;
            fVar255 = auVar25._12_4_;
            fVar228 = auVar19._12_4_;
            auVar76._12_4_ = fVar228 * fVar255;
            fVar136 = auVar25._16_4_;
            fVar230 = auVar19._16_4_;
            auVar76._16_4_ = fVar230 * fVar136;
            fVar119 = auVar25._20_4_;
            fVar232 = auVar19._20_4_;
            auVar76._20_4_ = fVar232 * fVar119;
            fVar149 = auVar25._24_4_;
            fVar242 = auVar19._24_4_;
            auVar76._24_4_ = fVar242 * fVar149;
            auVar76._28_4_ = auVar183._28_4_;
            fVar222 = auVar20._0_4_;
            fVar250 = auVar287._0_4_;
            fVar272 = auVar20._4_4_;
            fVar252 = auVar287._4_4_;
            auVar77._4_4_ = fVar252 * fVar272;
            auVar77._0_4_ = fVar250 * fVar222;
            fVar191 = auVar20._8_4_;
            fVar254 = auVar287._8_4_;
            auVar77._8_4_ = fVar254 * fVar191;
            fVar209 = auVar20._12_4_;
            fVar261 = auVar287._12_4_;
            auVar77._12_4_ = fVar261 * fVar209;
            fVar138 = auVar20._16_4_;
            fVar271 = auVar287._16_4_;
            auVar77._16_4_ = fVar271 * fVar138;
            fVar155 = auVar20._20_4_;
            fVar273 = auVar287._20_4_;
            auVar77._20_4_ = fVar273 * fVar155;
            fVar260 = auVar20._24_4_;
            fVar279 = auVar287._24_4_;
            uVar8 = auVar22._28_4_;
            auVar77._24_4_ = fVar279 * fVar260;
            auVar77._28_4_ = uVar8;
            auVar183 = vsubps_avx(auVar77,auVar76);
            fVar227 = auVar14._0_4_;
            fVar274 = auVar14._4_4_;
            auVar78._4_4_ = fVar252 * fVar274;
            auVar78._0_4_ = fVar250 * fVar227;
            fVar256 = auVar14._8_4_;
            auVar78._8_4_ = fVar254 * fVar256;
            fVar233 = auVar14._12_4_;
            auVar78._12_4_ = fVar261 * fVar233;
            fVar148 = auVar14._16_4_;
            auVar78._16_4_ = fVar271 * fVar148;
            fVar132 = auVar14._20_4_;
            auVar78._20_4_ = fVar273 * fVar132;
            fVar157 = auVar14._24_4_;
            auVar78._24_4_ = fVar279 * fVar157;
            auVar78._28_4_ = uVar8;
            fVar229 = auVar24._0_4_;
            fVar275 = auVar24._4_4_;
            auVar79._4_4_ = fVar208 * fVar275;
            auVar79._0_4_ = fVar207 * fVar229;
            fVar251 = auVar24._8_4_;
            auVar79._8_4_ = fVar223 * fVar251;
            fVar258 = auVar24._12_4_;
            auVar79._12_4_ = fVar228 * fVar258;
            fVar150 = auVar24._16_4_;
            auVar79._16_4_ = fVar230 * fVar150;
            fVar134 = auVar24._20_4_;
            auVar79._20_4_ = fVar232 * fVar134;
            fVar169 = auVar24._24_4_;
            auVar79._24_4_ = fVar242 * fVar169;
            auVar79._28_4_ = auVar299._28_4_;
            auVar22 = vsubps_avx(auVar79,auVar78);
            auVar80._4_4_ = fVar272 * fVar275;
            auVar80._0_4_ = fVar222 * fVar229;
            auVar80._8_4_ = fVar191 * fVar251;
            auVar80._12_4_ = fVar209 * fVar258;
            auVar80._16_4_ = fVar138 * fVar150;
            auVar80._20_4_ = fVar155 * fVar134;
            auVar80._24_4_ = fVar260 * fVar169;
            auVar80._28_4_ = uVar8;
            auVar81._4_4_ = fVar274 * fVar262;
            auVar81._0_4_ = fVar227 * fVar190;
            auVar81._8_4_ = fVar256 * fVar243;
            auVar81._12_4_ = fVar233 * fVar255;
            auVar81._16_4_ = fVar148 * fVar136;
            auVar81._20_4_ = fVar132 * fVar119;
            auVar81._24_4_ = fVar157 * fVar149;
            auVar81._28_4_ = auVar23._28_4_;
            auVar23 = vsubps_avx(auVar81,auVar80);
            auVar26 = vsubps_avx(auVar19,auVar15);
            fVar193 = auVar23._28_4_ + auVar22._28_4_;
            auVar283._0_4_ = auVar23._0_4_ + auVar22._0_4_ * 0.0 + auVar183._0_4_ * 0.0;
            auVar283._4_4_ = auVar23._4_4_ + auVar22._4_4_ * 0.0 + auVar183._4_4_ * 0.0;
            auVar283._8_4_ = auVar23._8_4_ + auVar22._8_4_ * 0.0 + auVar183._8_4_ * 0.0;
            auVar283._12_4_ = auVar23._12_4_ + auVar22._12_4_ * 0.0 + auVar183._12_4_ * 0.0;
            auVar283._16_4_ = auVar23._16_4_ + auVar22._16_4_ * 0.0 + auVar183._16_4_ * 0.0;
            auVar283._20_4_ = auVar23._20_4_ + auVar22._20_4_ * 0.0 + auVar183._20_4_ * 0.0;
            auVar283._24_4_ = auVar23._24_4_ + auVar22._24_4_ * 0.0 + auVar183._24_4_ * 0.0;
            auVar283._28_4_ = fVar193 + auVar183._28_4_;
            fVar231 = auVar264._0_4_;
            fVar276 = auVar264._4_4_;
            auVar82._4_4_ = auVar15._4_4_ * fVar276;
            auVar82._0_4_ = auVar15._0_4_ * fVar231;
            fVar253 = auVar264._8_4_;
            auVar82._8_4_ = auVar15._8_4_ * fVar253;
            fVar194 = auVar264._12_4_;
            auVar82._12_4_ = auVar15._12_4_ * fVar194;
            fVar151 = auVar264._16_4_;
            auVar82._16_4_ = auVar15._16_4_ * fVar151;
            fVar135 = auVar264._20_4_;
            auVar82._20_4_ = auVar15._20_4_ * fVar135;
            fVar171 = auVar264._24_4_;
            auVar82._24_4_ = auVar15._24_4_ * fVar171;
            auVar82._28_4_ = fVar193;
            fVar193 = auVar26._0_4_;
            fVar277 = auVar26._4_4_;
            auVar83._4_4_ = auVar13._4_4_ * fVar277;
            auVar83._0_4_ = auVar13._0_4_ * fVar193;
            fVar192 = auVar26._8_4_;
            auVar83._8_4_ = auVar13._8_4_ * fVar192;
            fVar154 = auVar26._12_4_;
            auVar83._12_4_ = auVar13._12_4_ * fVar154;
            fVar152 = auVar26._16_4_;
            auVar83._16_4_ = auVar13._16_4_ * fVar152;
            fVar137 = auVar26._20_4_;
            auVar83._20_4_ = auVar13._20_4_ * fVar137;
            fVar173 = auVar26._24_4_;
            auVar83._24_4_ = auVar13._24_4_ * fVar173;
            auVar83._28_4_ = auVar23._28_4_;
            auVar264 = vsubps_avx(auVar83,auVar82);
            auVar22 = vsubps_avx(auVar14,auVar27);
            fVar289 = auVar22._0_4_;
            fVar278 = auVar22._4_4_;
            auVar84._4_4_ = auVar15._4_4_ * fVar278;
            auVar84._0_4_ = auVar15._0_4_ * fVar289;
            fVar257 = auVar22._8_4_;
            auVar84._8_4_ = auVar15._8_4_ * fVar257;
            fVar259 = auVar22._12_4_;
            auVar84._12_4_ = auVar15._12_4_ * fVar259;
            fVar153 = auVar22._16_4_;
            auVar84._16_4_ = auVar15._16_4_ * fVar153;
            fVar147 = auVar22._20_4_;
            auVar84._20_4_ = auVar15._20_4_ * fVar147;
            fVar195 = auVar22._24_4_;
            auVar84._24_4_ = auVar15._24_4_ * fVar195;
            auVar84._28_4_ = auVar15._28_4_;
            auVar85._4_4_ = fVar277 * auVar27._4_4_;
            auVar85._0_4_ = fVar193 * auVar27._0_4_;
            auVar85._8_4_ = fVar192 * auVar27._8_4_;
            auVar85._12_4_ = fVar154 * auVar27._12_4_;
            auVar85._16_4_ = fVar152 * auVar27._16_4_;
            auVar85._20_4_ = fVar137 * auVar27._20_4_;
            auVar85._24_4_ = fVar173 * auVar27._24_4_;
            auVar85._28_4_ = auVar183._28_4_;
            auVar15 = vsubps_avx(auVar84,auVar85);
            auVar86._4_4_ = auVar13._4_4_ * fVar278;
            auVar86._0_4_ = auVar13._0_4_ * fVar289;
            auVar86._8_4_ = auVar13._8_4_ * fVar257;
            auVar86._12_4_ = auVar13._12_4_ * fVar259;
            auVar86._16_4_ = auVar13._16_4_ * fVar153;
            auVar86._20_4_ = auVar13._20_4_ * fVar147;
            auVar86._24_4_ = auVar13._24_4_ * fVar195;
            auVar86._28_4_ = auVar13._28_4_;
            auVar87._4_4_ = fVar276 * auVar27._4_4_;
            auVar87._0_4_ = fVar231 * auVar27._0_4_;
            auVar87._8_4_ = fVar253 * auVar27._8_4_;
            auVar87._12_4_ = fVar194 * auVar27._12_4_;
            auVar87._16_4_ = fVar151 * auVar27._16_4_;
            auVar87._20_4_ = fVar135 * auVar27._20_4_;
            auVar87._24_4_ = fVar171 * auVar27._24_4_;
            auVar87._28_4_ = auVar27._28_4_;
            auVar27 = vsubps_avx(auVar87,auVar86);
            auVar130._0_4_ = auVar264._0_4_ * 0.0 + auVar27._0_4_ + auVar15._0_4_ * 0.0;
            auVar130._4_4_ = auVar264._4_4_ * 0.0 + auVar27._4_4_ + auVar15._4_4_ * 0.0;
            auVar130._8_4_ = auVar264._8_4_ * 0.0 + auVar27._8_4_ + auVar15._8_4_ * 0.0;
            auVar130._12_4_ = auVar264._12_4_ * 0.0 + auVar27._12_4_ + auVar15._12_4_ * 0.0;
            auVar130._16_4_ = auVar264._16_4_ * 0.0 + auVar27._16_4_ + auVar15._16_4_ * 0.0;
            auVar130._20_4_ = auVar264._20_4_ * 0.0 + auVar27._20_4_ + auVar15._20_4_ * 0.0;
            auVar130._24_4_ = auVar264._24_4_ * 0.0 + auVar27._24_4_ + auVar15._24_4_ * 0.0;
            auVar130._28_4_ = auVar15._28_4_ + auVar27._28_4_ + auVar15._28_4_;
            auVar131 = ZEXT3264(auVar130);
            auVar264 = vmaxps_avx(auVar283,auVar130);
            auVar264 = vcmpps_avx(auVar264,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar206 = ZEXT3264(auVar245);
            auVar27 = auVar245 & auVar264;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar27 >> 0x7f,0) == '\0') &&
                  (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0xbf,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar27[0x1f]) {
LAB_00e29aee:
              auVar146._8_8_ = uStack_4d8;
              auVar146._0_8_ = local_4e0;
              auVar146._16_8_ = uStack_4d0;
              auVar146._24_8_ = uStack_4c8;
              auVar296._4_4_ = fVar133;
              auVar296._0_4_ = fVar174;
              auVar296._8_4_ = fStack_798;
              auVar296._12_4_ = fStack_794;
              auVar296._16_4_ = fStack_790;
              auVar296._20_4_ = fStack_78c;
              auVar296._24_4_ = fStack_788;
              auVar296._28_4_ = fStack_784;
            }
            else {
              auVar27 = vandps_avx(auVar264,auVar245);
              auVar88._4_4_ = fVar277 * fVar262;
              auVar88._0_4_ = fVar193 * fVar190;
              auVar88._8_4_ = fVar192 * fVar243;
              auVar88._12_4_ = fVar154 * fVar255;
              auVar88._16_4_ = fVar152 * fVar136;
              auVar88._20_4_ = fVar137 * fVar119;
              auVar88._24_4_ = fVar173 * fVar149;
              auVar88._28_4_ = auVar245._28_4_;
              auVar89._4_4_ = fVar276 * fVar252;
              auVar89._0_4_ = fVar231 * fVar250;
              auVar89._8_4_ = fVar253 * fVar254;
              auVar89._12_4_ = fVar194 * fVar261;
              auVar89._16_4_ = fVar151 * fVar271;
              auVar89._20_4_ = fVar135 * fVar273;
              auVar89._24_4_ = fVar171 * fVar279;
              auVar89._28_4_ = auVar264._28_4_;
              auVar13 = vsubps_avx(auVar89,auVar88);
              auVar90._4_4_ = fVar278 * fVar252;
              auVar90._0_4_ = fVar289 * fVar250;
              auVar90._8_4_ = fVar257 * fVar254;
              auVar90._12_4_ = fVar259 * fVar261;
              auVar90._16_4_ = fVar153 * fVar271;
              auVar90._20_4_ = fVar147 * fVar273;
              auVar90._24_4_ = fVar195 * fVar279;
              auVar90._28_4_ = auVar287._28_4_;
              auVar91._4_4_ = fVar277 * fVar275;
              auVar91._0_4_ = fVar193 * fVar229;
              auVar91._8_4_ = fVar192 * fVar251;
              auVar91._12_4_ = fVar154 * fVar258;
              auVar91._16_4_ = fVar152 * fVar150;
              auVar91._20_4_ = fVar137 * fVar134;
              auVar91._24_4_ = fVar173 * fVar169;
              auVar91._28_4_ = auVar26._28_4_;
              auVar15 = vsubps_avx(auVar91,auVar90);
              auVar92._4_4_ = fVar276 * fVar275;
              auVar92._0_4_ = fVar231 * fVar229;
              auVar92._8_4_ = fVar253 * fVar251;
              auVar92._12_4_ = fVar194 * fVar258;
              auVar92._16_4_ = fVar151 * fVar150;
              auVar92._20_4_ = fVar135 * fVar134;
              auVar92._24_4_ = fVar171 * fVar169;
              auVar92._28_4_ = auVar24._28_4_;
              auVar93._4_4_ = fVar278 * fVar262;
              auVar93._0_4_ = fVar289 * fVar190;
              auVar93._8_4_ = fVar257 * fVar243;
              auVar93._12_4_ = fVar259 * fVar255;
              auVar93._16_4_ = fVar153 * fVar136;
              auVar93._20_4_ = fVar147 * fVar119;
              auVar93._24_4_ = fVar195 * fVar149;
              auVar93._28_4_ = auVar25._28_4_;
              auVar183 = vsubps_avx(auVar93,auVar92);
              auVar145._0_4_ = auVar13._0_4_ * 0.0 + auVar183._0_4_ + auVar15._0_4_ * 0.0;
              auVar145._4_4_ = auVar13._4_4_ * 0.0 + auVar183._4_4_ + auVar15._4_4_ * 0.0;
              auVar145._8_4_ = auVar13._8_4_ * 0.0 + auVar183._8_4_ + auVar15._8_4_ * 0.0;
              auVar145._12_4_ = auVar13._12_4_ * 0.0 + auVar183._12_4_ + auVar15._12_4_ * 0.0;
              auVar145._16_4_ = auVar13._16_4_ * 0.0 + auVar183._16_4_ + auVar15._16_4_ * 0.0;
              auVar145._20_4_ = auVar13._20_4_ * 0.0 + auVar183._20_4_ + auVar15._20_4_ * 0.0;
              auVar145._24_4_ = auVar13._24_4_ * 0.0 + auVar183._24_4_ + auVar15._24_4_ * 0.0;
              auVar145._28_4_ = auVar25._28_4_ + auVar183._28_4_ + auVar24._28_4_;
              auVar264 = vrcpps_avx(auVar145);
              fVar229 = auVar264._0_4_;
              fVar231 = auVar264._4_4_;
              auVar94._4_4_ = auVar145._4_4_ * fVar231;
              auVar94._0_4_ = auVar145._0_4_ * fVar229;
              fVar193 = auVar264._8_4_;
              auVar94._8_4_ = auVar145._8_4_ * fVar193;
              fVar289 = auVar264._12_4_;
              auVar94._12_4_ = auVar145._12_4_ * fVar289;
              fVar262 = auVar264._16_4_;
              auVar94._16_4_ = auVar145._16_4_ * fVar262;
              fVar275 = auVar264._20_4_;
              auVar94._20_4_ = auVar145._20_4_ * fVar275;
              fVar276 = auVar264._24_4_;
              auVar94._24_4_ = auVar145._24_4_ * fVar276;
              auVar94._28_4_ = auVar26._28_4_;
              auVar295._8_4_ = 0x3f800000;
              auVar295._0_8_ = 0x3f8000003f800000;
              auVar295._12_4_ = 0x3f800000;
              auVar295._16_4_ = 0x3f800000;
              auVar295._20_4_ = 0x3f800000;
              auVar295._24_4_ = 0x3f800000;
              auVar295._28_4_ = 0x3f800000;
              auVar264 = vsubps_avx(auVar295,auVar94);
              fVar229 = auVar264._0_4_ * fVar229 + fVar229;
              fVar231 = auVar264._4_4_ * fVar231 + fVar231;
              fVar193 = auVar264._8_4_ * fVar193 + fVar193;
              fVar289 = auVar264._12_4_ * fVar289 + fVar289;
              fVar262 = auVar264._16_4_ * fVar262 + fVar262;
              fVar275 = auVar264._20_4_ * fVar275 + fVar275;
              fVar276 = auVar264._24_4_ * fVar276 + fVar276;
              auVar95._4_4_ =
                   (fVar274 * auVar13._4_4_ + auVar15._4_4_ * fVar272 + auVar183._4_4_ * fVar208) *
                   fVar231;
              auVar95._0_4_ =
                   (fVar227 * auVar13._0_4_ + auVar15._0_4_ * fVar222 + auVar183._0_4_ * fVar207) *
                   fVar229;
              auVar95._8_4_ =
                   (fVar256 * auVar13._8_4_ + auVar15._8_4_ * fVar191 + auVar183._8_4_ * fVar223) *
                   fVar193;
              auVar95._12_4_ =
                   (fVar233 * auVar13._12_4_ + auVar15._12_4_ * fVar209 + auVar183._12_4_ * fVar228)
                   * fVar289;
              auVar95._16_4_ =
                   (fVar148 * auVar13._16_4_ + auVar15._16_4_ * fVar138 + auVar183._16_4_ * fVar230)
                   * fVar262;
              auVar95._20_4_ =
                   (fVar132 * auVar13._20_4_ + auVar15._20_4_ * fVar155 + auVar183._20_4_ * fVar232)
                   * fVar275;
              auVar95._24_4_ =
                   (fVar157 * auVar13._24_4_ + auVar15._24_4_ * fVar260 + auVar183._24_4_ * fVar242)
                   * fVar276;
              auVar95._28_4_ = auVar14._28_4_ + auVar20._28_4_ + auVar19._28_4_;
              auVar187 = ZEXT3264(auVar95);
              fVar190 = ray->tfar;
              auVar205._4_4_ = fVar190;
              auVar205._0_4_ = fVar190;
              auVar205._8_4_ = fVar190;
              auVar205._12_4_ = fVar190;
              auVar205._16_4_ = fVar190;
              auVar205._20_4_ = fVar190;
              auVar205._24_4_ = fVar190;
              auVar205._28_4_ = fVar190;
              auVar264 = vcmpps_avx(local_380,auVar95,2);
              auVar14 = vcmpps_avx(auVar95,auVar205,2);
              auVar206 = ZEXT3264(auVar14);
              auVar264 = vandps_avx(auVar264,auVar14);
              auVar20 = auVar27 & auVar264;
              if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar20 >> 0x7f,0) == '\0') &&
                    (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar20 >> 0xbf,0) == '\0') &&
                  (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar20[0x1f]) goto LAB_00e29aee;
              auVar264 = vandps_avx(auVar27,auVar264);
              auVar20 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar145,4);
              auVar19 = auVar264 & auVar20;
              auVar146._8_8_ = uStack_4d8;
              auVar146._0_8_ = local_4e0;
              auVar146._16_8_ = uStack_4d0;
              auVar146._24_8_ = uStack_4c8;
              auVar296._4_4_ = fVar133;
              auVar296._0_4_ = fVar174;
              auVar296._8_4_ = fStack_798;
              auVar296._12_4_ = fStack_794;
              auVar296._16_4_ = fStack_790;
              auVar296._20_4_ = fStack_78c;
              auVar296._24_4_ = fStack_788;
              auVar296._28_4_ = fStack_784;
              if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar19 >> 0x7f,0) != '\0') ||
                    (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0xbf,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar19[0x1f] < '\0') {
                auVar146 = vandps_avx(auVar20,auVar264);
                auVar96._4_4_ = fVar231 * auVar283._4_4_;
                auVar96._0_4_ = fVar229 * auVar283._0_4_;
                auVar96._8_4_ = fVar193 * auVar283._8_4_;
                auVar96._12_4_ = fVar289 * auVar283._12_4_;
                auVar96._16_4_ = fVar262 * auVar283._16_4_;
                auVar96._20_4_ = fVar275 * auVar283._20_4_;
                auVar96._24_4_ = fVar276 * auVar283._24_4_;
                auVar96._28_4_ = auVar14._28_4_;
                auVar97._4_4_ = auVar130._4_4_ * fVar231;
                auVar97._0_4_ = auVar130._0_4_ * fVar229;
                auVar97._8_4_ = auVar130._8_4_ * fVar193;
                auVar97._12_4_ = auVar130._12_4_ * fVar289;
                auVar97._16_4_ = auVar130._16_4_ * fVar262;
                auVar97._20_4_ = auVar130._20_4_ * fVar275;
                auVar97._24_4_ = auVar130._24_4_ * fVar276;
                auVar97._28_4_ = auVar130._28_4_;
                auVar226._8_4_ = 0x3f800000;
                auVar226._0_8_ = 0x3f8000003f800000;
                auVar226._12_4_ = 0x3f800000;
                auVar226._16_4_ = 0x3f800000;
                auVar226._20_4_ = 0x3f800000;
                auVar226._24_4_ = 0x3f800000;
                auVar226._28_4_ = 0x3f800000;
                auVar264 = vsubps_avx(auVar226,auVar96);
                local_180 = vblendvps_avx(auVar264,auVar96,auVar291);
                auVar264 = vsubps_avx(auVar226,auVar97);
                auVar206 = ZEXT3264(auVar264);
                _local_3c0 = vblendvps_avx(auVar264,auVar97,auVar291);
                auVar131 = ZEXT3264(_local_3c0);
                local_1a0 = auVar95;
              }
            }
            auVar288 = ZEXT3264(_local_760);
            auVar270 = ZEXT3264(local_720);
            auVar249 = ZEXT3264(local_700);
            _local_6e0 = auVar267;
            if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar146 >> 0x7f,0) == '\0') &&
                  (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar146 >> 0xbf,0) == '\0') &&
                (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar146[0x1f]) goto LAB_00e29649;
            auVar264 = vsubps_avx(auVar267,auVar296);
            auVar187 = ZEXT3264(local_180);
            fVar222 = auVar296._0_4_ + auVar264._0_4_ * local_180._0_4_;
            fVar227 = auVar296._4_4_ + auVar264._4_4_ * local_180._4_4_;
            fVar229 = auVar296._8_4_ + auVar264._8_4_ * local_180._8_4_;
            fVar231 = auVar296._12_4_ + auVar264._12_4_ * local_180._12_4_;
            fVar193 = auVar296._16_4_ + auVar264._16_4_ * local_180._16_4_;
            fVar289 = auVar296._20_4_ + auVar264._20_4_ * local_180._20_4_;
            fVar262 = auVar296._24_4_ + auVar264._24_4_ * local_180._24_4_;
            fVar272 = auVar296._28_4_ + auVar264._28_4_;
            fVar190 = pre->depth_scale;
            auVar98._4_4_ = (fVar227 + fVar227) * fVar190;
            auVar98._0_4_ = (fVar222 + fVar222) * fVar190;
            auVar98._8_4_ = (fVar229 + fVar229) * fVar190;
            auVar98._12_4_ = (fVar231 + fVar231) * fVar190;
            auVar98._16_4_ = (fVar193 + fVar193) * fVar190;
            auVar98._20_4_ = (fVar289 + fVar289) * fVar190;
            auVar98._24_4_ = (fVar262 + fVar262) * fVar190;
            auVar98._28_4_ = fVar272 + fVar272;
            auVar206 = ZEXT3264(local_1a0);
            auVar264 = vcmpps_avx(local_1a0,auVar98,6);
            auVar131 = ZEXT3264(auVar264);
            auVar14 = auVar146 & auVar264;
            if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar14 >> 0x7f,0) != '\0') ||
                  (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0xbf,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar14[0x1f] < '\0') {
              local_220 = vandps_avx(auVar264,auVar146);
              auVar131 = ZEXT3264(local_220);
              local_2c0 = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
              fStack_2bc = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
              fStack_2b8 = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
              fStack_2b4 = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
              fStack_2b0 = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
              fStack_2ac = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
              fStack_2a8 = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
              fStack_2a4 = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
              local_2e0 = local_180;
              local_2a0 = local_1a0;
              local_27c = uVar113;
              local_270 = local_7b0;
              uStack_268 = uStack_7a8;
              local_260 = local_550;
              uStack_258 = uStack_548;
              local_250 = local_560;
              uStack_248 = uStack_558;
              local_240 = local_570;
              uStack_238 = uStack_568;
              local_680._0_8_ = (context->scene->geometries).items[local_688].ptr;
              local_3c0._4_4_ = fStack_2bc;
              local_3c0._0_4_ = local_2c0;
              uStack_3b8._0_4_ = fStack_2b8;
              uStack_3b8._4_4_ = fStack_2b4;
              uStack_3b0._0_4_ = fStack_2b0;
              uStack_3b0._4_4_ = fStack_2ac;
              auVar106 = _local_3c0;
              uStack_3a8._0_4_ = fStack_2a8;
              uStack_3a8._4_4_ = fStack_2a4;
              auVar264 = _local_3c0;
              if ((((Geometry *)local_680._0_8_)->mask & ray->mask) == 0) {
                pRVar112 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar112 = context->args;
                if ((pRVar112->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar112 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar112 >> 8),1),
                   ((Geometry *)local_680._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_680._8_24_ = auVar283._8_24_;
                  _auStack_6d8 = auVar267._8_24_;
                  local_6e0 = (undefined1  [8])context;
                  local_540._0_8_ = lVar116;
                  auVar214 = vshufps_avx(ZEXT416((uint)(float)(int)local_280),
                                         ZEXT416((uint)(float)(int)local_280),0);
                  local_200[0] = (auVar214._0_4_ + local_180._0_4_ + 0.0) * (float)local_440._0_4_;
                  local_200[1] = (auVar214._4_4_ + local_180._4_4_ + 1.0) * (float)local_440._4_4_;
                  local_200[2] = (auVar214._8_4_ + local_180._8_4_ + 2.0) * fStack_438;
                  local_200[3] = (auVar214._12_4_ + local_180._12_4_ + 3.0) * fStack_434;
                  fStack_1f0 = (auVar214._0_4_ + local_180._16_4_ + 4.0) * fStack_430;
                  fStack_1ec = (auVar214._4_4_ + local_180._20_4_ + 5.0) * fStack_42c;
                  fStack_1e8 = (auVar214._8_4_ + local_180._24_4_ + 6.0) * fStack_428;
                  fStack_1e4 = auVar214._12_4_ + (float)local_180._28_4_ + 7.0;
                  uStack_3b0 = auVar106._16_8_;
                  uStack_3a8 = auVar264._24_8_;
                  local_1e0 = local_3c0;
                  uStack_1d8 = uStack_3b8;
                  uStack_1d0 = uStack_3b0;
                  uStack_1c8 = uStack_3a8;
                  local_1c0 = local_1a0;
                  iVar109 = vmovmskps_avx(local_220);
                  local_740._0_8_ = CONCAT44((int)((ulong)pRVar112 >> 0x20),iVar109);
                  lVar116 = 0;
                  if (local_740._0_8_ != 0) {
                    for (; ((ulong)local_740._0_8_ >> lVar116 & 1) == 0; lVar116 = lVar116 + 1) {
                    }
                  }
                  local_7a0 = (uint)lVar116;
                  uStack_79c = (undefined4)((ulong)lVar116 >> 0x20);
                  stack0xfffffffffffff8c8 = auVar245._8_24_;
                  _local_3c0 = auVar264;
                  if (iVar109 == 0) {
                    pRVar112 = (RTCIntersectArguments *)0x0;
LAB_00e29b29:
                    auVar249 = ZEXT3264(local_700);
                    auVar270 = ZEXT3264(local_720);
                    auVar288 = ZEXT3264(_local_760);
                    context = (RayQueryContext *)local_6e0;
                    lVar116 = local_540._0_8_;
                    pre = local_7c0;
                  }
                  else {
                    local_620 = (undefined1  [4])ray->tfar;
                    pGVar114 = (Geometry *)local_680._0_8_;
                    do {
                      lVar116 = CONCAT44(uStack_79c,local_7a0);
                      local_5c4 = local_200[lVar116];
                      auVar131 = ZEXT464((uint)local_5c4);
                      local_5c0 = *(undefined4 *)((long)&local_1e0 + lVar116 * 4);
                      ray->tfar = *(float *)(local_1c0 + lVar116 * 4);
                      local_650.context = context->user;
                      fVar175 = 1.0 - local_5c4;
                      fVar210 = local_5c4 * fVar175 * 4.0;
                      auVar214 = ZEXT416((uint)(local_5c4 * local_5c4 * 0.5));
                      auVar214 = vshufps_avx(auVar214,auVar214,0);
                      auVar164 = ZEXT416((uint)((fVar175 * fVar175 + fVar210) * 0.5));
                      auVar164 = vshufps_avx(auVar164,auVar164,0);
                      auVar181 = ZEXT416((uint)((-local_5c4 * local_5c4 - fVar210) * 0.5));
                      auVar181 = vshufps_avx(auVar181,auVar181,0);
                      auVar201._0_4_ = auVar181._0_4_ * (float)local_550._0_4_;
                      auVar201._4_4_ = auVar181._4_4_ * (float)local_550._4_4_;
                      auVar201._8_4_ = auVar181._8_4_ * (float)uStack_548;
                      auVar201._12_4_ = auVar181._12_4_ * uStack_548._4_4_;
                      auVar206 = ZEXT1664(auVar201);
                      auVar181 = ZEXT416((uint)(fVar175 * -fVar175 * 0.5));
                      auVar181 = vshufps_avx(auVar181,auVar181,0);
                      auVar182._0_4_ = (float)local_7b0._0_4_ * auVar181._0_4_;
                      auVar182._4_4_ = (float)local_7b0._4_4_ * auVar181._4_4_;
                      auVar182._8_4_ = (float)uStack_7a8 * auVar181._8_4_;
                      auVar182._12_4_ = uStack_7a8._4_4_ * auVar181._12_4_;
                      auVar187 = ZEXT1664(auVar182);
                      auVar165._0_4_ =
                           auVar182._0_4_ +
                           auVar201._0_4_ +
                           auVar214._0_4_ * (float)local_570._0_4_ +
                           auVar164._0_4_ * (float)local_560._0_4_;
                      auVar165._4_4_ =
                           auVar182._4_4_ +
                           auVar201._4_4_ +
                           auVar214._4_4_ * (float)local_570._4_4_ +
                           auVar164._4_4_ * (float)local_560._4_4_;
                      auVar165._8_4_ =
                           auVar182._8_4_ +
                           auVar201._8_4_ +
                           auVar214._8_4_ * (float)uStack_568 + auVar164._8_4_ * (float)uStack_558;
                      auVar165._12_4_ =
                           auVar182._12_4_ +
                           auVar201._12_4_ +
                           auVar214._12_4_ * uStack_568._4_4_ + auVar164._12_4_ * uStack_558._4_4_;
                      local_5d0 = vmovlps_avx(auVar165);
                      local_5c8 = vextractps_avx(auVar165,2);
                      local_5bc = local_7b4;
                      local_5b8 = (int)local_688;
                      local_5b4 = (local_650.context)->instID[0];
                      local_5b0 = (local_650.context)->instPrimID[0];
                      local_7cc = -1;
                      local_650.valid = &local_7cc;
                      local_650.geometryUserPtr = pGVar114->userPtr;
                      local_650.ray = (RTCRayN *)ray;
                      local_650.hit = (RTCHitN *)&local_5d0;
                      local_650.N = 1;
                      if (pGVar114->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e299ed:
                        pcVar12 = *(code **)(*(byte **)((long)local_6e0 + 0x10) + 0x10);
                        if ((pcVar12 != (code *)0x0) &&
                           (((**(byte **)((long)local_6e0 + 0x10) & 2) != 0 ||
                            ((*(byte *)(local_680._0_8_ + 0x3e) & 0x40) != 0)))) {
                          auVar187 = ZEXT1664(auVar187._0_16_);
                          auVar206 = ZEXT1664(auVar206._0_16_);
                          auVar131._0_8_ = (*pcVar12)(&local_650);
                          auVar131._8_56_ = extraout_var_00;
                          if (*local_650.valid == 0) goto LAB_00e29a3b;
                        }
                        pRVar112 = (RTCIntersectArguments *)0x1;
                        goto LAB_00e29b29;
                      }
                      auVar187 = ZEXT1664(auVar182);
                      auVar206 = ZEXT1664(auVar201);
                      auVar131._0_8_ = (*pGVar114->occlusionFilterN)(&local_650);
                      auVar131._8_56_ = extraout_var;
                      if (*local_650.valid != 0) goto LAB_00e299ed;
LAB_00e29a3b:
                      auVar131 = ZEXT464((uint)local_620);
                      ray->tfar = (float)local_620;
                      uVar115 = local_740._0_8_ ^ 1L << ((ulong)local_7a0 & 0x3f);
                      lVar116 = 0;
                      if (uVar115 != 0) {
                        for (; (uVar115 >> lVar116 & 1) == 0; lVar116 = lVar116 + 1) {
                        }
                      }
                      local_7a0 = (uint)lVar116;
                      uStack_79c = (undefined4)((ulong)lVar116 >> 0x20);
                      pRVar112 = (RTCIntersectArguments *)0x0;
                      local_740._0_8_ = uVar115;
                      auVar249 = ZEXT3264(local_700);
                      auVar270 = ZEXT3264(local_720);
                      auVar288 = ZEXT3264(_local_760);
                      context = (RayQueryContext *)local_6e0;
                      pGVar114 = (Geometry *)local_680._0_8_;
                      lVar116 = local_540._0_8_;
                      pre = local_7c0;
                    } while (uVar115 != 0);
                  }
                }
              }
              bVar117 = (bool)(bVar117 | (byte)pRVar112);
              fVar280 = (float)local_6c0._0_4_;
              fVar284 = (float)local_6c0._4_4_;
              fVar285 = fStack_6b8;
              fVar286 = fStack_6b4;
              fVar210 = fStack_6b0;
              fVar175 = fStack_6ac;
              fVar219 = fStack_6a8;
              fVar188 = fStack_6a4;
              fVar156 = (float)local_780._0_4_;
              fVar168 = (float)local_780._4_4_;
              fVar170 = fStack_778;
              fVar172 = fStack_774;
              fVar220 = fStack_770;
              fVar189 = fStack_76c;
              fVar221 = fStack_768;
            }
          }
          lVar116 = lVar116 + 8;
        } while ((int)lVar116 < (int)uVar113);
      }
      if (bVar117 != false) {
        return bVar117;
      }
      fVar210 = ray->tfar;
      auVar123._4_4_ = fVar210;
      auVar123._0_4_ = fVar210;
      auVar123._8_4_ = fVar210;
      auVar123._12_4_ = fVar210;
      auVar214 = vcmpps_avx(local_2f0,auVar123,2);
      uVar113 = vmovmskps_avx(auVar214);
      uVar113 = (uint)uVar118 & uVar113;
    } while (uVar113 != 0);
  }
  return false;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }